

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O0

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [24];
  long *in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined8 *in_stack_00000008;
  float H_1;
  float cell2_1;
  float G_1;
  float O_1;
  float F_1;
  float I_1;
  __m256 H;
  __m256 cell2;
  __m256 G;
  __m256 O;
  __m256 F;
  __m256 I;
  int remain_activations;
  int nn_activation;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_F;
  float *gates_data_I;
  float *hidden_ptr;
  float *cell_ptr;
  float *output_data;
  float h_cont_3;
  float xi_3;
  float sums_1 [4];
  __m256 h_cont_2;
  int remain_num_output_1;
  int nn_num_output_2;
  __m256 xi_2;
  int remain_size_1;
  int nn_num_size_1;
  __m256 _sumG;
  __m256 _sumO;
  __m256 _sumF;
  __m256 _sumI;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  float *gates_data_G_2;
  float *gates_data_O_2;
  float *gates_data_F_2;
  float *gates_data_I_2;
  float *bias_c_G_1;
  float *bias_c_O_1;
  float *bias_c_F_1;
  float *bias_c_I_1;
  float *hidden_ptr_r_1;
  float *x_1;
  int q_1;
  float h_cont_1;
  float xi_1;
  float sums [8];
  __m256 h_cont;
  int remain_num_output;
  int nn_num_output_1;
  __m256 xi;
  int remain_size;
  int nn_num_size;
  __m256 _sumG_1;
  __m256 _sumO_1;
  __m256 _sumF_1;
  __m256 _sumI_1;
  __m256 _sumG_0;
  __m256 _sumO_0;
  __m256 _sumF_0;
  __m256 _sumI_0;
  float *weight_hc_G_1;
  float *weight_hc_O_1;
  float *weight_hc_F_1;
  float *weight_hc_I_1;
  float *weight_hc_G_0;
  float *weight_hc_O_0;
  float *weight_hc_F_0;
  float *weight_hc_I_0;
  float *weight_xc_G_1;
  float *weight_xc_O_1;
  float *weight_xc_F_1;
  float *weight_xc_I_1;
  float *weight_xc_G_0;
  float *weight_xc_O_0;
  float *weight_xc_F_0;
  float *weight_xc_I_0;
  float *gates_data_G_1;
  float *gates_data_O_1;
  float *gates_data_F_1;
  float *gates_data_I_1;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  float *hidden_ptr_r;
  float *x;
  int q;
  int qq;
  int remain_num_output_start;
  int nn_num_output;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  __m256 vb1;
  __m256 vb0;
  __m256 s4556;
  __m256 s0123;
  __m256 s67;
  __m256 s45;
  __m256 s23;
  __m256 s01;
  __m256 s0123_1;
  __m256 s23_1;
  __m256 s01_1;
  __m256 one_4;
  __m256 one_2;
  __m256 one;
  __m256 two_1;
  __m256 one_9;
  __m256 one_10;
  __m256 two;
  __m256 one_6;
  __m256 one_7;
  __m256 pow2n_3;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_8;
  __m256i imm0_3;
  __m256 fx_3;
  __m256 tmp_3;
  __m256 pow2n_4;
  __m256 y_4;
  __m256 mask_4;
  __m256 one_11;
  __m256i imm0_4;
  __m256 fx_4;
  __m256 tmp_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_3;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_2;
  __m256 fx_2;
  __m256 tmp_2;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_22;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  __m256i ret_9;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  undefined4 in_stack_ffffffffffff7870;
  undefined4 in_stack_ffffffffffff7874;
  undefined4 in_stack_ffffffffffff7878;
  undefined4 in_stack_ffffffffffff787c;
  int in_stack_ffffffffffff7880;
  int in_stack_ffffffffffff7884;
  undefined4 in_stack_ffffffffffff7888;
  undefined4 in_stack_ffffffffffff788c;
  undefined8 local_8760;
  undefined8 uStack_8758;
  undefined8 uStack_8750;
  undefined8 uStack_8748;
  undefined8 local_86e0;
  undefined8 uStack_86d8;
  undefined8 uStack_86d0;
  undefined8 uStack_86c8;
  undefined8 local_8680;
  undefined8 uStack_8678;
  undefined8 uStack_8670;
  undefined8 uStack_8668;
  undefined8 local_84e0;
  undefined8 uStack_84d8;
  undefined8 uStack_84d0;
  undefined8 uStack_84c8;
  undefined8 local_8460;
  undefined8 uStack_8458;
  undefined8 uStack_8450;
  undefined8 uStack_8448;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 uStack_83f0;
  undefined8 uStack_83e8;
  undefined8 local_8280;
  undefined8 uStack_8278;
  undefined8 uStack_8270;
  undefined8 uStack_8268;
  undefined8 local_8220;
  undefined8 uStack_8218;
  undefined8 uStack_8210;
  undefined8 uStack_8208;
  undefined8 local_81a0;
  undefined8 uStack_8198;
  undefined8 uStack_8190;
  undefined8 uStack_8188;
  undefined8 local_8120;
  undefined8 uStack_8118;
  undefined8 uStack_8110;
  undefined8 uStack_8108;
  undefined8 local_80c0;
  undefined8 uStack_80b8;
  undefined8 uStack_80b0;
  undefined8 uStack_80a8;
  undefined8 local_8040;
  undefined8 uStack_8038;
  undefined8 uStack_8030;
  undefined8 uStack_8028;
  undefined8 local_7fc0;
  undefined8 uStack_7fb8;
  undefined8 uStack_7fb0;
  undefined8 uStack_7fa8;
  undefined8 local_7f60;
  undefined8 uStack_7f58;
  undefined8 uStack_7f50;
  undefined8 uStack_7f48;
  int local_74e4;
  bool local_74b9;
  uint local_73d8;
  int local_73d4;
  uint *local_73d0;
  undefined1 (*local_73c8) [32];
  undefined1 (*local_73c0) [32];
  undefined1 (*local_73b8) [32];
  float *local_73b0;
  float *local_73a8;
  undefined1 (*local_73a0) [32];
  float local_7390;
  float fStack_738c;
  float fStack_7388;
  float fStack_7384;
  undefined8 local_7380;
  undefined8 uStack_7378;
  undefined8 uStack_7370;
  undefined8 uStack_7368;
  uint local_7348;
  int local_7344;
  undefined8 local_7340;
  undefined8 uStack_7338;
  undefined8 uStack_7330;
  undefined8 uStack_7328;
  uint local_7308;
  int local_7304;
  undefined8 local_7300;
  undefined8 uStack_72f8;
  undefined8 uStack_72f0;
  undefined8 uStack_72e8;
  undefined8 local_72e0;
  undefined8 uStack_72d8;
  undefined8 uStack_72d0;
  undefined8 uStack_72c8;
  undefined8 local_72c0;
  undefined8 uStack_72b8;
  undefined8 uStack_72b0;
  undefined8 uStack_72a8;
  undefined8 local_72a0;
  undefined8 uStack_7298;
  undefined8 uStack_7290;
  undefined8 uStack_7288;
  float *local_7280;
  float *local_7278;
  float *local_7270;
  float *local_7268;
  float *local_7260;
  float *local_7258;
  float *local_7250;
  float *local_7248;
  undefined1 *local_7240;
  undefined1 *local_7238;
  undefined1 *local_7230;
  undefined1 (*local_7228) [32];
  long local_7220;
  long local_7218;
  long local_7210;
  long local_7208;
  float *local_7200;
  float *local_71f8;
  int local_71ec;
  float local_71e8;
  float local_71e4;
  float local_71e0;
  float fStack_71dc;
  float fStack_71d8;
  float fStack_71d4;
  float fStack_71d0;
  float fStack_71cc;
  float fStack_71c8;
  float fStack_71c4;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 uStack_71b0;
  undefined8 uStack_71a8;
  uint local_7188;
  int local_7184;
  undefined8 local_7180;
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  uint local_7148;
  int local_7144;
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 local_70e0;
  undefined8 uStack_70d8;
  undefined8 uStack_70d0;
  undefined8 uStack_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_70a0;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  undefined8 uStack_7088;
  undefined8 local_7080;
  undefined8 uStack_7078;
  undefined8 uStack_7070;
  undefined8 uStack_7068;
  undefined8 local_7060;
  undefined8 uStack_7058;
  undefined8 uStack_7050;
  undefined8 uStack_7048;
  float *local_7028;
  float *local_7020;
  float *local_7018;
  float *local_7010;
  float *local_7008;
  float *local_7000;
  float *local_6ff8;
  float *local_6ff0;
  float *local_6fe8;
  float *local_6fe0;
  float *local_6fd8;
  float *local_6fd0;
  float *local_6fc8;
  float *local_6fc0;
  float *local_6fb8;
  float *local_6fb0;
  undefined1 *local_6fa8;
  undefined1 *local_6fa0;
  undefined1 *local_6f98;
  undefined1 (*local_6f90) [32];
  long local_6f88;
  long local_6f80;
  long local_6f78;
  long local_6f70;
  float *local_6f68;
  float *local_6f60;
  int local_6f58;
  int local_6f54;
  int local_6f50;
  int local_6f4c;
  int local_6f48;
  int local_6f44;
  undefined4 local_6f40;
  undefined1 (*local_6f30) [32];
  int *local_6f28;
  long local_6f20;
  undefined4 local_6f18;
  long *local_6f10;
  undefined4 local_6f08;
  int local_6f04;
  undefined4 local_6f00;
  undefined4 local_6efc;
  int local_6ef8;
  long local_6ef0;
  uint local_6ee4;
  int local_6ee0;
  uint local_6edc;
  long *local_6ed8;
  long *local_6ed0;
  long *local_6ec8;
  int local_6ebc;
  long *local_6eb8;
  long *local_6eb0;
  int local_6ea4;
  undefined1 (**local_6ea0) [32];
  undefined1 (**local_6e98) [32];
  size_t local_6e88;
  undefined8 local_6e80;
  undefined4 local_6e78;
  uint local_6e74;
  undefined1 (**local_6e70) [32];
  undefined4 local_6e64;
  undefined1 (**local_6e60) [32];
  undefined4 local_6e54;
  undefined1 (**local_6e50) [32];
  undefined4 local_6e44;
  undefined1 (**local_6e40) [32];
  undefined4 local_6e34;
  undefined1 (**local_6e30) [32];
  int local_6e24;
  long *local_6e20;
  undefined4 local_6e14;
  undefined1 (**local_6e10) [32];
  undefined4 local_6e04;
  undefined1 (**local_6e00) [32];
  undefined4 local_6df4;
  undefined1 (**local_6df0) [32];
  undefined4 local_6de4;
  undefined1 (**local_6de0) [32];
  undefined4 local_6dd4;
  undefined1 (**local_6dd0) [32];
  undefined4 local_6dc4;
  undefined1 (**local_6dc0) [32];
  undefined4 local_6db4;
  undefined1 (**local_6db0) [32];
  undefined4 local_6da4;
  undefined1 (**local_6da0) [32];
  undefined1 (**local_6d98) [32];
  int local_6d8c;
  long *local_6d88;
  int local_6d7c;
  long *local_6d78;
  int local_6d6c;
  long *local_6d68;
  int local_6d5c;
  long *local_6d58;
  int local_6d4c;
  long *local_6d48;
  int local_6d3c;
  long *local_6d38;
  int local_6d2c;
  long *local_6d28;
  int local_6d1c;
  long *local_6d18;
  undefined4 local_6d0c;
  long *local_6d08;
  undefined4 local_6cfc;
  long *local_6cf8;
  undefined4 local_6cec;
  long *local_6ce8;
  undefined4 local_6cdc;
  long *local_6cd8;
  int local_6ccc;
  long *local_6cc8;
  int local_6cbc;
  long *local_6cb8;
  int local_6cac;
  long *local_6ca8;
  int local_6c9c;
  long *local_6c98;
  int local_6c8c;
  long *local_6c88;
  int local_6c7c;
  long *local_6c78;
  int local_6c6c;
  long *local_6c68;
  int local_6c5c;
  long *local_6c58;
  int local_6c4c;
  long *local_6c48;
  int local_6c3c;
  long *local_6c38;
  int local_6c2c;
  long *local_6c28;
  int local_6c1c;
  long *local_6c18;
  int local_6c0c;
  long *local_6c08;
  int local_6bfc;
  long *local_6bf8;
  int local_6bec;
  long *local_6be8;
  int local_6bdc;
  long *local_6bd8;
  int local_6bcc;
  long *local_6bc8;
  undefined4 local_6bbc;
  long *local_6bb8;
  undefined4 local_6bac;
  long *local_6ba8;
  undefined4 local_6b9c;
  long *local_6b98;
  undefined4 local_6b8c;
  long *local_6b88;
  int local_6b7c;
  long *local_6b78;
  undefined8 *local_6b70;
  undefined8 *local_6b68;
  undefined1 local_6b60 [32];
  undefined1 local_6b40 [32];
  undefined1 local_6b20 [32];
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  undefined1 local_6ae0 [32];
  undefined1 local_6ac0 [32];
  undefined1 local_6aa0 [32];
  undefined1 local_6a80 [32];
  undefined1 local_6a60 [32];
  undefined1 local_6a40 [32];
  undefined1 local_6a20 [32];
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  float *local_69c8;
  uint *local_69c0;
  undefined1 (*local_69b8) [32];
  undefined1 (*local_69b0) [32];
  undefined1 (*local_69a8) [32];
  float *local_69a0;
  float *local_6998;
  float *local_6990;
  float *local_6988;
  float *local_6980;
  float *local_6978;
  float *local_6970;
  float *local_6968;
  float *local_6960;
  float *local_6958;
  float *local_6950;
  float *local_6948;
  float *local_6940;
  float *local_6938;
  float *local_6930;
  float *local_6928;
  float *local_6920;
  float *local_6918;
  float *local_6910;
  float *local_6908;
  float *local_6900;
  float *local_68f8;
  float *local_68f0;
  float *local_68e8;
  float *local_68e0;
  float *local_68d8;
  float *local_68d0;
  float *local_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined8 local_6820;
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  undefined8 local_6800;
  undefined8 uStack_67f8;
  undefined8 uStack_67f0;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined8 local_6360;
  undefined8 uStack_6358;
  undefined8 uStack_6350;
  undefined8 uStack_6348;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 local_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined1 (*local_5f88) [32];
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  float *local_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  float *local_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  float *local_5ec8;
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined8 *local_5dc0;
  undefined8 *local_5db8;
  undefined8 *local_5db0;
  undefined8 *local_5da8;
  undefined8 *local_5da0;
  undefined8 *local_5d98;
  undefined8 *local_5d90;
  undefined8 *local_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  float *local_5d68;
  undefined1 local_5d60 [24];
  undefined8 uStack_5d48;
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined8 *local_5cf0;
  undefined8 *local_5ce8;
  undefined8 *local_5ce0;
  undefined8 *local_5cd8;
  undefined8 *local_5cd0;
  Mat *local_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined1 local_5c80 [32];
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined1 local_5bc0 [32];
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined1 local_5b00 [32];
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  undefined4 uStack_5a44;
  undefined1 local_5a40 [32];
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined1 local_58c0 [8];
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  float local_5800;
  float fStack_57fc;
  float fStack_57f8;
  float fStack_57f4;
  float fStack_57f0;
  float fStack_57ec;
  float fStack_57e8;
  float fStack_57e4;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  float local_57c0;
  float fStack_57bc;
  float fStack_57b8;
  float fStack_57b4;
  float fStack_57b0;
  float fStack_57ac;
  float fStack_57a8;
  float fStack_57a4;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  float local_5780;
  float fStack_577c;
  float fStack_5778;
  float fStack_5774;
  float fStack_5770;
  float fStack_576c;
  float fStack_5768;
  float fStack_5764;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  float local_5740;
  float fStack_573c;
  float fStack_5738;
  float fStack_5734;
  float fStack_5730;
  float fStack_572c;
  float fStack_5728;
  float fStack_5724;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  float local_5700;
  float fStack_56fc;
  float fStack_56f8;
  float fStack_56f4;
  float fStack_56f0;
  float fStack_56ec;
  float fStack_56e8;
  float fStack_56e4;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  float local_56c0;
  float fStack_56bc;
  float fStack_56b8;
  float fStack_56b4;
  float fStack_56b0;
  float fStack_56ac;
  float fStack_56a8;
  float fStack_56a4;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  float local_5680;
  float fStack_567c;
  float fStack_5678;
  float fStack_5674;
  float fStack_5670;
  float fStack_566c;
  float fStack_5668;
  float fStack_5664;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  float local_5640;
  float fStack_563c;
  float fStack_5638;
  float fStack_5634;
  float fStack_5630;
  float fStack_562c;
  float fStack_5628;
  float fStack_5624;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  float local_5600;
  float fStack_55fc;
  float fStack_55f8;
  float fStack_55f4;
  float fStack_55f0;
  float fStack_55ec;
  float fStack_55e8;
  float fStack_55e4;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  float local_55c0;
  float fStack_55bc;
  float fStack_55b8;
  float fStack_55b4;
  float fStack_55b0;
  float fStack_55ac;
  float fStack_55a8;
  float fStack_55a4;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  float local_5580;
  float fStack_557c;
  float fStack_5578;
  float fStack_5574;
  float fStack_5570;
  float fStack_556c;
  float fStack_5568;
  float fStack_5564;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  float local_5540;
  float fStack_553c;
  float fStack_5538;
  float fStack_5534;
  float fStack_5530;
  float fStack_552c;
  float fStack_5528;
  float fStack_5524;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  float local_5500;
  float fStack_54fc;
  float fStack_54f8;
  float fStack_54f4;
  float fStack_54f0;
  float fStack_54ec;
  float fStack_54e8;
  float fStack_54e4;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  float local_54c0;
  float fStack_54bc;
  float fStack_54b8;
  float fStack_54b4;
  float fStack_54b0;
  float fStack_54ac;
  float fStack_54a8;
  float fStack_54a4;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  float local_5480;
  float fStack_547c;
  float fStack_5478;
  float fStack_5474;
  float fStack_5470;
  float fStack_546c;
  float fStack_5468;
  float fStack_5464;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  float local_5440;
  float fStack_543c;
  float fStack_5438;
  float fStack_5434;
  float fStack_5430;
  float fStack_542c;
  float fStack_5428;
  float fStack_5424;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  float local_5400;
  float fStack_53fc;
  float fStack_53f8;
  float fStack_53f4;
  float fStack_53f0;
  float fStack_53ec;
  float fStack_53e8;
  float fStack_53e4;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  float local_53c0;
  float fStack_53bc;
  float fStack_53b8;
  float fStack_53b4;
  float fStack_53b0;
  float fStack_53ac;
  float fStack_53a8;
  float fStack_53a4;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  float local_5380;
  float fStack_537c;
  float fStack_5378;
  float fStack_5374;
  float fStack_5370;
  float fStack_536c;
  float fStack_5368;
  float fStack_5364;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  float local_5340;
  float fStack_533c;
  float fStack_5338;
  float fStack_5334;
  float fStack_5330;
  float fStack_532c;
  float fStack_5328;
  float fStack_5324;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  float local_5300;
  float fStack_52fc;
  float fStack_52f8;
  float fStack_52f4;
  float fStack_52f0;
  float fStack_52ec;
  float fStack_52e8;
  float fStack_52e4;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  float local_52c0;
  float fStack_52bc;
  float fStack_52b8;
  float fStack_52b4;
  float fStack_52b0;
  float fStack_52ac;
  float fStack_52a8;
  float fStack_52a4;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined1 local_5240 [8];
  float fStack_5238;
  float fStack_5234;
  float fStack_5230;
  float fStack_522c;
  float fStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined1 local_51c0 [8];
  float fStack_51b8;
  float fStack_51b4;
  float fStack_51b0;
  float fStack_51ac;
  float fStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  float local_5140;
  float fStack_513c;
  float fStack_5138;
  float fStack_5134;
  float fStack_5130;
  float fStack_512c;
  float fStack_5128;
  float fStack_5124;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  float local_5100;
  float fStack_50fc;
  float fStack_50f8;
  float fStack_50f4;
  float fStack_50f0;
  float fStack_50ec;
  float fStack_50e8;
  float fStack_50e4;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  float local_50c0;
  float fStack_50bc;
  float fStack_50b8;
  float fStack_50b4;
  float fStack_50b0;
  float fStack_50ac;
  float fStack_50a8;
  float fStack_50a4;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  float local_5080;
  float fStack_507c;
  float fStack_5078;
  float fStack_5074;
  float fStack_5070;
  float fStack_506c;
  float fStack_5068;
  float fStack_5064;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  float local_5040;
  float fStack_503c;
  float fStack_5038;
  float fStack_5034;
  float fStack_5030;
  float fStack_502c;
  float fStack_5028;
  float fStack_5024;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  float local_5000;
  float fStack_4ffc;
  float fStack_4ff8;
  float fStack_4ff4;
  float fStack_4ff0;
  float fStack_4fec;
  float fStack_4fe8;
  float fStack_4fe4;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  float local_4fc0;
  float fStack_4fbc;
  float fStack_4fb8;
  float fStack_4fb4;
  float fStack_4fb0;
  float fStack_4fac;
  float fStack_4fa8;
  float fStack_4fa4;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  float local_4f80;
  float fStack_4f7c;
  float fStack_4f78;
  float fStack_4f74;
  float fStack_4f70;
  float fStack_4f6c;
  float fStack_4f68;
  float fStack_4f64;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  float local_4f40;
  float fStack_4f3c;
  float fStack_4f38;
  float fStack_4f34;
  float fStack_4f30;
  float fStack_4f2c;
  float fStack_4f28;
  float fStack_4f24;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  float local_4f00;
  float fStack_4efc;
  float fStack_4ef8;
  float fStack_4ef4;
  float fStack_4ef0;
  float fStack_4eec;
  float fStack_4ee8;
  float fStack_4ee4;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  float local_4ec0;
  float fStack_4ebc;
  float fStack_4eb8;
  float fStack_4eb4;
  float fStack_4eb0;
  float fStack_4eac;
  float fStack_4ea8;
  float fStack_4ea4;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  float local_4e80;
  float fStack_4e7c;
  float fStack_4e78;
  float fStack_4e74;
  float fStack_4e70;
  float fStack_4e6c;
  float fStack_4e68;
  float fStack_4e64;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  float local_4e40;
  float fStack_4e3c;
  float fStack_4e38;
  float fStack_4e34;
  float fStack_4e30;
  float fStack_4e2c;
  float fStack_4e28;
  float fStack_4e24;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  float local_4e00;
  float fStack_4dfc;
  float fStack_4df8;
  float fStack_4df4;
  float fStack_4df0;
  float fStack_4dec;
  float fStack_4de8;
  float fStack_4de4;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  float local_4dc0;
  float fStack_4dbc;
  float fStack_4db8;
  float fStack_4db4;
  float fStack_4db0;
  float fStack_4dac;
  float fStack_4da8;
  float fStack_4da4;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  float local_4d80;
  float fStack_4d7c;
  float fStack_4d78;
  float fStack_4d74;
  float fStack_4d70;
  float fStack_4d6c;
  float fStack_4d68;
  float fStack_4d64;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  float local_4d40;
  float fStack_4d3c;
  float fStack_4d38;
  float fStack_4d34;
  float fStack_4d30;
  float fStack_4d2c;
  float fStack_4d28;
  float fStack_4d24;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  float local_4d00;
  float fStack_4cfc;
  float fStack_4cf8;
  float fStack_4cf4;
  float fStack_4cf0;
  float fStack_4cec;
  float fStack_4ce8;
  float fStack_4ce4;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  float local_4cc0;
  float fStack_4cbc;
  float fStack_4cb8;
  float fStack_4cb4;
  float fStack_4cb0;
  float fStack_4cac;
  float fStack_4ca8;
  float fStack_4ca4;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  float local_4c80;
  float fStack_4c7c;
  float fStack_4c78;
  float fStack_4c74;
  float fStack_4c70;
  float fStack_4c6c;
  float fStack_4c68;
  float fStack_4c64;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  float local_4c40;
  float fStack_4c3c;
  float fStack_4c38;
  float fStack_4c34;
  float fStack_4c30;
  float fStack_4c2c;
  float fStack_4c28;
  float fStack_4c24;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  float local_4c00;
  float fStack_4bfc;
  float fStack_4bf8;
  float fStack_4bf4;
  float fStack_4bf0;
  float fStack_4bec;
  float fStack_4be8;
  float fStack_4be4;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  float local_4bc0;
  float fStack_4bbc;
  float fStack_4bb8;
  float fStack_4bb4;
  float fStack_4bb0;
  float fStack_4bac;
  float fStack_4ba8;
  float fStack_4ba4;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  float local_4b80;
  float fStack_4b7c;
  float fStack_4b78;
  float fStack_4b74;
  float fStack_4b70;
  float fStack_4b6c;
  float fStack_4b68;
  float fStack_4b64;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined1 local_4b40 [8];
  float fStack_4b38;
  float fStack_4b34;
  float fStack_4b30;
  float fStack_4b2c;
  float fStack_4b28;
  undefined4 uStack_4b24;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined1 local_4850 [8];
  float fStack_4848;
  float fStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined4 local_4804;
  undefined4 local_4800;
  undefined4 local_47fc;
  undefined4 local_47f8;
  undefined4 local_47f4;
  undefined4 local_47f0;
  undefined4 local_47ec;
  undefined4 local_47e8;
  undefined4 local_47e4;
  float local_47e0;
  float fStack_47dc;
  float fStack_47d8;
  float fStack_47d4;
  float fStack_47d0;
  float fStack_47cc;
  float fStack_47c8;
  float fStack_47c4;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  float local_47a0;
  float fStack_479c;
  float fStack_4798;
  float fStack_4794;
  float fStack_4790;
  float fStack_478c;
  float fStack_4788;
  float fStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  float local_4760;
  float fStack_475c;
  float fStack_4758;
  float fStack_4754;
  float fStack_4750;
  float fStack_474c;
  float fStack_4748;
  float fStack_4744;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  float local_4720;
  float fStack_471c;
  float fStack_4718;
  float fStack_4714;
  float fStack_4710;
  float fStack_470c;
  float fStack_4708;
  float fStack_4704;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  float local_46e0;
  float fStack_46dc;
  float fStack_46d8;
  float fStack_46d4;
  float fStack_46d0;
  float fStack_46cc;
  float fStack_46c8;
  float fStack_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined1 local_4660 [32];
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined1 local_4600 [8];
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined1 local_45c0 [32];
  undefined1 local_45a0 [32];
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  float local_42c0;
  float fStack_42bc;
  float fStack_42b8;
  float fStack_42b4;
  float fStack_42b0;
  float fStack_42ac;
  float fStack_42a8;
  undefined4 uStack_42a4;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  float local_4280;
  float fStack_427c;
  float fStack_4278;
  float fStack_4274;
  float fStack_4270;
  float fStack_426c;
  float fStack_4268;
  float fStack_4264;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  float local_4240;
  float fStack_423c;
  float fStack_4238;
  float fStack_4234;
  float fStack_4230;
  float fStack_422c;
  float fStack_4228;
  float fStack_4224;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  float local_4200;
  float fStack_41fc;
  float fStack_41f8;
  float fStack_41f4;
  float fStack_41f0;
  float fStack_41ec;
  float fStack_41e8;
  float fStack_41e4;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  float local_41c0;
  float fStack_41bc;
  float fStack_41b8;
  float fStack_41b4;
  float fStack_41b0;
  float fStack_41ac;
  float fStack_41a8;
  float fStack_41a4;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  float local_4180;
  float fStack_417c;
  float fStack_4178;
  float fStack_4174;
  float fStack_4170;
  float fStack_416c;
  float fStack_4168;
  float fStack_4164;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  float local_4140;
  float fStack_413c;
  float fStack_4138;
  float fStack_4134;
  float fStack_4130;
  float fStack_412c;
  float fStack_4128;
  float fStack_4124;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined1 local_3e60 [32];
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined1 local_3e00 [8];
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined1 local_3dc0 [32];
  undefined1 local_3da0 [32];
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  float local_3ac0;
  float fStack_3abc;
  float fStack_3ab8;
  float fStack_3ab4;
  float fStack_3ab0;
  float fStack_3aac;
  float fStack_3aa8;
  undefined4 uStack_3aa4;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  float local_3a80;
  float fStack_3a7c;
  float fStack_3a78;
  float fStack_3a74;
  float fStack_3a70;
  float fStack_3a6c;
  float fStack_3a68;
  float fStack_3a64;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  float local_3a40;
  float fStack_3a3c;
  float fStack_3a38;
  float fStack_3a34;
  float fStack_3a30;
  float fStack_3a2c;
  float fStack_3a28;
  float fStack_3a24;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  float local_3a00;
  float fStack_39fc;
  float fStack_39f8;
  float fStack_39f4;
  float fStack_39f0;
  float fStack_39ec;
  float fStack_39e8;
  float fStack_39e4;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  float local_39c0;
  float fStack_39bc;
  float fStack_39b8;
  float fStack_39b4;
  float fStack_39b0;
  float fStack_39ac;
  float fStack_39a8;
  float fStack_39a4;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  float local_3980;
  float fStack_397c;
  float fStack_3978;
  float fStack_3974;
  float fStack_3970;
  float fStack_396c;
  float fStack_3968;
  float fStack_3964;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  float local_3940;
  float fStack_393c;
  float fStack_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  float fStack_3928;
  float fStack_3924;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined1 local_3660 [32];
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined1 local_3600 [8];
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined1 local_35c0 [32];
  undefined1 local_35a0 [32];
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  float local_32c0;
  float fStack_32bc;
  float fStack_32b8;
  float fStack_32b4;
  float fStack_32b0;
  float fStack_32ac;
  float fStack_32a8;
  undefined4 uStack_32a4;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  float local_3280;
  float fStack_327c;
  float fStack_3278;
  float fStack_3274;
  float fStack_3270;
  float fStack_326c;
  float fStack_3268;
  float fStack_3264;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  float local_3240;
  float fStack_323c;
  float fStack_3238;
  float fStack_3234;
  float fStack_3230;
  float fStack_322c;
  float fStack_3228;
  float fStack_3224;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  float local_3200;
  float fStack_31fc;
  float fStack_31f8;
  float fStack_31f4;
  float fStack_31f0;
  float fStack_31ec;
  float fStack_31e8;
  float fStack_31e4;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  float local_31c0;
  float fStack_31bc;
  float fStack_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  float fStack_31a8;
  float fStack_31a4;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  float local_3180;
  float fStack_317c;
  float fStack_3178;
  float fStack_3174;
  float fStack_3170;
  float fStack_316c;
  float fStack_3168;
  float fStack_3164;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  float local_3140;
  float fStack_313c;
  float fStack_3138;
  float fStack_3134;
  float fStack_3130;
  float fStack_312c;
  float fStack_3128;
  float fStack_3124;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined1 local_2e60 [32];
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined1 local_2e00 [8];
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined4 uStack_2aa4;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  float local_2a80;
  float fStack_2a7c;
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  float fStack_2a64;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  float local_2a40;
  float fStack_2a3c;
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float fStack_2a24;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  float local_2a00;
  float fStack_29fc;
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  float fStack_29e4;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  float local_29c0;
  float fStack_29bc;
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  float fStack_29a4;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  float local_2940;
  float fStack_293c;
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [8];
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  float fStack_22a8;
  undefined4 uStack_22a4;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  float local_2240;
  float fStack_223c;
  float fStack_2238;
  float fStack_2234;
  float fStack_2230;
  float fStack_222c;
  float fStack_2228;
  float fStack_2224;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float fStack_21e4;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  float fStack_21a8;
  float fStack_21a4;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  float fStack_2164;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  float local_2140;
  float fStack_213c;
  float fStack_2138;
  float fStack_2134;
  float fStack_2130;
  float fStack_212c;
  float fStack_2128;
  float fStack_2124;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  undefined4 uStack_1d24;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  ulong uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  undefined4 uStack_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  ulong uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  ulong uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  ulong uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  ulong uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined1 local_1ba0 [32];
  undefined4 local_1b80;
  undefined4 local_1b7c;
  undefined4 local_1b78;
  undefined4 local_1b74;
  undefined4 local_1b70;
  undefined4 local_1b6c;
  undefined4 local_1b68;
  undefined4 local_1b64;
  undefined1 local_1b60 [32];
  undefined4 local_1b40;
  undefined4 local_1b3c;
  undefined4 local_1b38;
  undefined4 local_1b34;
  undefined4 local_1b30;
  undefined4 local_1b2c;
  undefined4 local_1b28;
  undefined4 local_1b24;
  undefined1 local_1b20 [32];
  undefined4 local_1b00;
  undefined4 local_1afc;
  undefined4 local_1af8;
  undefined4 local_1af4;
  undefined4 local_1af0;
  undefined4 local_1aec;
  undefined4 local_1ae8;
  undefined4 local_1ae4;
  undefined1 local_1ae0 [32];
  undefined4 local_1ac0;
  undefined4 local_1abc;
  undefined4 local_1ab8;
  undefined4 local_1ab4;
  undefined4 local_1ab0;
  undefined4 local_1aac;
  undefined4 local_1aa8;
  undefined4 local_1aa4;
  undefined1 local_1aa0 [32];
  undefined4 local_1a80;
  undefined4 local_1a7c;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined4 local_1a70;
  undefined4 local_1a6c;
  undefined4 local_1a68;
  undefined4 local_1a64;
  undefined1 local_1a60 [32];
  undefined4 local_1a40;
  undefined4 local_1a3c;
  undefined4 local_1a38;
  undefined4 local_1a34;
  undefined4 local_1a30;
  undefined4 local_1a2c;
  undefined4 local_1a28;
  undefined4 local_1a24;
  undefined1 local_1a20 [32];
  undefined4 local_1a00;
  undefined4 local_19fc;
  undefined4 local_19f8;
  undefined4 local_19f4;
  undefined4 local_19f0;
  undefined4 local_19ec;
  undefined4 local_19e8;
  undefined4 local_19e4;
  undefined1 local_19e0 [32];
  undefined4 local_19c0;
  undefined4 local_19bc;
  undefined4 local_19b8;
  undefined4 local_19b4;
  undefined4 local_19b0;
  undefined4 local_19ac;
  undefined4 local_19a8;
  undefined4 local_19a4;
  undefined1 local_19a0 [32];
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined4 local_1970;
  undefined4 local_196c;
  undefined4 local_1968;
  undefined4 local_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined4 local_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined4 local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined4 local_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined4 local_174;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined4 local_154;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined4 local_134;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  int local_50;
  undefined4 local_4c;
  undefined1 (**local_48) [32];
  undefined1 (*local_40) [32];
  
  local_6edc = *(uint *)((long)in_RDI + 0x2c);
  local_6ee0 = (int)in_RDI[6];
  local_6ee4 = *(uint *)((long)in_RSI + 0x2c);
  local_6e88 = cell_state->elemsize;
  local_6e70 = &local_6f30;
  local_6e78 = 4;
  local_6e80 = 4;
  local_6f30 = (undefined1 (*) [32])0x0;
  local_6f28 = (int *)0x0;
  local_6f20 = 0;
  local_6f18 = 0;
  local_6f10 = (long *)0x0;
  local_6f08 = 0;
  local_6f04 = 0;
  local_6f00 = 0;
  local_6efc = 0;
  local_6ef8 = 0;
  local_6ef0 = 0;
  local_6ed8 = in_R9;
  local_6ed0 = in_R8;
  local_6ec8 = in_RCX;
  local_6ebc = in_EDX;
  local_6eb8 = in_RSI;
  local_6eb0 = in_RDI;
  local_6e74 = local_6ee4;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffff788c,in_stack_ffffffffffff7888),
              in_stack_ffffffffffff7884,in_stack_ffffffffffff7880,
              CONCAT44(in_stack_ffffffffffff787c,in_stack_ffffffffffff7878),
              (Allocator *)CONCAT44(in_stack_ffffffffffff7874,in_stack_ffffffffffff7870));
  local_6ea0 = &local_6f30;
  if (local_6f30 != (undefined1 (*) [32])0x0) {
    local_6d98 = local_6ea0;
  }
  local_74b9 = local_6f30 != (undefined1 (*) [32])0x0 && local_6ef0 * local_6ef8 != 0;
  if (local_74b9) {
    for (local_6f44 = 0; local_6f44 < local_6ee0; local_6f44 = local_6f44 + 1) {
      if (local_6ebc == 0) {
        local_74e4 = local_6f44;
      }
      else {
        local_74e4 = (local_6ee0 + -1) - local_6f44;
      }
      local_6f48 = local_74e4;
      local_6f4c = (int)local_6ee4 >> 1;
      local_6f50 = local_6f4c << 1;
      local_6f54 = 0;
      while( true ) {
        local_73d4 = (int)local_6ee4 >> 3;
        local_71ec = local_6f50;
        if (local_6f4c <= local_6f54) break;
        local_6f58 = local_6f54 * 2;
        local_6b78 = local_6eb0;
        local_6b7c = local_74e4;
        local_6f60 = (float *)(*local_6eb0 +
                              (long)*(int *)((long)local_6eb0 + 0x2c) * (long)local_74e4 *
                              local_6eb0[2]);
        local_6b68 = in_stack_00000008;
        local_6f68 = (float *)*in_stack_00000008;
        local_6b88 = local_6ed0;
        local_6b8c = 0;
        local_6f70 = *local_6ed0;
        local_6b98 = local_6ed0;
        local_6b9c = 1;
        local_6f78 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * local_6ed0[2];
        local_6ba8 = local_6ed0;
        local_6bac = 2;
        local_6f80 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * 2 * local_6ed0[2];
        local_6bb8 = local_6ed0;
        local_6bbc = 3;
        local_6f88 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * 3 * local_6ed0[2];
        local_6da0 = &local_6f30;
        local_6da4 = 0;
        local_6f90 = local_6f30;
        local_6db0 = &local_6f30;
        local_6db4 = 1;
        local_6f98 = *local_6f30 + local_6f04 * local_6f20;
        local_6dc0 = &local_6f30;
        local_6dc4 = 2;
        local_6fa0 = *local_6f30 + (long)local_6f04 * 2 * local_6f20;
        local_6dd0 = &local_6f30;
        local_6dd4 = 3;
        local_6fa8 = *local_6f30 + (long)local_6f04 * 3 * local_6f20;
        local_6bc8 = local_6ec8;
        local_6fb0 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6f58 *
                              local_6ec8[2]);
        local_6bdc = local_6ee4 + local_6f58;
        local_6bd8 = local_6ec8;
        local_6fb8 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6bdc *
                              local_6ec8[2]);
        local_6bec = local_6ee4 * 2 + local_6f58;
        local_6be8 = local_6ec8;
        local_6fc0 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6bec *
                              local_6ec8[2]);
        local_6bfc = local_6ee4 * 3 + local_6f58;
        local_6bf8 = local_6ec8;
        local_6fc8 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6bfc *
                              local_6ec8[2]);
        local_6c0c = local_6f58 + 1;
        local_6c08 = local_6ec8;
        local_6fd0 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6c0c *
                              local_6ec8[2]);
        local_6c1c = local_6ee4 + local_6f58 + 1;
        local_6c18 = local_6ec8;
        local_6fd8 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6c1c *
                              local_6ec8[2]);
        local_6c2c = local_6ee4 * 2 + local_6f58 + 1;
        local_6c28 = local_6ec8;
        local_6fe0 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6c2c *
                              local_6ec8[2]);
        local_6c3c = local_6ee4 * 3 + local_6f58 + 1;
        local_6c38 = local_6ec8;
        local_6fe8 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6c3c *
                              local_6ec8[2]);
        local_6c48 = local_6ed8;
        local_6ff0 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6f58 *
                              local_6ed8[2]);
        local_6c5c = local_6ee4 + local_6f58;
        local_6c58 = local_6ed8;
        local_6ff8 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6c5c *
                              local_6ed8[2]);
        local_6c6c = local_6ee4 * 2 + local_6f58;
        local_6c68 = local_6ed8;
        local_7000 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6c6c *
                              local_6ed8[2]);
        local_6c7c = local_6ee4 * 3 + local_6f58;
        local_6c78 = local_6ed8;
        local_7008 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6c7c *
                              local_6ed8[2]);
        local_6c8c = local_6f58 + 1;
        local_6c88 = local_6ed8;
        local_7010 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6c8c *
                              local_6ed8[2]);
        local_6c9c = local_6ee4 + local_6f58 + 1;
        local_6c98 = local_6ed8;
        local_7018 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6c9c *
                              local_6ed8[2]);
        local_6cac = local_6ee4 * 2 + local_6f58 + 1;
        local_6ca8 = local_6ed8;
        local_7020 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6cac *
                              local_6ed8[2]);
        local_6cbc = local_6ee4 * 3 + local_6f58 + 1;
        local_6cb8 = local_6ed8;
        local_7028 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6cbc *
                              local_6ed8[2]);
        local_6a00 = 0;
        uStack_69f8 = 0;
        uStack_69f0 = 0;
        uStack_69e8 = 0;
        local_7060 = 0;
        uStack_7058 = 0;
        uStack_7050 = 0;
        uStack_7048 = 0;
        local_6a20._8_8_ = SUB328(ZEXT832(0),4);
        local_7080 = 0;
        uStack_7078 = local_6a20._8_8_;
        uStack_7070 = 0;
        uStack_7068 = 0;
        local_6a40._8_8_ = SUB328(ZEXT832(0),4);
        local_70a0 = 0;
        uStack_7098 = local_6a40._8_8_;
        uStack_7090 = 0;
        uStack_7088 = 0;
        local_6a60._8_8_ = SUB328(ZEXT832(0),4);
        local_70c0 = 0;
        uStack_70b8 = local_6a60._8_8_;
        uStack_70b0 = 0;
        uStack_70a8 = 0;
        local_6a80._8_8_ = SUB328(ZEXT832(0),4);
        local_70e0 = 0;
        uStack_70d8 = local_6a80._8_8_;
        uStack_70d0 = 0;
        uStack_70c8 = 0;
        local_6aa0._8_8_ = SUB328(ZEXT832(0),4);
        local_7100 = 0;
        uStack_70f8 = local_6aa0._8_8_;
        uStack_70f0 = 0;
        uStack_70e8 = 0;
        local_6ac0._8_8_ = SUB328(ZEXT832(0),4);
        local_7120 = 0;
        uStack_7118 = local_6ac0._8_8_;
        uStack_7110 = 0;
        uStack_7108 = 0;
        local_6ae0._8_8_ = SUB328(ZEXT832(0),4);
        local_7140 = 0;
        uStack_7138 = local_6ae0._8_8_;
        uStack_7130 = 0;
        uStack_7128 = 0;
        local_7148 = local_6edc & 7;
        for (local_7144 = (int)local_6edc >> 3; 0 < local_7144; local_7144 = local_7144 + -1) {
          local_68c8 = local_6f60;
          local_7180 = *(undefined8 *)local_6f60;
          uStack_7178 = *(undefined8 *)(local_6f60 + 2);
          uStack_7170 = *(undefined8 *)(local_6f60 + 4);
          uStack_7168 = *(undefined8 *)(local_6f60 + 6);
          local_68d0 = local_6fb0;
          uVar14 = *(undefined8 *)local_6fb0;
          uVar15 = *(undefined8 *)(local_6fb0 + 2);
          uVar16 = *(undefined8 *)(local_6fb0 + 4);
          uVar17 = *(undefined8 *)(local_6fb0 + 6);
          local_6020 = local_7060;
          uStack_6018 = uStack_7058;
          uStack_6010 = uStack_7050;
          uStack_6008 = uStack_7048;
          local_5fe0._0_4_ = (float)uVar14;
          local_5140 = (float)local_5fe0;
          local_5fe0._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_513c = local_5fe0._4_4_;
          uStack_5fd8._0_4_ = (float)uVar15;
          fStack_5138 = (float)uStack_5fd8;
          uStack_5fd8._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_5134 = uStack_5fd8._4_4_;
          uStack_5fd0._0_4_ = (float)uVar16;
          fStack_5130 = (float)uStack_5fd0;
          uStack_5fd0._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_512c = uStack_5fd0._4_4_;
          uStack_5fc8._0_4_ = (float)uVar17;
          fStack_5128 = (float)uStack_5fc8;
          uStack_5fc8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_5864 = uStack_5fc8._4_4_;
          local_5160._0_4_ = (float)local_7180;
          local_5160._4_4_ = (float)((ulong)local_7180 >> 0x20);
          uStack_5158._0_4_ = (float)uStack_7178;
          uStack_5158._4_4_ = (float)((ulong)uStack_7178 >> 0x20);
          uStack_5150._0_4_ = (float)uStack_7170;
          uStack_5150._4_4_ = (float)((ulong)uStack_7170 >> 0x20);
          uStack_5148._0_4_ = (float)uStack_7168;
          local_5880 = (float)local_5fe0 * (float)local_5160;
          fStack_587c = local_5fe0._4_4_ * local_5160._4_4_;
          fStack_5878 = (float)uStack_5fd8 * (float)uStack_5158;
          fStack_5874 = uStack_5fd8._4_4_ * uStack_5158._4_4_;
          fStack_5870 = (float)uStack_5fd0 * (float)uStack_5150;
          fStack_586c = uStack_5fd0._4_4_ * uStack_5150._4_4_;
          fStack_5868 = (float)uStack_5fc8 * (float)uStack_5148;
          uVar18 = local_7060;
          uVar19 = uStack_7058;
          uVar20 = uStack_7050;
          uVar21 = uStack_7048;
          local_58a0._0_4_ = (float)local_7060;
          local_58a0._4_4_ = (float)((ulong)local_7060 >> 0x20);
          uStack_5898._0_4_ = (float)uStack_7058;
          uStack_5898._4_4_ = (float)((ulong)uStack_7058 >> 0x20);
          uStack_5890._0_4_ = (float)uStack_7050;
          uStack_5890._4_4_ = (float)((ulong)uStack_7050 >> 0x20);
          uStack_5888._0_4_ = (float)uStack_7048;
          uStack_5888._4_4_ = (float)((ulong)uStack_7048 >> 0x20);
          local_7060 = CONCAT44(fStack_587c + local_58a0._4_4_,local_5880 + (float)local_58a0);
          uStack_7058 = CONCAT44(fStack_5874 + uStack_5898._4_4_,fStack_5878 + (float)uStack_5898);
          uStack_7050 = CONCAT44(fStack_586c + uStack_5890._4_4_,fStack_5870 + (float)uStack_5890);
          uStack_7048 = CONCAT44(uStack_5fc8._4_4_ + uStack_5888._4_4_,
                                 fStack_5868 + (float)uStack_5888);
          local_68d8 = local_6fb8;
          uVar22 = *(undefined8 *)local_6fb8;
          uVar23 = *(undefined8 *)(local_6fb8 + 2);
          uVar24 = *(undefined8 *)(local_6fb8 + 4);
          uVar25 = *(undefined8 *)(local_6fb8 + 6);
          local_6080 = local_7080;
          uStack_6078 = uStack_7078;
          uStack_6070 = uStack_7070;
          uStack_6068 = uStack_7068;
          local_6040._0_4_ = (float)uVar22;
          local_5100 = (float)local_6040;
          local_6040._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_50fc = local_6040._4_4_;
          uStack_6038._0_4_ = (float)uVar23;
          fStack_50f8 = (float)uStack_6038;
          uStack_6038._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_50f4 = uStack_6038._4_4_;
          uStack_6030._0_4_ = (float)uVar24;
          fStack_50f0 = (float)uStack_6030;
          uStack_6030._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_50ec = uStack_6030._4_4_;
          uStack_6028._0_4_ = (float)uVar25;
          fStack_50e8 = (float)uStack_6028;
          uStack_6028._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_5824 = uStack_6028._4_4_;
          local_5840 = (float)local_6040 * (float)local_5160;
          fStack_583c = local_6040._4_4_ * local_5160._4_4_;
          fStack_5838 = (float)uStack_6038 * (float)uStack_5158;
          fStack_5834 = uStack_6038._4_4_ * uStack_5158._4_4_;
          fStack_5830 = (float)uStack_6030 * (float)uStack_5150;
          fStack_582c = uStack_6030._4_4_ * uStack_5150._4_4_;
          fStack_5828 = (float)uStack_6028 * (float)uStack_5148;
          uVar26 = local_7080;
          uVar27 = uStack_7078;
          uVar28 = uStack_7070;
          uVar29 = uStack_7068;
          local_5860._0_4_ = (float)local_7080;
          local_5860._4_4_ = (float)((ulong)local_7080 >> 0x20);
          uStack_5858._0_4_ = (float)uStack_7078;
          uStack_5858._4_4_ = (float)((ulong)uStack_7078 >> 0x20);
          uStack_5850._0_4_ = (float)uStack_7070;
          uStack_5850._4_4_ = (float)((ulong)uStack_7070 >> 0x20);
          uStack_5848._0_4_ = (float)uStack_7068;
          uStack_5848._4_4_ = (float)((ulong)uStack_7068 >> 0x20);
          local_7080 = CONCAT44(fStack_583c + local_5860._4_4_,local_5840 + (float)local_5860);
          uStack_7078 = CONCAT44(fStack_5834 + uStack_5858._4_4_,fStack_5838 + (float)uStack_5858);
          uStack_7070 = CONCAT44(fStack_582c + uStack_5850._4_4_,fStack_5830 + (float)uStack_5850);
          uStack_7068 = CONCAT44(uStack_6028._4_4_ + uStack_5848._4_4_,
                                 fStack_5828 + (float)uStack_5848);
          local_68e0 = local_6fc0;
          uVar30 = *(undefined8 *)local_6fc0;
          uVar31 = *(undefined8 *)(local_6fc0 + 2);
          uVar32 = *(undefined8 *)(local_6fc0 + 4);
          uVar33 = *(undefined8 *)(local_6fc0 + 6);
          local_60e0 = local_70a0;
          uStack_60d8 = uStack_7098;
          uStack_60d0 = uStack_7090;
          uStack_60c8 = uStack_7088;
          local_60a0._0_4_ = (float)uVar30;
          local_50c0 = (float)local_60a0;
          local_60a0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_50bc = local_60a0._4_4_;
          uStack_6098._0_4_ = (float)uVar31;
          fStack_50b8 = (float)uStack_6098;
          uStack_6098._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_50b4 = uStack_6098._4_4_;
          uStack_6090._0_4_ = (float)uVar32;
          fStack_50b0 = (float)uStack_6090;
          uStack_6090._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_50ac = uStack_6090._4_4_;
          uStack_6088._0_4_ = (float)uVar33;
          fStack_50a8 = (float)uStack_6088;
          uStack_6088._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_57e4 = uStack_6088._4_4_;
          local_5800 = (float)local_60a0 * (float)local_5160;
          fStack_57fc = local_60a0._4_4_ * local_5160._4_4_;
          fStack_57f8 = (float)uStack_6098 * (float)uStack_5158;
          fStack_57f4 = uStack_6098._4_4_ * uStack_5158._4_4_;
          fStack_57f0 = (float)uStack_6090 * (float)uStack_5150;
          fStack_57ec = uStack_6090._4_4_ * uStack_5150._4_4_;
          fStack_57e8 = (float)uStack_6088 * (float)uStack_5148;
          uVar34 = local_70a0;
          uVar35 = uStack_7098;
          uVar36 = uStack_7090;
          uVar37 = uStack_7088;
          local_5820._0_4_ = (float)local_70a0;
          local_5820._4_4_ = (float)((ulong)local_70a0 >> 0x20);
          uStack_5818._0_4_ = (float)uStack_7098;
          uStack_5818._4_4_ = (float)((ulong)uStack_7098 >> 0x20);
          uStack_5810._0_4_ = (float)uStack_7090;
          uStack_5810._4_4_ = (float)((ulong)uStack_7090 >> 0x20);
          uStack_5808._0_4_ = (float)uStack_7088;
          uStack_5808._4_4_ = (float)((ulong)uStack_7088 >> 0x20);
          local_70a0 = CONCAT44(fStack_57fc + local_5820._4_4_,local_5800 + (float)local_5820);
          uStack_7098 = CONCAT44(fStack_57f4 + uStack_5818._4_4_,fStack_57f8 + (float)uStack_5818);
          uStack_7090 = CONCAT44(fStack_57ec + uStack_5810._4_4_,fStack_57f0 + (float)uStack_5810);
          uStack_7088 = CONCAT44(uStack_6088._4_4_ + uStack_5808._4_4_,
                                 fStack_57e8 + (float)uStack_5808);
          local_68e8 = local_6fc8;
          uVar38 = *(undefined8 *)local_6fc8;
          uVar39 = *(undefined8 *)(local_6fc8 + 2);
          uVar40 = *(undefined8 *)(local_6fc8 + 4);
          uVar41 = *(undefined8 *)(local_6fc8 + 6);
          local_6140 = local_70c0;
          uStack_6138 = uStack_70b8;
          uStack_6130 = uStack_70b0;
          uStack_6128 = uStack_70a8;
          local_6100._0_4_ = (float)uVar38;
          local_5080 = (float)local_6100;
          local_6100._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_507c = local_6100._4_4_;
          uStack_60f8._0_4_ = (float)uVar39;
          fStack_5078 = (float)uStack_60f8;
          uStack_60f8._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_5074 = uStack_60f8._4_4_;
          uStack_60f0._0_4_ = (float)uVar40;
          fStack_5070 = (float)uStack_60f0;
          uStack_60f0._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_506c = uStack_60f0._4_4_;
          uStack_60e8._0_4_ = (float)uVar41;
          fStack_5068 = (float)uStack_60e8;
          uStack_60e8._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_57a4 = uStack_60e8._4_4_;
          local_57c0 = (float)local_6100 * (float)local_5160;
          fStack_57bc = local_6100._4_4_ * local_5160._4_4_;
          fStack_57b8 = (float)uStack_60f8 * (float)uStack_5158;
          fStack_57b4 = uStack_60f8._4_4_ * uStack_5158._4_4_;
          fStack_57b0 = (float)uStack_60f0 * (float)uStack_5150;
          fStack_57ac = uStack_60f0._4_4_ * uStack_5150._4_4_;
          fStack_57a8 = (float)uStack_60e8 * (float)uStack_5148;
          uVar42 = local_70c0;
          uVar43 = uStack_70b8;
          uVar44 = uStack_70b0;
          uVar45 = uStack_70a8;
          local_57e0._0_4_ = (float)local_70c0;
          local_57e0._4_4_ = (float)((ulong)local_70c0 >> 0x20);
          uStack_57d8._0_4_ = (float)uStack_70b8;
          uStack_57d8._4_4_ = (float)((ulong)uStack_70b8 >> 0x20);
          uStack_57d0._0_4_ = (float)uStack_70b0;
          uStack_57d0._4_4_ = (float)((ulong)uStack_70b0 >> 0x20);
          uStack_57c8._0_4_ = (float)uStack_70a8;
          uStack_57c8._4_4_ = (float)((ulong)uStack_70a8 >> 0x20);
          local_70c0 = CONCAT44(fStack_57bc + local_57e0._4_4_,local_57c0 + (float)local_57e0);
          uStack_70b8 = CONCAT44(fStack_57b4 + uStack_57d8._4_4_,fStack_57b8 + (float)uStack_57d8);
          uStack_70b0 = CONCAT44(fStack_57ac + uStack_57d0._4_4_,fStack_57b0 + (float)uStack_57d0);
          uStack_70a8 = CONCAT44(uStack_60e8._4_4_ + uStack_57c8._4_4_,
                                 fStack_57a8 + (float)uStack_57c8);
          local_68f0 = local_6fd0;
          uVar46 = *(undefined8 *)local_6fd0;
          uVar47 = *(undefined8 *)(local_6fd0 + 2);
          uVar48 = *(undefined8 *)(local_6fd0 + 4);
          uVar49 = *(undefined8 *)(local_6fd0 + 6);
          local_61a0 = local_70e0;
          uStack_6198 = uStack_70d8;
          uStack_6190 = uStack_70d0;
          uStack_6188 = uStack_70c8;
          local_6160._0_4_ = (float)uVar46;
          local_5040 = (float)local_6160;
          local_6160._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_503c = local_6160._4_4_;
          uStack_6158._0_4_ = (float)uVar47;
          fStack_5038 = (float)uStack_6158;
          uStack_6158._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_5034 = uStack_6158._4_4_;
          uStack_6150._0_4_ = (float)uVar48;
          fStack_5030 = (float)uStack_6150;
          uStack_6150._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_502c = uStack_6150._4_4_;
          uStack_6148._0_4_ = (float)uVar49;
          fStack_5028 = (float)uStack_6148;
          uStack_6148._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_5764 = uStack_6148._4_4_;
          local_5780 = (float)local_6160 * (float)local_5160;
          fStack_577c = local_6160._4_4_ * local_5160._4_4_;
          fStack_5778 = (float)uStack_6158 * (float)uStack_5158;
          fStack_5774 = uStack_6158._4_4_ * uStack_5158._4_4_;
          fStack_5770 = (float)uStack_6150 * (float)uStack_5150;
          fStack_576c = uStack_6150._4_4_ * uStack_5150._4_4_;
          fStack_5768 = (float)uStack_6148 * (float)uStack_5148;
          uVar50 = local_70e0;
          uVar51 = uStack_70d8;
          uVar52 = uStack_70d0;
          uVar53 = uStack_70c8;
          local_57a0._0_4_ = (float)local_70e0;
          local_57a0._4_4_ = (float)((ulong)local_70e0 >> 0x20);
          uStack_5798._0_4_ = (float)uStack_70d8;
          uStack_5798._4_4_ = (float)((ulong)uStack_70d8 >> 0x20);
          uStack_5790._0_4_ = (float)uStack_70d0;
          uStack_5790._4_4_ = (float)((ulong)uStack_70d0 >> 0x20);
          uStack_5788._0_4_ = (float)uStack_70c8;
          uStack_5788._4_4_ = (float)((ulong)uStack_70c8 >> 0x20);
          local_70e0 = CONCAT44(fStack_577c + local_57a0._4_4_,local_5780 + (float)local_57a0);
          uStack_70d8 = CONCAT44(fStack_5774 + uStack_5798._4_4_,fStack_5778 + (float)uStack_5798);
          uStack_70d0 = CONCAT44(fStack_576c + uStack_5790._4_4_,fStack_5770 + (float)uStack_5790);
          uStack_70c8 = CONCAT44(uStack_6148._4_4_ + uStack_5788._4_4_,
                                 fStack_5768 + (float)uStack_5788);
          local_68f8 = local_6fd8;
          uVar54 = *(undefined8 *)local_6fd8;
          uVar55 = *(undefined8 *)(local_6fd8 + 2);
          uVar56 = *(undefined8 *)(local_6fd8 + 4);
          uVar57 = *(undefined8 *)(local_6fd8 + 6);
          local_6200 = local_7100;
          uStack_61f8 = uStack_70f8;
          uStack_61f0 = uStack_70f0;
          uStack_61e8 = uStack_70e8;
          local_61c0._0_4_ = (float)uVar54;
          local_5000 = (float)local_61c0;
          local_61c0._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_4ffc = local_61c0._4_4_;
          uStack_61b8._0_4_ = (float)uVar55;
          fStack_4ff8 = (float)uStack_61b8;
          uStack_61b8._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_4ff4 = uStack_61b8._4_4_;
          uStack_61b0._0_4_ = (float)uVar56;
          fStack_4ff0 = (float)uStack_61b0;
          uStack_61b0._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_4fec = uStack_61b0._4_4_;
          uStack_61a8._0_4_ = (float)uVar57;
          fStack_4fe8 = (float)uStack_61a8;
          uStack_61a8._4_4_ = (float)((ulong)uVar57 >> 0x20);
          fStack_5724 = uStack_61a8._4_4_;
          local_5740 = (float)local_61c0 * (float)local_5160;
          fStack_573c = local_61c0._4_4_ * local_5160._4_4_;
          fStack_5738 = (float)uStack_61b8 * (float)uStack_5158;
          fStack_5734 = uStack_61b8._4_4_ * uStack_5158._4_4_;
          fStack_5730 = (float)uStack_61b0 * (float)uStack_5150;
          fStack_572c = uStack_61b0._4_4_ * uStack_5150._4_4_;
          fStack_5728 = (float)uStack_61a8 * (float)uStack_5148;
          uVar58 = local_7100;
          uVar59 = uStack_70f8;
          uVar60 = uStack_70f0;
          uVar61 = uStack_70e8;
          local_5760._0_4_ = (float)local_7100;
          local_5760._4_4_ = (float)((ulong)local_7100 >> 0x20);
          uStack_5758._0_4_ = (float)uStack_70f8;
          uStack_5758._4_4_ = (float)((ulong)uStack_70f8 >> 0x20);
          uStack_5750._0_4_ = (float)uStack_70f0;
          uStack_5750._4_4_ = (float)((ulong)uStack_70f0 >> 0x20);
          uStack_5748._0_4_ = (float)uStack_70e8;
          uStack_5748._4_4_ = (float)((ulong)uStack_70e8 >> 0x20);
          local_7100 = CONCAT44(fStack_573c + local_5760._4_4_,local_5740 + (float)local_5760);
          uStack_70f8 = CONCAT44(fStack_5734 + uStack_5758._4_4_,fStack_5738 + (float)uStack_5758);
          uStack_70f0 = CONCAT44(fStack_572c + uStack_5750._4_4_,fStack_5730 + (float)uStack_5750);
          uStack_70e8 = CONCAT44(uStack_61a8._4_4_ + uStack_5748._4_4_,
                                 fStack_5728 + (float)uStack_5748);
          local_6900 = local_6fe0;
          uVar62 = *(undefined8 *)local_6fe0;
          uVar63 = *(undefined8 *)(local_6fe0 + 2);
          uVar64 = *(undefined8 *)(local_6fe0 + 4);
          uVar65 = *(undefined8 *)(local_6fe0 + 6);
          local_6260 = local_7120;
          uStack_6258 = uStack_7118;
          uStack_6250 = uStack_7110;
          uStack_6248 = uStack_7108;
          local_6220._0_4_ = (float)uVar62;
          local_4fc0 = (float)local_6220;
          local_6220._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_4fbc = local_6220._4_4_;
          uStack_6218._0_4_ = (float)uVar63;
          fStack_4fb8 = (float)uStack_6218;
          uStack_6218._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_4fb4 = uStack_6218._4_4_;
          uStack_6210._0_4_ = (float)uVar64;
          fStack_4fb0 = (float)uStack_6210;
          uStack_6210._4_4_ = (float)((ulong)uVar64 >> 0x20);
          fStack_4fac = uStack_6210._4_4_;
          uStack_6208._0_4_ = (float)uVar65;
          fStack_4fa8 = (float)uStack_6208;
          uStack_6208._4_4_ = (float)((ulong)uVar65 >> 0x20);
          fStack_56e4 = uStack_6208._4_4_;
          local_5700 = (float)local_6220 * (float)local_5160;
          fStack_56fc = local_6220._4_4_ * local_5160._4_4_;
          fStack_56f8 = (float)uStack_6218 * (float)uStack_5158;
          fStack_56f4 = uStack_6218._4_4_ * uStack_5158._4_4_;
          fStack_56f0 = (float)uStack_6210 * (float)uStack_5150;
          fStack_56ec = uStack_6210._4_4_ * uStack_5150._4_4_;
          fStack_56e8 = (float)uStack_6208 * (float)uStack_5148;
          uVar66 = local_7120;
          uVar67 = uStack_7118;
          uVar68 = uStack_7110;
          uVar69 = uStack_7108;
          local_5720._0_4_ = (float)local_7120;
          local_5720._4_4_ = (float)((ulong)local_7120 >> 0x20);
          uStack_5718._0_4_ = (float)uStack_7118;
          uStack_5718._4_4_ = (float)((ulong)uStack_7118 >> 0x20);
          uStack_5710._0_4_ = (float)uStack_7110;
          uStack_5710._4_4_ = (float)((ulong)uStack_7110 >> 0x20);
          uStack_5708._0_4_ = (float)uStack_7108;
          uStack_5708._4_4_ = (float)((ulong)uStack_7108 >> 0x20);
          local_7120 = CONCAT44(fStack_56fc + local_5720._4_4_,local_5700 + (float)local_5720);
          uStack_7118 = CONCAT44(fStack_56f4 + uStack_5718._4_4_,fStack_56f8 + (float)uStack_5718);
          uStack_7110 = CONCAT44(fStack_56ec + uStack_5710._4_4_,fStack_56f0 + (float)uStack_5710);
          uStack_7108 = CONCAT44(uStack_6208._4_4_ + uStack_5708._4_4_,
                                 fStack_56e8 + (float)uStack_5708);
          local_6908 = local_6fe8;
          uVar70 = *(undefined8 *)local_6fe8;
          uVar71 = *(undefined8 *)(local_6fe8 + 2);
          uVar72 = *(undefined8 *)(local_6fe8 + 4);
          uVar73 = *(undefined8 *)(local_6fe8 + 6);
          local_62c0 = local_7140;
          uStack_62b8 = uStack_7138;
          uStack_62b0 = uStack_7130;
          uStack_62a8 = uStack_7128;
          local_6280._0_4_ = (float)uVar70;
          local_4f80 = (float)local_6280;
          local_6280._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_4f7c = local_6280._4_4_;
          uStack_6278._0_4_ = (float)uVar71;
          fStack_4f78 = (float)uStack_6278;
          uStack_6278._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_4f74 = uStack_6278._4_4_;
          uStack_6270._0_4_ = (float)uVar72;
          fStack_4f70 = (float)uStack_6270;
          uStack_6270._4_4_ = (float)((ulong)uVar72 >> 0x20);
          fStack_4f6c = uStack_6270._4_4_;
          uStack_6268._0_4_ = (float)uVar73;
          fStack_4f68 = (float)uStack_6268;
          uStack_6268._4_4_ = (float)((ulong)uVar73 >> 0x20);
          fStack_56a4 = uStack_6268._4_4_;
          local_56c0 = (float)local_6280 * (float)local_5160;
          fStack_56bc = local_6280._4_4_ * local_5160._4_4_;
          fStack_56b8 = (float)uStack_6278 * (float)uStack_5158;
          fStack_56b4 = uStack_6278._4_4_ * uStack_5158._4_4_;
          fStack_56b0 = (float)uStack_6270 * (float)uStack_5150;
          fStack_56ac = uStack_6270._4_4_ * uStack_5150._4_4_;
          fStack_56a8 = (float)uStack_6268 * (float)uStack_5148;
          uVar74 = local_7140;
          uVar75 = uStack_7138;
          uVar76 = uStack_7130;
          uVar77 = uStack_7128;
          local_56e0._0_4_ = (float)local_7140;
          local_56e0._4_4_ = (float)((ulong)local_7140 >> 0x20);
          uStack_56d8._0_4_ = (float)uStack_7138;
          uStack_56d8._4_4_ = (float)((ulong)uStack_7138 >> 0x20);
          uStack_56d0._0_4_ = (float)uStack_7130;
          uStack_56d0._4_4_ = (float)((ulong)uStack_7130 >> 0x20);
          uStack_56c8._0_4_ = (float)uStack_7128;
          uStack_56c8._4_4_ = (float)((ulong)uStack_7128 >> 0x20);
          local_7140 = CONCAT44(fStack_56bc + local_56e0._4_4_,local_56c0 + (float)local_56e0);
          uStack_7138 = CONCAT44(fStack_56b4 + uStack_56d8._4_4_,fStack_56b8 + (float)uStack_56d8);
          uStack_7130 = CONCAT44(fStack_56ac + uStack_56d0._4_4_,fStack_56b0 + (float)uStack_56d0);
          uStack_7128 = CONCAT44(uStack_6268._4_4_ + uStack_56c8._4_4_,
                                 fStack_56a8 + (float)uStack_56c8);
          local_6f60 = local_6f60 + 8;
          local_6fb0 = local_6fb0 + 8;
          local_6fb8 = local_6fb8 + 8;
          local_6fc0 = local_6fc0 + 8;
          local_6fc8 = local_6fc8 + 8;
          local_6fd0 = local_6fd0 + 8;
          local_6fd8 = local_6fd8 + 8;
          local_6fe0 = local_6fe0 + 8;
          local_6fe8 = local_6fe8 + 8;
          local_62a0 = local_7180;
          uStack_6298 = uStack_7178;
          uStack_6290 = uStack_7170;
          uStack_6288 = uStack_7168;
          local_6280 = uVar70;
          uStack_6278 = uVar71;
          uStack_6270 = uVar72;
          uStack_6268 = uVar73;
          local_6240 = local_7180;
          uStack_6238 = uStack_7178;
          uStack_6230 = uStack_7170;
          uStack_6228 = uStack_7168;
          local_6220 = uVar62;
          uStack_6218 = uVar63;
          uStack_6210 = uVar64;
          uStack_6208 = uVar65;
          local_61e0 = local_7180;
          uStack_61d8 = uStack_7178;
          uStack_61d0 = uStack_7170;
          uStack_61c8 = uStack_7168;
          local_61c0 = uVar54;
          uStack_61b8 = uVar55;
          uStack_61b0 = uVar56;
          uStack_61a8 = uVar57;
          local_6180 = local_7180;
          uStack_6178 = uStack_7178;
          uStack_6170 = uStack_7170;
          uStack_6168 = uStack_7168;
          local_6160 = uVar46;
          uStack_6158 = uVar47;
          uStack_6150 = uVar48;
          uStack_6148 = uVar49;
          local_6120 = local_7180;
          uStack_6118 = uStack_7178;
          uStack_6110 = uStack_7170;
          uStack_6108 = uStack_7168;
          local_6100 = uVar38;
          uStack_60f8 = uVar39;
          uStack_60f0 = uVar40;
          uStack_60e8 = uVar41;
          local_60c0 = local_7180;
          uStack_60b8 = uStack_7178;
          uStack_60b0 = uStack_7170;
          uStack_60a8 = uStack_7168;
          local_60a0 = uVar30;
          uStack_6098 = uVar31;
          uStack_6090 = uVar32;
          uStack_6088 = uVar33;
          local_6060 = local_7180;
          uStack_6058 = uStack_7178;
          uStack_6050 = uStack_7170;
          uStack_6048 = uStack_7168;
          local_6040 = uVar22;
          uStack_6038 = uVar23;
          uStack_6030 = uVar24;
          uStack_6028 = uVar25;
          local_6000 = local_7180;
          uStack_5ff8 = uStack_7178;
          uStack_5ff0 = uStack_7170;
          uStack_5fe8 = uStack_7168;
          local_5fe0 = uVar14;
          uStack_5fd8 = uVar15;
          uStack_5fd0 = uVar16;
          uStack_5fc8 = uVar17;
          local_58a0 = uVar18;
          uStack_5898 = uVar19;
          uStack_5890 = uVar20;
          uStack_5888 = uVar21;
          local_5860 = uVar26;
          uStack_5858 = uVar27;
          uStack_5850 = uVar28;
          uStack_5848 = uVar29;
          local_5820 = uVar34;
          uStack_5818 = uVar35;
          uStack_5810 = uVar36;
          uStack_5808 = uVar37;
          local_57e0 = uVar42;
          uStack_57d8 = uVar43;
          uStack_57d0 = uVar44;
          uStack_57c8 = uVar45;
          local_57a0 = uVar50;
          uStack_5798 = uVar51;
          uStack_5790 = uVar52;
          uStack_5788 = uVar53;
          local_5760 = uVar58;
          uStack_5758 = uVar59;
          uStack_5750 = uVar60;
          uStack_5748 = uVar61;
          local_5720 = uVar66;
          uStack_5718 = uVar67;
          uStack_5710 = uVar68;
          uStack_5708 = uVar69;
          local_56e0 = uVar74;
          uStack_56d8 = uVar75;
          uStack_56d0 = uVar76;
          uStack_56c8 = uVar77;
          local_5160 = local_7180;
          uStack_5158 = uStack_7178;
          uStack_5150 = uStack_7170;
          uStack_5148 = uStack_7168;
          fStack_5124 = fStack_5864;
          local_5120 = local_7180;
          uStack_5118 = uStack_7178;
          uStack_5110 = uStack_7170;
          uStack_5108 = uStack_7168;
          fStack_50e4 = fStack_5824;
          local_50e0 = local_7180;
          uStack_50d8 = uStack_7178;
          uStack_50d0 = uStack_7170;
          uStack_50c8 = uStack_7168;
          fStack_50a4 = fStack_57e4;
          local_50a0 = local_7180;
          uStack_5098 = uStack_7178;
          uStack_5090 = uStack_7170;
          uStack_5088 = uStack_7168;
          fStack_5064 = fStack_57a4;
          local_5060 = local_7180;
          uStack_5058 = uStack_7178;
          uStack_5050 = uStack_7170;
          uStack_5048 = uStack_7168;
          fStack_5024 = fStack_5764;
          local_5020 = local_7180;
          uStack_5018 = uStack_7178;
          uStack_5010 = uStack_7170;
          uStack_5008 = uStack_7168;
          fStack_4fe4 = fStack_5724;
          local_4fe0 = local_7180;
          uStack_4fd8 = uStack_7178;
          uStack_4fd0 = uStack_7170;
          uStack_4fc8 = uStack_7168;
          fStack_4fa4 = fStack_56e4;
          local_4fa0 = local_7180;
          uStack_4f98 = uStack_7178;
          uStack_4f90 = uStack_7170;
          uStack_4f88 = uStack_7168;
          fStack_4f64 = fStack_56a4;
        }
        local_7188 = local_6ee4 & 7;
        for (local_7184 = local_73d4; 0 < local_7184; local_7184 = local_7184 + -1) {
          local_6910 = local_6f68;
          local_71c0 = *(undefined8 *)local_6f68;
          uStack_71b8 = *(undefined8 *)(local_6f68 + 2);
          uStack_71b0 = *(undefined8 *)(local_6f68 + 4);
          uStack_71a8 = *(undefined8 *)(local_6f68 + 6);
          local_6918 = local_6ff0;
          uVar14 = *(undefined8 *)local_6ff0;
          uVar15 = *(undefined8 *)(local_6ff0 + 2);
          uVar16 = *(undefined8 *)(local_6ff0 + 4);
          uVar17 = *(undefined8 *)(local_6ff0 + 6);
          local_6320 = local_7060;
          uStack_6318 = uStack_7058;
          uStack_6310 = uStack_7050;
          uStack_6308 = uStack_7048;
          local_62e0._0_4_ = (float)uVar14;
          local_4f40 = (float)local_62e0;
          local_62e0._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_4f3c = local_62e0._4_4_;
          uStack_62d8._0_4_ = (float)uVar15;
          fStack_4f38 = (float)uStack_62d8;
          uStack_62d8._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4f34 = uStack_62d8._4_4_;
          uStack_62d0._0_4_ = (float)uVar16;
          fStack_4f30 = (float)uStack_62d0;
          uStack_62d0._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_4f2c = uStack_62d0._4_4_;
          uStack_62c8._0_4_ = (float)uVar17;
          fStack_4f28 = (float)uStack_62c8;
          uStack_62c8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_5664 = uStack_62c8._4_4_;
          local_4f60._0_4_ = (float)local_71c0;
          local_4f60._4_4_ = (float)((ulong)local_71c0 >> 0x20);
          uStack_4f58._0_4_ = (float)uStack_71b8;
          uStack_4f58._4_4_ = (float)((ulong)uStack_71b8 >> 0x20);
          uStack_4f50._0_4_ = (float)uStack_71b0;
          uStack_4f50._4_4_ = (float)((ulong)uStack_71b0 >> 0x20);
          uStack_4f48._0_4_ = (float)uStack_71a8;
          local_5680 = (float)local_62e0 * (float)local_4f60;
          fStack_567c = local_62e0._4_4_ * local_4f60._4_4_;
          fStack_5678 = (float)uStack_62d8 * (float)uStack_4f58;
          fStack_5674 = uStack_62d8._4_4_ * uStack_4f58._4_4_;
          fStack_5670 = (float)uStack_62d0 * (float)uStack_4f50;
          fStack_566c = uStack_62d0._4_4_ * uStack_4f50._4_4_;
          fStack_5668 = (float)uStack_62c8 * (float)uStack_4f48;
          uVar18 = local_7060;
          uVar19 = uStack_7058;
          uVar20 = uStack_7050;
          uVar21 = uStack_7048;
          local_56a0._0_4_ = (float)local_7060;
          local_56a0._4_4_ = (float)((ulong)local_7060 >> 0x20);
          uStack_5698._0_4_ = (float)uStack_7058;
          uStack_5698._4_4_ = (float)((ulong)uStack_7058 >> 0x20);
          uStack_5690._0_4_ = (float)uStack_7050;
          uStack_5690._4_4_ = (float)((ulong)uStack_7050 >> 0x20);
          uStack_5688._0_4_ = (float)uStack_7048;
          uStack_5688._4_4_ = (float)((ulong)uStack_7048 >> 0x20);
          local_7060 = CONCAT44(fStack_567c + local_56a0._4_4_,local_5680 + (float)local_56a0);
          uStack_7058 = CONCAT44(fStack_5674 + uStack_5698._4_4_,fStack_5678 + (float)uStack_5698);
          uStack_7050 = CONCAT44(fStack_566c + uStack_5690._4_4_,fStack_5670 + (float)uStack_5690);
          uStack_7048 = CONCAT44(uStack_62c8._4_4_ + uStack_5688._4_4_,
                                 fStack_5668 + (float)uStack_5688);
          local_6920 = local_6ff8;
          uVar22 = *(undefined8 *)local_6ff8;
          uVar23 = *(undefined8 *)(local_6ff8 + 2);
          uVar24 = *(undefined8 *)(local_6ff8 + 4);
          uVar25 = *(undefined8 *)(local_6ff8 + 6);
          local_6380 = local_7080;
          uStack_6378 = uStack_7078;
          uStack_6370 = uStack_7070;
          uStack_6368 = uStack_7068;
          local_6340._0_4_ = (float)uVar22;
          local_4f00 = (float)local_6340;
          local_6340._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_4efc = local_6340._4_4_;
          uStack_6338._0_4_ = (float)uVar23;
          fStack_4ef8 = (float)uStack_6338;
          uStack_6338._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_4ef4 = uStack_6338._4_4_;
          uStack_6330._0_4_ = (float)uVar24;
          fStack_4ef0 = (float)uStack_6330;
          uStack_6330._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_4eec = uStack_6330._4_4_;
          uStack_6328._0_4_ = (float)uVar25;
          fStack_4ee8 = (float)uStack_6328;
          uStack_6328._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_5624 = uStack_6328._4_4_;
          local_5640 = (float)local_6340 * (float)local_4f60;
          fStack_563c = local_6340._4_4_ * local_4f60._4_4_;
          fStack_5638 = (float)uStack_6338 * (float)uStack_4f58;
          fStack_5634 = uStack_6338._4_4_ * uStack_4f58._4_4_;
          fStack_5630 = (float)uStack_6330 * (float)uStack_4f50;
          fStack_562c = uStack_6330._4_4_ * uStack_4f50._4_4_;
          fStack_5628 = (float)uStack_6328 * (float)uStack_4f48;
          uVar26 = local_7080;
          uVar27 = uStack_7078;
          uVar28 = uStack_7070;
          uVar29 = uStack_7068;
          local_5660._0_4_ = (float)local_7080;
          local_5660._4_4_ = (float)((ulong)local_7080 >> 0x20);
          uStack_5658._0_4_ = (float)uStack_7078;
          uStack_5658._4_4_ = (float)((ulong)uStack_7078 >> 0x20);
          uStack_5650._0_4_ = (float)uStack_7070;
          uStack_5650._4_4_ = (float)((ulong)uStack_7070 >> 0x20);
          uStack_5648._0_4_ = (float)uStack_7068;
          uStack_5648._4_4_ = (float)((ulong)uStack_7068 >> 0x20);
          local_7080 = CONCAT44(fStack_563c + local_5660._4_4_,local_5640 + (float)local_5660);
          uStack_7078 = CONCAT44(fStack_5634 + uStack_5658._4_4_,fStack_5638 + (float)uStack_5658);
          uStack_7070 = CONCAT44(fStack_562c + uStack_5650._4_4_,fStack_5630 + (float)uStack_5650);
          uStack_7068 = CONCAT44(uStack_6328._4_4_ + uStack_5648._4_4_,
                                 fStack_5628 + (float)uStack_5648);
          local_6928 = local_7000;
          uVar30 = *(undefined8 *)local_7000;
          uVar31 = *(undefined8 *)(local_7000 + 2);
          uVar32 = *(undefined8 *)(local_7000 + 4);
          uVar33 = *(undefined8 *)(local_7000 + 6);
          local_63e0 = local_70a0;
          uStack_63d8 = uStack_7098;
          uStack_63d0 = uStack_7090;
          uStack_63c8 = uStack_7088;
          local_63a0._0_4_ = (float)uVar30;
          local_4ec0 = (float)local_63a0;
          local_63a0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_4ebc = local_63a0._4_4_;
          uStack_6398._0_4_ = (float)uVar31;
          fStack_4eb8 = (float)uStack_6398;
          uStack_6398._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4eb4 = uStack_6398._4_4_;
          uStack_6390._0_4_ = (float)uVar32;
          fStack_4eb0 = (float)uStack_6390;
          uStack_6390._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_4eac = uStack_6390._4_4_;
          uStack_6388._0_4_ = (float)uVar33;
          fStack_4ea8 = (float)uStack_6388;
          uStack_6388._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_55e4 = uStack_6388._4_4_;
          local_5600 = (float)local_63a0 * (float)local_4f60;
          fStack_55fc = local_63a0._4_4_ * local_4f60._4_4_;
          fStack_55f8 = (float)uStack_6398 * (float)uStack_4f58;
          fStack_55f4 = uStack_6398._4_4_ * uStack_4f58._4_4_;
          fStack_55f0 = (float)uStack_6390 * (float)uStack_4f50;
          fStack_55ec = uStack_6390._4_4_ * uStack_4f50._4_4_;
          fStack_55e8 = (float)uStack_6388 * (float)uStack_4f48;
          uVar34 = local_70a0;
          uVar35 = uStack_7098;
          uVar36 = uStack_7090;
          uVar37 = uStack_7088;
          local_5620._0_4_ = (float)local_70a0;
          local_5620._4_4_ = (float)((ulong)local_70a0 >> 0x20);
          uStack_5618._0_4_ = (float)uStack_7098;
          uStack_5618._4_4_ = (float)((ulong)uStack_7098 >> 0x20);
          uStack_5610._0_4_ = (float)uStack_7090;
          uStack_5610._4_4_ = (float)((ulong)uStack_7090 >> 0x20);
          uStack_5608._0_4_ = (float)uStack_7088;
          uStack_5608._4_4_ = (float)((ulong)uStack_7088 >> 0x20);
          local_70a0 = CONCAT44(fStack_55fc + local_5620._4_4_,local_5600 + (float)local_5620);
          uStack_7098 = CONCAT44(fStack_55f4 + uStack_5618._4_4_,fStack_55f8 + (float)uStack_5618);
          uStack_7090 = CONCAT44(fStack_55ec + uStack_5610._4_4_,fStack_55f0 + (float)uStack_5610);
          uStack_7088 = CONCAT44(uStack_6388._4_4_ + uStack_5608._4_4_,
                                 fStack_55e8 + (float)uStack_5608);
          local_6930 = local_7008;
          uVar38 = *(undefined8 *)local_7008;
          uVar39 = *(undefined8 *)(local_7008 + 2);
          uVar40 = *(undefined8 *)(local_7008 + 4);
          uVar41 = *(undefined8 *)(local_7008 + 6);
          local_6440 = local_70c0;
          uStack_6438 = uStack_70b8;
          uStack_6430 = uStack_70b0;
          uStack_6428 = uStack_70a8;
          local_6400._0_4_ = (float)uVar38;
          local_4e80 = (float)local_6400;
          local_6400._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_4e7c = local_6400._4_4_;
          uStack_63f8._0_4_ = (float)uVar39;
          fStack_4e78 = (float)uStack_63f8;
          uStack_63f8._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4e74 = uStack_63f8._4_4_;
          uStack_63f0._0_4_ = (float)uVar40;
          fStack_4e70 = (float)uStack_63f0;
          uStack_63f0._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_4e6c = uStack_63f0._4_4_;
          uStack_63e8._0_4_ = (float)uVar41;
          fStack_4e68 = (float)uStack_63e8;
          uStack_63e8._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_55a4 = uStack_63e8._4_4_;
          local_55c0 = (float)local_6400 * (float)local_4f60;
          fStack_55bc = local_6400._4_4_ * local_4f60._4_4_;
          fStack_55b8 = (float)uStack_63f8 * (float)uStack_4f58;
          fStack_55b4 = uStack_63f8._4_4_ * uStack_4f58._4_4_;
          fStack_55b0 = (float)uStack_63f0 * (float)uStack_4f50;
          fStack_55ac = uStack_63f0._4_4_ * uStack_4f50._4_4_;
          fStack_55a8 = (float)uStack_63e8 * (float)uStack_4f48;
          uVar42 = local_70c0;
          uVar43 = uStack_70b8;
          uVar44 = uStack_70b0;
          uVar45 = uStack_70a8;
          local_55e0._0_4_ = (float)local_70c0;
          local_55e0._4_4_ = (float)((ulong)local_70c0 >> 0x20);
          uStack_55d8._0_4_ = (float)uStack_70b8;
          uStack_55d8._4_4_ = (float)((ulong)uStack_70b8 >> 0x20);
          uStack_55d0._0_4_ = (float)uStack_70b0;
          uStack_55d0._4_4_ = (float)((ulong)uStack_70b0 >> 0x20);
          uStack_55c8._0_4_ = (float)uStack_70a8;
          uStack_55c8._4_4_ = (float)((ulong)uStack_70a8 >> 0x20);
          local_70c0 = CONCAT44(fStack_55bc + local_55e0._4_4_,local_55c0 + (float)local_55e0);
          uStack_70b8 = CONCAT44(fStack_55b4 + uStack_55d8._4_4_,fStack_55b8 + (float)uStack_55d8);
          uStack_70b0 = CONCAT44(fStack_55ac + uStack_55d0._4_4_,fStack_55b0 + (float)uStack_55d0);
          uStack_70a8 = CONCAT44(uStack_63e8._4_4_ + uStack_55c8._4_4_,
                                 fStack_55a8 + (float)uStack_55c8);
          local_6938 = local_7010;
          uVar46 = *(undefined8 *)local_7010;
          uVar47 = *(undefined8 *)(local_7010 + 2);
          uVar48 = *(undefined8 *)(local_7010 + 4);
          uVar49 = *(undefined8 *)(local_7010 + 6);
          local_64a0 = local_70e0;
          uStack_6498 = uStack_70d8;
          uStack_6490 = uStack_70d0;
          uStack_6488 = uStack_70c8;
          local_6460._0_4_ = (float)uVar46;
          local_4e40 = (float)local_6460;
          local_6460._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_4e3c = local_6460._4_4_;
          uStack_6458._0_4_ = (float)uVar47;
          fStack_4e38 = (float)uStack_6458;
          uStack_6458._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_4e34 = uStack_6458._4_4_;
          uStack_6450._0_4_ = (float)uVar48;
          fStack_4e30 = (float)uStack_6450;
          uStack_6450._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_4e2c = uStack_6450._4_4_;
          uStack_6448._0_4_ = (float)uVar49;
          fStack_4e28 = (float)uStack_6448;
          uStack_6448._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_5564 = uStack_6448._4_4_;
          local_5580 = (float)local_6460 * (float)local_4f60;
          fStack_557c = local_6460._4_4_ * local_4f60._4_4_;
          fStack_5578 = (float)uStack_6458 * (float)uStack_4f58;
          fStack_5574 = uStack_6458._4_4_ * uStack_4f58._4_4_;
          fStack_5570 = (float)uStack_6450 * (float)uStack_4f50;
          fStack_556c = uStack_6450._4_4_ * uStack_4f50._4_4_;
          fStack_5568 = (float)uStack_6448 * (float)uStack_4f48;
          uVar50 = local_70e0;
          uVar51 = uStack_70d8;
          uVar52 = uStack_70d0;
          uVar53 = uStack_70c8;
          local_55a0._0_4_ = (float)local_70e0;
          local_55a0._4_4_ = (float)((ulong)local_70e0 >> 0x20);
          uStack_5598._0_4_ = (float)uStack_70d8;
          uStack_5598._4_4_ = (float)((ulong)uStack_70d8 >> 0x20);
          uStack_5590._0_4_ = (float)uStack_70d0;
          uStack_5590._4_4_ = (float)((ulong)uStack_70d0 >> 0x20);
          uStack_5588._0_4_ = (float)uStack_70c8;
          uStack_5588._4_4_ = (float)((ulong)uStack_70c8 >> 0x20);
          local_70e0 = CONCAT44(fStack_557c + local_55a0._4_4_,local_5580 + (float)local_55a0);
          uStack_70d8 = CONCAT44(fStack_5574 + uStack_5598._4_4_,fStack_5578 + (float)uStack_5598);
          uStack_70d0 = CONCAT44(fStack_556c + uStack_5590._4_4_,fStack_5570 + (float)uStack_5590);
          uStack_70c8 = CONCAT44(uStack_6448._4_4_ + uStack_5588._4_4_,
                                 fStack_5568 + (float)uStack_5588);
          local_6940 = local_7018;
          uVar54 = *(undefined8 *)local_7018;
          uVar55 = *(undefined8 *)(local_7018 + 2);
          uVar56 = *(undefined8 *)(local_7018 + 4);
          uVar57 = *(undefined8 *)(local_7018 + 6);
          local_6500 = local_7100;
          uStack_64f8 = uStack_70f8;
          uStack_64f0 = uStack_70f0;
          uStack_64e8 = uStack_70e8;
          local_64c0._0_4_ = (float)uVar54;
          local_4e00 = (float)local_64c0;
          local_64c0._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_4dfc = local_64c0._4_4_;
          uStack_64b8._0_4_ = (float)uVar55;
          fStack_4df8 = (float)uStack_64b8;
          uStack_64b8._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_4df4 = uStack_64b8._4_4_;
          uStack_64b0._0_4_ = (float)uVar56;
          fStack_4df0 = (float)uStack_64b0;
          uStack_64b0._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_4dec = uStack_64b0._4_4_;
          uStack_64a8._0_4_ = (float)uVar57;
          fStack_4de8 = (float)uStack_64a8;
          uStack_64a8._4_4_ = (float)((ulong)uVar57 >> 0x20);
          fStack_5524 = uStack_64a8._4_4_;
          local_5540 = (float)local_64c0 * (float)local_4f60;
          fStack_553c = local_64c0._4_4_ * local_4f60._4_4_;
          fStack_5538 = (float)uStack_64b8 * (float)uStack_4f58;
          fStack_5534 = uStack_64b8._4_4_ * uStack_4f58._4_4_;
          fStack_5530 = (float)uStack_64b0 * (float)uStack_4f50;
          fStack_552c = uStack_64b0._4_4_ * uStack_4f50._4_4_;
          fStack_5528 = (float)uStack_64a8 * (float)uStack_4f48;
          uVar58 = local_7100;
          uVar59 = uStack_70f8;
          uVar60 = uStack_70f0;
          uVar61 = uStack_70e8;
          local_5560._0_4_ = (float)local_7100;
          local_5560._4_4_ = (float)((ulong)local_7100 >> 0x20);
          uStack_5558._0_4_ = (float)uStack_70f8;
          uStack_5558._4_4_ = (float)((ulong)uStack_70f8 >> 0x20);
          uStack_5550._0_4_ = (float)uStack_70f0;
          uStack_5550._4_4_ = (float)((ulong)uStack_70f0 >> 0x20);
          uStack_5548._0_4_ = (float)uStack_70e8;
          uStack_5548._4_4_ = (float)((ulong)uStack_70e8 >> 0x20);
          local_7100 = CONCAT44(fStack_553c + local_5560._4_4_,local_5540 + (float)local_5560);
          uStack_70f8 = CONCAT44(fStack_5534 + uStack_5558._4_4_,fStack_5538 + (float)uStack_5558);
          uStack_70f0 = CONCAT44(fStack_552c + uStack_5550._4_4_,fStack_5530 + (float)uStack_5550);
          uStack_70e8 = CONCAT44(uStack_64a8._4_4_ + uStack_5548._4_4_,
                                 fStack_5528 + (float)uStack_5548);
          local_6948 = local_7020;
          uVar62 = *(undefined8 *)local_7020;
          uVar63 = *(undefined8 *)(local_7020 + 2);
          uVar64 = *(undefined8 *)(local_7020 + 4);
          uVar65 = *(undefined8 *)(local_7020 + 6);
          local_6560 = local_7120;
          uStack_6558 = uStack_7118;
          uStack_6550 = uStack_7110;
          uStack_6548 = uStack_7108;
          local_6520._0_4_ = (float)uVar62;
          local_4dc0 = (float)local_6520;
          local_6520._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_4dbc = local_6520._4_4_;
          uStack_6518._0_4_ = (float)uVar63;
          fStack_4db8 = (float)uStack_6518;
          uStack_6518._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_4db4 = uStack_6518._4_4_;
          uStack_6510._0_4_ = (float)uVar64;
          fStack_4db0 = (float)uStack_6510;
          uStack_6510._4_4_ = (float)((ulong)uVar64 >> 0x20);
          fStack_4dac = uStack_6510._4_4_;
          uStack_6508._0_4_ = (float)uVar65;
          fStack_4da8 = (float)uStack_6508;
          uStack_6508._4_4_ = (float)((ulong)uVar65 >> 0x20);
          fStack_54e4 = uStack_6508._4_4_;
          local_5500 = (float)local_6520 * (float)local_4f60;
          fStack_54fc = local_6520._4_4_ * local_4f60._4_4_;
          fStack_54f8 = (float)uStack_6518 * (float)uStack_4f58;
          fStack_54f4 = uStack_6518._4_4_ * uStack_4f58._4_4_;
          fStack_54f0 = (float)uStack_6510 * (float)uStack_4f50;
          fStack_54ec = uStack_6510._4_4_ * uStack_4f50._4_4_;
          fStack_54e8 = (float)uStack_6508 * (float)uStack_4f48;
          uVar66 = local_7120;
          uVar67 = uStack_7118;
          uVar68 = uStack_7110;
          uVar69 = uStack_7108;
          local_5520._0_4_ = (float)local_7120;
          local_5520._4_4_ = (float)((ulong)local_7120 >> 0x20);
          uStack_5518._0_4_ = (float)uStack_7118;
          uStack_5518._4_4_ = (float)((ulong)uStack_7118 >> 0x20);
          uStack_5510._0_4_ = (float)uStack_7110;
          uStack_5510._4_4_ = (float)((ulong)uStack_7110 >> 0x20);
          uStack_5508._0_4_ = (float)uStack_7108;
          uStack_5508._4_4_ = (float)((ulong)uStack_7108 >> 0x20);
          local_7120 = CONCAT44(fStack_54fc + local_5520._4_4_,local_5500 + (float)local_5520);
          uStack_7118 = CONCAT44(fStack_54f4 + uStack_5518._4_4_,fStack_54f8 + (float)uStack_5518);
          uStack_7110 = CONCAT44(fStack_54ec + uStack_5510._4_4_,fStack_54f0 + (float)uStack_5510);
          uStack_7108 = CONCAT44(uStack_6508._4_4_ + uStack_5508._4_4_,
                                 fStack_54e8 + (float)uStack_5508);
          local_6950 = local_7028;
          uVar70 = *(undefined8 *)local_7028;
          uVar71 = *(undefined8 *)(local_7028 + 2);
          uVar72 = *(undefined8 *)(local_7028 + 4);
          uVar73 = *(undefined8 *)(local_7028 + 6);
          local_65c0 = local_7140;
          uStack_65b8 = uStack_7138;
          uStack_65b0 = uStack_7130;
          uStack_65a8 = uStack_7128;
          local_6580._0_4_ = (float)uVar70;
          local_4d80 = (float)local_6580;
          local_6580._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_4d7c = local_6580._4_4_;
          uStack_6578._0_4_ = (float)uVar71;
          fStack_4d78 = (float)uStack_6578;
          uStack_6578._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_4d74 = uStack_6578._4_4_;
          uStack_6570._0_4_ = (float)uVar72;
          fStack_4d70 = (float)uStack_6570;
          uStack_6570._4_4_ = (float)((ulong)uVar72 >> 0x20);
          fStack_4d6c = uStack_6570._4_4_;
          uStack_6568._0_4_ = (float)uVar73;
          fStack_4d68 = (float)uStack_6568;
          uStack_6568._4_4_ = (float)((ulong)uVar73 >> 0x20);
          fStack_54a4 = uStack_6568._4_4_;
          local_54c0 = (float)local_6580 * (float)local_4f60;
          fStack_54bc = local_6580._4_4_ * local_4f60._4_4_;
          fStack_54b8 = (float)uStack_6578 * (float)uStack_4f58;
          fStack_54b4 = uStack_6578._4_4_ * uStack_4f58._4_4_;
          fStack_54b0 = (float)uStack_6570 * (float)uStack_4f50;
          fStack_54ac = uStack_6570._4_4_ * uStack_4f50._4_4_;
          fStack_54a8 = (float)uStack_6568 * (float)uStack_4f48;
          uVar74 = local_7140;
          uVar75 = uStack_7138;
          uVar76 = uStack_7130;
          uVar77 = uStack_7128;
          local_54e0._0_4_ = (float)local_7140;
          local_54e0._4_4_ = (float)((ulong)local_7140 >> 0x20);
          uStack_54d8._0_4_ = (float)uStack_7138;
          uStack_54d8._4_4_ = (float)((ulong)uStack_7138 >> 0x20);
          uStack_54d0._0_4_ = (float)uStack_7130;
          uStack_54d0._4_4_ = (float)((ulong)uStack_7130 >> 0x20);
          uStack_54c8._0_4_ = (float)uStack_7128;
          uStack_54c8._4_4_ = (float)((ulong)uStack_7128 >> 0x20);
          local_7140 = CONCAT44(fStack_54bc + local_54e0._4_4_,local_54c0 + (float)local_54e0);
          uStack_7138 = CONCAT44(fStack_54b4 + uStack_54d8._4_4_,fStack_54b8 + (float)uStack_54d8);
          uStack_7130 = CONCAT44(fStack_54ac + uStack_54d0._4_4_,fStack_54b0 + (float)uStack_54d0);
          uStack_7128 = CONCAT44(uStack_6568._4_4_ + uStack_54c8._4_4_,
                                 fStack_54a8 + (float)uStack_54c8);
          local_6f68 = local_6f68 + 8;
          local_6ff0 = local_6ff0 + 8;
          local_6ff8 = local_6ff8 + 8;
          local_7000 = local_7000 + 8;
          local_7008 = local_7008 + 8;
          local_7010 = local_7010 + 8;
          local_7018 = local_7018 + 8;
          local_7020 = local_7020 + 8;
          local_7028 = local_7028 + 8;
          local_65a0 = local_71c0;
          uStack_6598 = uStack_71b8;
          uStack_6590 = uStack_71b0;
          uStack_6588 = uStack_71a8;
          local_6580 = uVar70;
          uStack_6578 = uVar71;
          uStack_6570 = uVar72;
          uStack_6568 = uVar73;
          local_6540 = local_71c0;
          uStack_6538 = uStack_71b8;
          uStack_6530 = uStack_71b0;
          uStack_6528 = uStack_71a8;
          local_6520 = uVar62;
          uStack_6518 = uVar63;
          uStack_6510 = uVar64;
          uStack_6508 = uVar65;
          local_64e0 = local_71c0;
          uStack_64d8 = uStack_71b8;
          uStack_64d0 = uStack_71b0;
          uStack_64c8 = uStack_71a8;
          local_64c0 = uVar54;
          uStack_64b8 = uVar55;
          uStack_64b0 = uVar56;
          uStack_64a8 = uVar57;
          local_6480 = local_71c0;
          uStack_6478 = uStack_71b8;
          uStack_6470 = uStack_71b0;
          uStack_6468 = uStack_71a8;
          local_6460 = uVar46;
          uStack_6458 = uVar47;
          uStack_6450 = uVar48;
          uStack_6448 = uVar49;
          local_6420 = local_71c0;
          uStack_6418 = uStack_71b8;
          uStack_6410 = uStack_71b0;
          uStack_6408 = uStack_71a8;
          local_6400 = uVar38;
          uStack_63f8 = uVar39;
          uStack_63f0 = uVar40;
          uStack_63e8 = uVar41;
          local_63c0 = local_71c0;
          uStack_63b8 = uStack_71b8;
          uStack_63b0 = uStack_71b0;
          uStack_63a8 = uStack_71a8;
          local_63a0 = uVar30;
          uStack_6398 = uVar31;
          uStack_6390 = uVar32;
          uStack_6388 = uVar33;
          local_6360 = local_71c0;
          uStack_6358 = uStack_71b8;
          uStack_6350 = uStack_71b0;
          uStack_6348 = uStack_71a8;
          local_6340 = uVar22;
          uStack_6338 = uVar23;
          uStack_6330 = uVar24;
          uStack_6328 = uVar25;
          local_6300 = local_71c0;
          uStack_62f8 = uStack_71b8;
          uStack_62f0 = uStack_71b0;
          uStack_62e8 = uStack_71a8;
          local_62e0 = uVar14;
          uStack_62d8 = uVar15;
          uStack_62d0 = uVar16;
          uStack_62c8 = uVar17;
          local_56a0 = uVar18;
          uStack_5698 = uVar19;
          uStack_5690 = uVar20;
          uStack_5688 = uVar21;
          local_5660 = uVar26;
          uStack_5658 = uVar27;
          uStack_5650 = uVar28;
          uStack_5648 = uVar29;
          local_5620 = uVar34;
          uStack_5618 = uVar35;
          uStack_5610 = uVar36;
          uStack_5608 = uVar37;
          local_55e0 = uVar42;
          uStack_55d8 = uVar43;
          uStack_55d0 = uVar44;
          uStack_55c8 = uVar45;
          local_55a0 = uVar50;
          uStack_5598 = uVar51;
          uStack_5590 = uVar52;
          uStack_5588 = uVar53;
          local_5560 = uVar58;
          uStack_5558 = uVar59;
          uStack_5550 = uVar60;
          uStack_5548 = uVar61;
          local_5520 = uVar66;
          uStack_5518 = uVar67;
          uStack_5510 = uVar68;
          uStack_5508 = uVar69;
          local_54e0 = uVar74;
          uStack_54d8 = uVar75;
          uStack_54d0 = uVar76;
          uStack_54c8 = uVar77;
          local_4f60 = local_71c0;
          uStack_4f58 = uStack_71b8;
          uStack_4f50 = uStack_71b0;
          uStack_4f48 = uStack_71a8;
          fStack_4f24 = fStack_5664;
          local_4f20 = local_71c0;
          uStack_4f18 = uStack_71b8;
          uStack_4f10 = uStack_71b0;
          uStack_4f08 = uStack_71a8;
          fStack_4ee4 = fStack_5624;
          local_4ee0 = local_71c0;
          uStack_4ed8 = uStack_71b8;
          uStack_4ed0 = uStack_71b0;
          uStack_4ec8 = uStack_71a8;
          fStack_4ea4 = fStack_55e4;
          local_4ea0 = local_71c0;
          uStack_4e98 = uStack_71b8;
          uStack_4e90 = uStack_71b0;
          uStack_4e88 = uStack_71a8;
          fStack_4e64 = fStack_55a4;
          local_4e60 = local_71c0;
          uStack_4e58 = uStack_71b8;
          uStack_4e50 = uStack_71b0;
          uStack_4e48 = uStack_71a8;
          fStack_4e24 = fStack_5564;
          local_4e20 = local_71c0;
          uStack_4e18 = uStack_71b8;
          uStack_4e10 = uStack_71b0;
          uStack_4e08 = uStack_71a8;
          fStack_4de4 = fStack_5524;
          local_4de0 = local_71c0;
          uStack_4dd8 = uStack_71b8;
          uStack_4dd0 = uStack_71b0;
          uStack_4dc8 = uStack_71a8;
          fStack_4da4 = fStack_54e4;
          local_4da0 = local_71c0;
          uStack_4d98 = uStack_71b8;
          uStack_4d90 = uStack_71b0;
          uStack_4d88 = uStack_71a8;
          fStack_4d64 = fStack_54a4;
        }
        local_5ec8 = &local_71e0;
        local_5d88 = &local_7060;
        local_5d90 = &local_7080;
        local_5d98 = &local_70a0;
        local_5da0 = &local_70c0;
        local_5da8 = &local_70e0;
        local_5db0 = &local_7100;
        local_5db8 = &local_7120;
        local_5dc0 = &local_7140;
        local_4880 = local_7060;
        uStack_4878 = uStack_7058;
        uStack_4870 = uStack_7050;
        uStack_4868 = uStack_7048;
        auVar145._8_8_ = uStack_7058;
        auVar145._0_8_ = local_7060;
        auVar145._16_8_ = uStack_7050;
        auVar145._24_8_ = uStack_7048;
        local_48a0 = local_7080;
        uStack_4898 = uStack_7078;
        uStack_4890 = uStack_7070;
        uStack_4888 = uStack_7068;
        auVar144._8_8_ = uStack_7078;
        auVar144._0_8_ = local_7080;
        auVar144._16_8_ = uStack_7070;
        auVar144._24_8_ = uStack_7068;
        local_5de0 = vhaddps_avx(auVar145,auVar144);
        local_48c0 = local_70a0;
        uStack_48b8 = uStack_7098;
        uStack_48b0 = uStack_7090;
        uStack_48a8 = uStack_7088;
        auVar143._8_8_ = uStack_7098;
        auVar143._0_8_ = local_70a0;
        auVar143._16_8_ = uStack_7090;
        auVar143._24_8_ = uStack_7088;
        local_48e0 = local_70c0;
        uStack_48d8 = uStack_70b8;
        uStack_48d0 = uStack_70b0;
        uStack_48c8 = uStack_70a8;
        auVar12._8_8_ = uStack_70b8;
        auVar12._0_8_ = local_70c0;
        auVar12._16_8_ = uStack_70b0;
        auVar12._24_8_ = uStack_70a8;
        local_5e00 = vhaddps_avx(auVar143,auVar12);
        local_4900 = local_70e0;
        uStack_48f8 = uStack_70d8;
        uStack_48f0 = uStack_70d0;
        uStack_48e8 = uStack_70c8;
        auVar11._8_8_ = uStack_70d8;
        auVar11._0_8_ = local_70e0;
        auVar11._16_8_ = uStack_70d0;
        auVar11._24_8_ = uStack_70c8;
        local_4920 = local_7100;
        uStack_4918 = uStack_70f8;
        uStack_4910 = uStack_70f0;
        uStack_4908 = uStack_70e8;
        auVar10._8_8_ = uStack_70f8;
        auVar10._0_8_ = local_7100;
        auVar10._16_8_ = uStack_70f0;
        auVar10._24_8_ = uStack_70e8;
        local_5e20 = vhaddps_avx(auVar11,auVar10);
        local_4940 = local_7120;
        uStack_4938 = uStack_7118;
        uStack_4930 = uStack_7110;
        uStack_4928 = uStack_7108;
        auVar8._8_8_ = uStack_7118;
        auVar8._0_8_ = local_7120;
        auVar8._16_8_ = uStack_7110;
        auVar8._24_8_ = uStack_7108;
        local_4960 = local_7140;
        uStack_4958 = uStack_7138;
        uStack_4950 = uStack_7130;
        uStack_4948 = uStack_7128;
        auVar13._8_8_ = uStack_7138;
        auVar13._0_8_ = local_7140;
        auVar13._16_8_ = uStack_7130;
        auVar13._24_8_ = uStack_7128;
        local_5e40 = vhaddps_avx(auVar8,auVar13);
        local_4980 = local_5de0._0_8_;
        uStack_4978 = local_5de0._8_8_;
        uStack_4970 = local_5de0._16_8_;
        uStack_4968 = local_5de0._24_8_;
        local_49a0 = local_5e00._0_8_;
        uStack_4998 = local_5e00._8_8_;
        uStack_4990 = local_5e00._16_8_;
        uStack_4988 = local_5e00._24_8_;
        local_5e60 = vhaddps_avx(local_5de0,local_5e00);
        local_49c0 = local_5e20._0_8_;
        uStack_49b8 = local_5e20._8_8_;
        uStack_49b0 = local_5e20._16_8_;
        uStack_49a8 = local_5e20._24_8_;
        local_49e0 = local_5e40._0_8_;
        uStack_49d8 = local_5e40._8_8_;
        uStack_49d0 = local_5e40._16_8_;
        uStack_49c8 = local_5e40._24_8_;
        local_5e80 = vhaddps_avx(local_5e20,local_5e40);
        local_5ea0 = vblendps_avx(local_5e60,local_5e80,0xf0);
        local_5ec0 = vperm2f128_avx(local_5e60,local_5e80,0x21);
        local_58e0 = local_5ec0._0_8_;
        uVar14 = local_58e0;
        uStack_58d8 = local_5ec0._8_8_;
        uVar15 = uStack_58d8;
        uStack_58d0 = local_5ec0._16_8_;
        uVar16 = uStack_58d0;
        uStack_58c8 = local_5ec0._24_8_;
        uVar17 = uStack_58c8;
        local_58c0._0_4_ = local_5ea0._0_4_;
        local_58c0._4_4_ = local_5ea0._4_4_;
        fStack_58b8 = local_5ea0._8_4_;
        fStack_58b4 = local_5ea0._12_4_;
        fStack_58b0 = local_5ea0._16_4_;
        fStack_58ac = local_5ea0._20_4_;
        fStack_58a8 = local_5ea0._24_4_;
        fStack_58a4 = local_5ea0._28_4_;
        local_58e0._0_4_ = local_5ec0._0_4_;
        local_58e0._4_4_ = local_5ec0._4_4_;
        uStack_58d8._0_4_ = local_5ec0._8_4_;
        uStack_58d8._4_4_ = local_5ec0._12_4_;
        uStack_58d0._0_4_ = local_5ec0._16_4_;
        uStack_58d0._4_4_ = local_5ec0._20_4_;
        uStack_58c8._0_4_ = local_5ec0._24_4_;
        uStack_58c8._4_4_ = local_5ec0._28_4_;
        local_5f00 = CONCAT44((float)local_58c0._4_4_ + local_58e0._4_4_,
                              (float)local_58c0._0_4_ + (float)local_58e0);
        uStack_5ef8 = CONCAT44(fStack_58b4 + uStack_58d8._4_4_,fStack_58b8 + (float)uStack_58d8);
        uStack_5ef0 = CONCAT44(fStack_58ac + uStack_58d0._4_4_,fStack_58b0 + (float)uStack_58d0);
        uStack_5ee8 = CONCAT44(fStack_58a4 + uStack_58c8._4_4_,fStack_58a8 + (float)uStack_58c8);
        local_71e0 = *(float *)(local_6f70 + (long)local_6f58 * 4) +
                     (float)local_58c0._0_4_ + (float)local_58e0;
        fStack_71dc = *(float *)(local_6f78 + (long)local_6f58 * 4) +
                      (float)local_58c0._4_4_ + local_58e0._4_4_;
        fStack_71d8 = *(float *)(local_6f80 + (long)local_6f58 * 4) +
                      fStack_58b8 + (float)uStack_58d8;
        fStack_71d4 = *(float *)(local_6f88 + (long)local_6f58 * 4) +
                      fStack_58b4 + uStack_58d8._4_4_;
        fStack_71d0 = *(float *)(local_6f70 + (long)(local_6f58 + 1) * 4) +
                      fStack_58b0 + (float)uStack_58d0;
        fStack_71cc = *(float *)(local_6f78 + (long)(local_6f58 + 1) * 4) +
                      fStack_58ac + uStack_58d0._4_4_;
        fStack_71c8 = *(float *)(local_6f80 + (long)(local_6f58 + 1) * 4) +
                      fStack_58a8 + (float)uStack_58c8;
        fStack_71c4 = *(float *)(local_6f88 + (long)(local_6f58 + 1) * 4) +
                      fStack_58a4 + uStack_58c8._4_4_;
        for (; 0 < (int)local_7148; local_7148 = local_7148 - 1) {
          local_71e4 = *local_6f60;
          local_71e0 = *local_6fb0 * local_71e4 + local_71e0;
          fStack_71dc = *local_6fb8 * local_71e4 + fStack_71dc;
          fStack_71d8 = *local_6fc0 * local_71e4 + fStack_71d8;
          fStack_71d4 = *local_6fc8 * local_71e4 + fStack_71d4;
          fStack_71d0 = *local_6fd0 * local_71e4 + fStack_71d0;
          fStack_71cc = *local_6fd8 * local_71e4 + fStack_71cc;
          fStack_71c8 = *local_6fe0 * local_71e4 + fStack_71c8;
          fStack_71c4 = *local_6fe8 * local_71e4 + fStack_71c4;
          local_6f60 = local_6f60 + 1;
          local_6fb0 = local_6fb0 + 1;
          local_6fb8 = local_6fb8 + 1;
          local_6fc0 = local_6fc0 + 1;
          local_6fc8 = local_6fc8 + 1;
          local_6fd0 = local_6fd0 + 1;
          local_6fd8 = local_6fd8 + 1;
          local_6fe0 = local_6fe0 + 1;
          local_6fe8 = local_6fe8 + 1;
        }
        for (; 0 < (int)local_7188; local_7188 = local_7188 - 1) {
          local_71e8 = *local_6f68;
          local_71e0 = *local_6ff0 * local_71e8 + local_71e0;
          fStack_71dc = *local_6ff8 * local_71e8 + fStack_71dc;
          fStack_71d8 = *local_7000 * local_71e8 + fStack_71d8;
          fStack_71d4 = *local_7008 * local_71e8 + fStack_71d4;
          fStack_71d0 = *local_7010 * local_71e8 + fStack_71d0;
          fStack_71cc = *local_7018 * local_71e8 + fStack_71cc;
          fStack_71c8 = *local_7020 * local_71e8 + fStack_71c8;
          fStack_71c4 = *local_7028 * local_71e8 + fStack_71c4;
          local_6f68 = local_6f68 + 1;
          local_6ff0 = local_6ff0 + 1;
          local_6ff8 = local_6ff8 + 1;
          local_7000 = local_7000 + 1;
          local_7008 = local_7008 + 1;
          local_7010 = local_7010 + 1;
          local_7018 = local_7018 + 1;
          local_7020 = local_7020 + 1;
          local_7028 = local_7028 + 1;
        }
        *(float *)(*local_6f30 + (long)local_6f58 * 4) = local_71e0;
        *(float *)(local_6f98 + (long)local_6f58 * 4) = fStack_71dc;
        *(float *)(local_6fa0 + (long)local_6f58 * 4) = fStack_71d8;
        *(float *)(local_6fa8 + (long)local_6f58 * 4) = fStack_71d4;
        *(float *)(*local_6f30 + (long)(local_6f58 + 1) * 4) = fStack_71d0;
        *(float *)(local_6f98 + (long)(local_6f58 + 1) * 4) = fStack_71cc;
        *(float *)(local_6fa0 + (long)(local_6f58 + 1) * 4) = fStack_71c8;
        *(float *)(local_6fa8 + (long)(local_6f58 + 1) * 4) = fStack_71c4;
        local_6f54 = local_6f54 + 1;
        local_6c4c = local_6f58;
        local_6bcc = local_6f58;
        local_6ae0 = ZEXT832(0) << 0x20;
        local_6ac0 = ZEXT832(0) << 0x20;
        local_6aa0 = ZEXT832(0) << 0x20;
        local_6a80 = ZEXT832(0) << 0x20;
        local_6a60 = ZEXT832(0) << 0x20;
        local_6a40 = ZEXT832(0) << 0x20;
        local_6a20 = ZEXT832(0) << 0x20;
        local_58e0 = uVar14;
        uStack_58d8 = uVar15;
        uStack_58d0 = uVar16;
        uStack_58c8 = uVar17;
        _local_58c0 = local_5ea0;
      }
      for (; local_71ec < (int)local_6ee4; local_71ec = local_71ec + 1) {
        local_6cc8 = local_6eb0;
        local_6ccc = local_74e4;
        local_71f8 = (float *)(*local_6eb0 +
                              (long)*(int *)((long)local_6eb0 + 0x2c) * (long)local_74e4 *
                              local_6eb0[2]);
        local_6b70 = in_stack_00000008;
        local_7200 = (float *)*in_stack_00000008;
        local_6cd8 = local_6ed0;
        local_6cdc = 0;
        local_7208 = *local_6ed0;
        local_6ce8 = local_6ed0;
        local_6cec = 1;
        local_7210 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * local_6ed0[2];
        local_6cf8 = local_6ed0;
        local_6cfc = 2;
        local_7218 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * 2 * local_6ed0[2];
        local_6d08 = local_6ed0;
        local_6d0c = 3;
        local_7220 = *local_6ed0 + (long)*(int *)((long)local_6ed0 + 0x2c) * 3 * local_6ed0[2];
        local_6de0 = &local_6f30;
        local_6de4 = 0;
        local_7228 = local_6f30;
        local_6df0 = &local_6f30;
        local_6df4 = 1;
        local_7230 = *local_6f30 + local_6f04 * local_6f20;
        local_6e00 = &local_6f30;
        local_6e04 = 2;
        local_7238 = *local_6f30 + (long)local_6f04 * 2 * local_6f20;
        local_6e10 = &local_6f30;
        local_6e14 = 3;
        local_7240 = *local_6f30 + (long)local_6f04 * 3 * local_6f20;
        local_6d18 = local_6ec8;
        local_6d1c = local_71ec;
        local_7248 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_71ec *
                              local_6ec8[2]);
        local_6d2c = local_6ee4 + local_71ec;
        local_6d28 = local_6ec8;
        local_7250 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6d2c *
                              local_6ec8[2]);
        local_6d3c = local_6ee4 * 2 + local_71ec;
        local_6d38 = local_6ec8;
        local_7258 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6d3c *
                              local_6ec8[2]);
        local_6d4c = local_6ee4 * 3 + local_71ec;
        local_6d48 = local_6ec8;
        local_7260 = (float *)(*local_6ec8 +
                              (long)*(int *)((long)local_6ec8 + 0x2c) * (long)local_6d4c *
                              local_6ec8[2]);
        local_6d58 = local_6ed8;
        local_6d5c = local_71ec;
        local_7268 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_71ec *
                              local_6ed8[2]);
        local_6d6c = local_6ee4 + local_71ec;
        local_6d68 = local_6ed8;
        local_7270 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6d6c *
                              local_6ed8[2]);
        local_6d7c = local_6ee4 * 2 + local_71ec;
        local_6d78 = local_6ed8;
        local_7278 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6d7c *
                              local_6ed8[2]);
        local_6d8c = local_6ee4 * 3 + local_71ec;
        local_6d88 = local_6ed8;
        local_7280 = (float *)(*local_6ed8 +
                              (long)*(int *)((long)local_6ed8 + 0x2c) * (long)local_6d8c *
                              local_6ed8[2]);
        local_6b00 = 0;
        uStack_6af8 = 0;
        uStack_6af0 = 0;
        uStack_6ae8 = 0;
        local_72a0 = 0;
        uStack_7298 = 0;
        uStack_7290 = 0;
        uStack_7288 = 0;
        local_6b20._8_8_ = SUB328(ZEXT832(0),4);
        local_72c0 = 0;
        uStack_72b8 = local_6b20._8_8_;
        uStack_72b0 = 0;
        uStack_72a8 = 0;
        local_6b40._8_8_ = SUB328(ZEXT832(0),4);
        local_72e0 = 0;
        uStack_72d8 = local_6b40._8_8_;
        uStack_72d0 = 0;
        uStack_72c8 = 0;
        local_6b60._8_8_ = SUB328(ZEXT832(0),4);
        local_7300 = 0;
        uStack_72f8 = local_6b60._8_8_;
        uStack_72f0 = 0;
        uStack_72e8 = 0;
        local_7308 = local_6edc & 7;
        for (local_7304 = (int)local_6edc >> 3; 0 < local_7304; local_7304 = local_7304 + -1) {
          local_6958 = local_71f8;
          local_7340 = *(undefined8 *)local_71f8;
          uStack_7338 = *(undefined8 *)(local_71f8 + 2);
          uStack_7330 = *(undefined8 *)(local_71f8 + 4);
          uStack_7328 = *(undefined8 *)(local_71f8 + 6);
          local_6960 = local_7248;
          uVar14 = *(undefined8 *)local_7248;
          uVar15 = *(undefined8 *)(local_7248 + 2);
          uVar16 = *(undefined8 *)(local_7248 + 4);
          uVar17 = *(undefined8 *)(local_7248 + 6);
          local_6620 = local_72a0;
          uStack_6618 = uStack_7298;
          uStack_6610 = uStack_7290;
          uStack_6608 = uStack_7288;
          local_65e0._0_4_ = (float)uVar14;
          local_4d40 = (float)local_65e0;
          local_65e0._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_4d3c = local_65e0._4_4_;
          uStack_65d8._0_4_ = (float)uVar15;
          fStack_4d38 = (float)uStack_65d8;
          uStack_65d8._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4d34 = uStack_65d8._4_4_;
          uStack_65d0._0_4_ = (float)uVar16;
          fStack_4d30 = (float)uStack_65d0;
          uStack_65d0._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_4d2c = uStack_65d0._4_4_;
          uStack_65c8._0_4_ = (float)uVar17;
          fStack_4d28 = (float)uStack_65c8;
          uStack_65c8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_5464 = uStack_65c8._4_4_;
          local_4d60._0_4_ = (float)local_7340;
          local_4d60._4_4_ = (float)((ulong)local_7340 >> 0x20);
          uStack_4d58._0_4_ = (float)uStack_7338;
          uStack_4d58._4_4_ = (float)((ulong)uStack_7338 >> 0x20);
          uStack_4d50._0_4_ = (float)uStack_7330;
          uStack_4d50._4_4_ = (float)((ulong)uStack_7330 >> 0x20);
          uStack_4d48._0_4_ = (float)uStack_7328;
          local_5480 = (float)local_65e0 * (float)local_4d60;
          fStack_547c = local_65e0._4_4_ * local_4d60._4_4_;
          fStack_5478 = (float)uStack_65d8 * (float)uStack_4d58;
          fStack_5474 = uStack_65d8._4_4_ * uStack_4d58._4_4_;
          fStack_5470 = (float)uStack_65d0 * (float)uStack_4d50;
          fStack_546c = uStack_65d0._4_4_ * uStack_4d50._4_4_;
          fStack_5468 = (float)uStack_65c8 * (float)uStack_4d48;
          uVar18 = local_72a0;
          uVar19 = uStack_7298;
          uVar20 = uStack_7290;
          uVar21 = uStack_7288;
          local_54a0._0_4_ = (float)local_72a0;
          local_54a0._4_4_ = (float)((ulong)local_72a0 >> 0x20);
          uStack_5498._0_4_ = (float)uStack_7298;
          uStack_5498._4_4_ = (float)((ulong)uStack_7298 >> 0x20);
          uStack_5490._0_4_ = (float)uStack_7290;
          uStack_5490._4_4_ = (float)((ulong)uStack_7290 >> 0x20);
          uStack_5488._0_4_ = (float)uStack_7288;
          uStack_5488._4_4_ = (float)((ulong)uStack_7288 >> 0x20);
          local_72a0 = CONCAT44(fStack_547c + local_54a0._4_4_,local_5480 + (float)local_54a0);
          uStack_7298 = CONCAT44(fStack_5474 + uStack_5498._4_4_,fStack_5478 + (float)uStack_5498);
          uStack_7290 = CONCAT44(fStack_546c + uStack_5490._4_4_,fStack_5470 + (float)uStack_5490);
          uStack_7288 = CONCAT44(uStack_65c8._4_4_ + uStack_5488._4_4_,
                                 fStack_5468 + (float)uStack_5488);
          local_6968 = local_7250;
          uVar22 = *(undefined8 *)local_7250;
          uVar23 = *(undefined8 *)(local_7250 + 2);
          uVar24 = *(undefined8 *)(local_7250 + 4);
          uVar25 = *(undefined8 *)(local_7250 + 6);
          local_6680 = local_72c0;
          uStack_6678 = uStack_72b8;
          uStack_6670 = uStack_72b0;
          uStack_6668 = uStack_72a8;
          local_6640._0_4_ = (float)uVar22;
          local_4d00 = (float)local_6640;
          local_6640._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_4cfc = local_6640._4_4_;
          uStack_6638._0_4_ = (float)uVar23;
          fStack_4cf8 = (float)uStack_6638;
          uStack_6638._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_4cf4 = uStack_6638._4_4_;
          uStack_6630._0_4_ = (float)uVar24;
          fStack_4cf0 = (float)uStack_6630;
          uStack_6630._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_4cec = uStack_6630._4_4_;
          uStack_6628._0_4_ = (float)uVar25;
          fStack_4ce8 = (float)uStack_6628;
          uStack_6628._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_5424 = uStack_6628._4_4_;
          local_5440 = (float)local_6640 * (float)local_4d60;
          fStack_543c = local_6640._4_4_ * local_4d60._4_4_;
          fStack_5438 = (float)uStack_6638 * (float)uStack_4d58;
          fStack_5434 = uStack_6638._4_4_ * uStack_4d58._4_4_;
          fStack_5430 = (float)uStack_6630 * (float)uStack_4d50;
          fStack_542c = uStack_6630._4_4_ * uStack_4d50._4_4_;
          fStack_5428 = (float)uStack_6628 * (float)uStack_4d48;
          uVar26 = local_72c0;
          uVar27 = uStack_72b8;
          uVar28 = uStack_72b0;
          uVar29 = uStack_72a8;
          local_5460._0_4_ = (float)local_72c0;
          local_5460._4_4_ = (float)((ulong)local_72c0 >> 0x20);
          uStack_5458._0_4_ = (float)uStack_72b8;
          uStack_5458._4_4_ = (float)((ulong)uStack_72b8 >> 0x20);
          uStack_5450._0_4_ = (float)uStack_72b0;
          uStack_5450._4_4_ = (float)((ulong)uStack_72b0 >> 0x20);
          uStack_5448._0_4_ = (float)uStack_72a8;
          uStack_5448._4_4_ = (float)((ulong)uStack_72a8 >> 0x20);
          local_72c0 = CONCAT44(fStack_543c + local_5460._4_4_,local_5440 + (float)local_5460);
          uStack_72b8 = CONCAT44(fStack_5434 + uStack_5458._4_4_,fStack_5438 + (float)uStack_5458);
          uStack_72b0 = CONCAT44(fStack_542c + uStack_5450._4_4_,fStack_5430 + (float)uStack_5450);
          uStack_72a8 = CONCAT44(uStack_6628._4_4_ + uStack_5448._4_4_,
                                 fStack_5428 + (float)uStack_5448);
          local_6970 = local_7258;
          uVar30 = *(undefined8 *)local_7258;
          uVar31 = *(undefined8 *)(local_7258 + 2);
          uVar32 = *(undefined8 *)(local_7258 + 4);
          uVar33 = *(undefined8 *)(local_7258 + 6);
          local_66e0 = local_72e0;
          uStack_66d8 = uStack_72d8;
          uStack_66d0 = uStack_72d0;
          uStack_66c8 = uStack_72c8;
          local_66a0._0_4_ = (float)uVar30;
          local_4cc0 = (float)local_66a0;
          local_66a0._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_4cbc = local_66a0._4_4_;
          uStack_6698._0_4_ = (float)uVar31;
          fStack_4cb8 = (float)uStack_6698;
          uStack_6698._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4cb4 = uStack_6698._4_4_;
          uStack_6690._0_4_ = (float)uVar32;
          fStack_4cb0 = (float)uStack_6690;
          uStack_6690._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_4cac = uStack_6690._4_4_;
          uStack_6688._0_4_ = (float)uVar33;
          fStack_4ca8 = (float)uStack_6688;
          uStack_6688._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_53e4 = uStack_6688._4_4_;
          local_5400 = (float)local_66a0 * (float)local_4d60;
          fStack_53fc = local_66a0._4_4_ * local_4d60._4_4_;
          fStack_53f8 = (float)uStack_6698 * (float)uStack_4d58;
          fStack_53f4 = uStack_6698._4_4_ * uStack_4d58._4_4_;
          fStack_53f0 = (float)uStack_6690 * (float)uStack_4d50;
          fStack_53ec = uStack_6690._4_4_ * uStack_4d50._4_4_;
          fStack_53e8 = (float)uStack_6688 * (float)uStack_4d48;
          uVar34 = local_72e0;
          uVar35 = uStack_72d8;
          uVar36 = uStack_72d0;
          uVar37 = uStack_72c8;
          local_5420._0_4_ = (float)local_72e0;
          local_5420._4_4_ = (float)((ulong)local_72e0 >> 0x20);
          uStack_5418._0_4_ = (float)uStack_72d8;
          uStack_5418._4_4_ = (float)((ulong)uStack_72d8 >> 0x20);
          uStack_5410._0_4_ = (float)uStack_72d0;
          uStack_5410._4_4_ = (float)((ulong)uStack_72d0 >> 0x20);
          uStack_5408._0_4_ = (float)uStack_72c8;
          uStack_5408._4_4_ = (float)((ulong)uStack_72c8 >> 0x20);
          local_72e0 = CONCAT44(fStack_53fc + local_5420._4_4_,local_5400 + (float)local_5420);
          uStack_72d8 = CONCAT44(fStack_53f4 + uStack_5418._4_4_,fStack_53f8 + (float)uStack_5418);
          uStack_72d0 = CONCAT44(fStack_53ec + uStack_5410._4_4_,fStack_53f0 + (float)uStack_5410);
          uStack_72c8 = CONCAT44(uStack_6688._4_4_ + uStack_5408._4_4_,
                                 fStack_53e8 + (float)uStack_5408);
          local_6978 = local_7260;
          uVar38 = *(undefined8 *)local_7260;
          uVar39 = *(undefined8 *)(local_7260 + 2);
          uVar40 = *(undefined8 *)(local_7260 + 4);
          uVar41 = *(undefined8 *)(local_7260 + 6);
          local_6740 = local_7300;
          uStack_6738 = uStack_72f8;
          uStack_6730 = uStack_72f0;
          uStack_6728 = uStack_72e8;
          local_6700._0_4_ = (float)uVar38;
          local_4c80 = (float)local_6700;
          local_6700._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_4c7c = local_6700._4_4_;
          uStack_66f8._0_4_ = (float)uVar39;
          fStack_4c78 = (float)uStack_66f8;
          uStack_66f8._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4c74 = uStack_66f8._4_4_;
          uStack_66f0._0_4_ = (float)uVar40;
          fStack_4c70 = (float)uStack_66f0;
          uStack_66f0._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_4c6c = uStack_66f0._4_4_;
          uStack_66e8._0_4_ = (float)uVar41;
          fStack_4c68 = (float)uStack_66e8;
          uStack_66e8._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_53a4 = uStack_66e8._4_4_;
          local_53c0 = (float)local_6700 * (float)local_4d60;
          fStack_53bc = local_6700._4_4_ * local_4d60._4_4_;
          fStack_53b8 = (float)uStack_66f8 * (float)uStack_4d58;
          fStack_53b4 = uStack_66f8._4_4_ * uStack_4d58._4_4_;
          fStack_53b0 = (float)uStack_66f0 * (float)uStack_4d50;
          fStack_53ac = uStack_66f0._4_4_ * uStack_4d50._4_4_;
          fStack_53a8 = (float)uStack_66e8 * (float)uStack_4d48;
          uVar42 = local_7300;
          uVar43 = uStack_72f8;
          uVar44 = uStack_72f0;
          uVar45 = uStack_72e8;
          local_53e0._0_4_ = (float)local_7300;
          local_53e0._4_4_ = (float)((ulong)local_7300 >> 0x20);
          uStack_53d8._0_4_ = (float)uStack_72f8;
          uStack_53d8._4_4_ = (float)((ulong)uStack_72f8 >> 0x20);
          uStack_53d0._0_4_ = (float)uStack_72f0;
          uStack_53d0._4_4_ = (float)((ulong)uStack_72f0 >> 0x20);
          uStack_53c8._0_4_ = (float)uStack_72e8;
          uStack_53c8._4_4_ = (float)((ulong)uStack_72e8 >> 0x20);
          local_7300 = CONCAT44(fStack_53bc + local_53e0._4_4_,local_53c0 + (float)local_53e0);
          uStack_72f8 = CONCAT44(fStack_53b4 + uStack_53d8._4_4_,fStack_53b8 + (float)uStack_53d8);
          uStack_72f0 = CONCAT44(fStack_53ac + uStack_53d0._4_4_,fStack_53b0 + (float)uStack_53d0);
          uStack_72e8 = CONCAT44(uStack_66e8._4_4_ + uStack_53c8._4_4_,
                                 fStack_53a8 + (float)uStack_53c8);
          local_71f8 = local_71f8 + 8;
          local_7248 = local_7248 + 8;
          local_7250 = local_7250 + 8;
          local_7258 = local_7258 + 8;
          local_7260 = local_7260 + 8;
          local_6720 = local_7340;
          uStack_6718 = uStack_7338;
          uStack_6710 = uStack_7330;
          uStack_6708 = uStack_7328;
          local_6700 = uVar38;
          uStack_66f8 = uVar39;
          uStack_66f0 = uVar40;
          uStack_66e8 = uVar41;
          local_66c0 = local_7340;
          uStack_66b8 = uStack_7338;
          uStack_66b0 = uStack_7330;
          uStack_66a8 = uStack_7328;
          local_66a0 = uVar30;
          uStack_6698 = uVar31;
          uStack_6690 = uVar32;
          uStack_6688 = uVar33;
          local_6660 = local_7340;
          uStack_6658 = uStack_7338;
          uStack_6650 = uStack_7330;
          uStack_6648 = uStack_7328;
          local_6640 = uVar22;
          uStack_6638 = uVar23;
          uStack_6630 = uVar24;
          uStack_6628 = uVar25;
          local_6600 = local_7340;
          uStack_65f8 = uStack_7338;
          uStack_65f0 = uStack_7330;
          uStack_65e8 = uStack_7328;
          local_65e0 = uVar14;
          uStack_65d8 = uVar15;
          uStack_65d0 = uVar16;
          uStack_65c8 = uVar17;
          local_54a0 = uVar18;
          uStack_5498 = uVar19;
          uStack_5490 = uVar20;
          uStack_5488 = uVar21;
          local_5460 = uVar26;
          uStack_5458 = uVar27;
          uStack_5450 = uVar28;
          uStack_5448 = uVar29;
          local_5420 = uVar34;
          uStack_5418 = uVar35;
          uStack_5410 = uVar36;
          uStack_5408 = uVar37;
          local_53e0 = uVar42;
          uStack_53d8 = uVar43;
          uStack_53d0 = uVar44;
          uStack_53c8 = uVar45;
          local_4d60 = local_7340;
          uStack_4d58 = uStack_7338;
          uStack_4d50 = uStack_7330;
          uStack_4d48 = uStack_7328;
          fStack_4d24 = fStack_5464;
          local_4d20 = local_7340;
          uStack_4d18 = uStack_7338;
          uStack_4d10 = uStack_7330;
          uStack_4d08 = uStack_7328;
          fStack_4ce4 = fStack_5424;
          local_4ce0 = local_7340;
          uStack_4cd8 = uStack_7338;
          uStack_4cd0 = uStack_7330;
          uStack_4cc8 = uStack_7328;
          fStack_4ca4 = fStack_53e4;
          local_4ca0 = local_7340;
          uStack_4c98 = uStack_7338;
          uStack_4c90 = uStack_7330;
          uStack_4c88 = uStack_7328;
          fStack_4c64 = fStack_53a4;
        }
        local_7348 = local_6ee4 & 7;
        for (local_7344 = local_73d4; 0 < local_7344; local_7344 = local_7344 + -1) {
          local_6980 = local_7200;
          local_7380 = *(undefined8 *)local_7200;
          uStack_7378 = *(undefined8 *)(local_7200 + 2);
          uStack_7370 = *(undefined8 *)(local_7200 + 4);
          uStack_7368 = *(undefined8 *)(local_7200 + 6);
          local_6988 = local_7268;
          uVar14 = *(undefined8 *)local_7268;
          uVar15 = *(undefined8 *)(local_7268 + 2);
          uVar16 = *(undefined8 *)(local_7268 + 4);
          uVar17 = *(undefined8 *)(local_7268 + 6);
          local_67a0 = local_72a0;
          uStack_6798 = uStack_7298;
          uStack_6790 = uStack_7290;
          uStack_6788 = uStack_7288;
          local_6760._0_4_ = (float)uVar14;
          local_4c40 = (float)local_6760;
          local_6760._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_4c3c = local_6760._4_4_;
          uStack_6758._0_4_ = (float)uVar15;
          fStack_4c38 = (float)uStack_6758;
          uStack_6758._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4c34 = uStack_6758._4_4_;
          uStack_6750._0_4_ = (float)uVar16;
          fStack_4c30 = (float)uStack_6750;
          uStack_6750._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_4c2c = uStack_6750._4_4_;
          uStack_6748._0_4_ = (float)uVar17;
          fStack_4c28 = (float)uStack_6748;
          uStack_6748._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_5364 = uStack_6748._4_4_;
          local_4c60._0_4_ = (float)local_7380;
          local_4c60._4_4_ = (float)((ulong)local_7380 >> 0x20);
          uStack_4c58._0_4_ = (float)uStack_7378;
          uStack_4c58._4_4_ = (float)((ulong)uStack_7378 >> 0x20);
          uStack_4c50._0_4_ = (float)uStack_7370;
          uStack_4c50._4_4_ = (float)((ulong)uStack_7370 >> 0x20);
          uStack_4c48._0_4_ = (float)uStack_7368;
          local_5380 = (float)local_6760 * (float)local_4c60;
          fStack_537c = local_6760._4_4_ * local_4c60._4_4_;
          fStack_5378 = (float)uStack_6758 * (float)uStack_4c58;
          fStack_5374 = uStack_6758._4_4_ * uStack_4c58._4_4_;
          fStack_5370 = (float)uStack_6750 * (float)uStack_4c50;
          fStack_536c = uStack_6750._4_4_ * uStack_4c50._4_4_;
          fStack_5368 = (float)uStack_6748 * (float)uStack_4c48;
          uVar18 = local_72a0;
          uVar19 = uStack_7298;
          uVar20 = uStack_7290;
          uVar21 = uStack_7288;
          local_53a0._0_4_ = (float)local_72a0;
          local_53a0._4_4_ = (float)((ulong)local_72a0 >> 0x20);
          uStack_5398._0_4_ = (float)uStack_7298;
          uStack_5398._4_4_ = (float)((ulong)uStack_7298 >> 0x20);
          uStack_5390._0_4_ = (float)uStack_7290;
          uStack_5390._4_4_ = (float)((ulong)uStack_7290 >> 0x20);
          uStack_5388._0_4_ = (float)uStack_7288;
          uStack_5388._4_4_ = (float)((ulong)uStack_7288 >> 0x20);
          local_72a0 = CONCAT44(fStack_537c + local_53a0._4_4_,local_5380 + (float)local_53a0);
          uStack_7298 = CONCAT44(fStack_5374 + uStack_5398._4_4_,fStack_5378 + (float)uStack_5398);
          uStack_7290 = CONCAT44(fStack_536c + uStack_5390._4_4_,fStack_5370 + (float)uStack_5390);
          uStack_7288 = CONCAT44(uStack_6748._4_4_ + uStack_5388._4_4_,
                                 fStack_5368 + (float)uStack_5388);
          local_6990 = local_7270;
          uVar22 = *(undefined8 *)local_7270;
          uVar23 = *(undefined8 *)(local_7270 + 2);
          uVar24 = *(undefined8 *)(local_7270 + 4);
          uVar25 = *(undefined8 *)(local_7270 + 6);
          local_6800 = local_72c0;
          uStack_67f8 = uStack_72b8;
          uStack_67f0 = uStack_72b0;
          uStack_67e8 = uStack_72a8;
          local_67c0._0_4_ = (float)uVar22;
          local_4c00 = (float)local_67c0;
          local_67c0._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_4bfc = local_67c0._4_4_;
          uStack_67b8._0_4_ = (float)uVar23;
          fStack_4bf8 = (float)uStack_67b8;
          uStack_67b8._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_4bf4 = uStack_67b8._4_4_;
          uStack_67b0._0_4_ = (float)uVar24;
          fStack_4bf0 = (float)uStack_67b0;
          uStack_67b0._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_4bec = uStack_67b0._4_4_;
          uStack_67a8._0_4_ = (float)uVar25;
          fStack_4be8 = (float)uStack_67a8;
          uStack_67a8._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_5324 = uStack_67a8._4_4_;
          local_5340 = (float)local_67c0 * (float)local_4c60;
          fStack_533c = local_67c0._4_4_ * local_4c60._4_4_;
          fStack_5338 = (float)uStack_67b8 * (float)uStack_4c58;
          fStack_5334 = uStack_67b8._4_4_ * uStack_4c58._4_4_;
          fStack_5330 = (float)uStack_67b0 * (float)uStack_4c50;
          fStack_532c = uStack_67b0._4_4_ * uStack_4c50._4_4_;
          fStack_5328 = (float)uStack_67a8 * (float)uStack_4c48;
          uVar26 = local_72c0;
          uVar27 = uStack_72b8;
          uVar28 = uStack_72b0;
          uVar29 = uStack_72a8;
          local_5360._0_4_ = (float)local_72c0;
          local_5360._4_4_ = (float)((ulong)local_72c0 >> 0x20);
          uStack_5358._0_4_ = (float)uStack_72b8;
          uStack_5358._4_4_ = (float)((ulong)uStack_72b8 >> 0x20);
          uStack_5350._0_4_ = (float)uStack_72b0;
          uStack_5350._4_4_ = (float)((ulong)uStack_72b0 >> 0x20);
          uStack_5348._0_4_ = (float)uStack_72a8;
          uStack_5348._4_4_ = (float)((ulong)uStack_72a8 >> 0x20);
          local_72c0 = CONCAT44(fStack_533c + local_5360._4_4_,local_5340 + (float)local_5360);
          uStack_72b8 = CONCAT44(fStack_5334 + uStack_5358._4_4_,fStack_5338 + (float)uStack_5358);
          uStack_72b0 = CONCAT44(fStack_532c + uStack_5350._4_4_,fStack_5330 + (float)uStack_5350);
          uStack_72a8 = CONCAT44(uStack_67a8._4_4_ + uStack_5348._4_4_,
                                 fStack_5328 + (float)uStack_5348);
          local_6998 = local_7278;
          uVar30 = *(undefined8 *)local_7278;
          uVar31 = *(undefined8 *)(local_7278 + 2);
          uVar32 = *(undefined8 *)(local_7278 + 4);
          uVar33 = *(undefined8 *)(local_7278 + 6);
          local_6860 = local_72e0;
          uStack_6858 = uStack_72d8;
          uStack_6850 = uStack_72d0;
          uStack_6848 = uStack_72c8;
          local_6820._0_4_ = (float)uVar30;
          local_4bc0 = (float)local_6820;
          local_6820._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_4bbc = local_6820._4_4_;
          uStack_6818._0_4_ = (float)uVar31;
          fStack_4bb8 = (float)uStack_6818;
          uStack_6818._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4bb4 = uStack_6818._4_4_;
          uStack_6810._0_4_ = (float)uVar32;
          fStack_4bb0 = (float)uStack_6810;
          uStack_6810._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_4bac = uStack_6810._4_4_;
          uStack_6808._0_4_ = (float)uVar33;
          fStack_4ba8 = (float)uStack_6808;
          uStack_6808._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_52e4 = uStack_6808._4_4_;
          local_5300 = (float)local_6820 * (float)local_4c60;
          fStack_52fc = local_6820._4_4_ * local_4c60._4_4_;
          fStack_52f8 = (float)uStack_6818 * (float)uStack_4c58;
          fStack_52f4 = uStack_6818._4_4_ * uStack_4c58._4_4_;
          fStack_52f0 = (float)uStack_6810 * (float)uStack_4c50;
          fStack_52ec = uStack_6810._4_4_ * uStack_4c50._4_4_;
          fStack_52e8 = (float)uStack_6808 * (float)uStack_4c48;
          uVar34 = local_72e0;
          uVar35 = uStack_72d8;
          uVar36 = uStack_72d0;
          uVar37 = uStack_72c8;
          local_5320._0_4_ = (float)local_72e0;
          local_5320._4_4_ = (float)((ulong)local_72e0 >> 0x20);
          uStack_5318._0_4_ = (float)uStack_72d8;
          uStack_5318._4_4_ = (float)((ulong)uStack_72d8 >> 0x20);
          uStack_5310._0_4_ = (float)uStack_72d0;
          uStack_5310._4_4_ = (float)((ulong)uStack_72d0 >> 0x20);
          uStack_5308._0_4_ = (float)uStack_72c8;
          uStack_5308._4_4_ = (float)((ulong)uStack_72c8 >> 0x20);
          local_72e0 = CONCAT44(fStack_52fc + local_5320._4_4_,local_5300 + (float)local_5320);
          uStack_72d8 = CONCAT44(fStack_52f4 + uStack_5318._4_4_,fStack_52f8 + (float)uStack_5318);
          uStack_72d0 = CONCAT44(fStack_52ec + uStack_5310._4_4_,fStack_52f0 + (float)uStack_5310);
          uStack_72c8 = CONCAT44(uStack_6808._4_4_ + uStack_5308._4_4_,
                                 fStack_52e8 + (float)uStack_5308);
          local_69a0 = local_7280;
          uVar38 = *(undefined8 *)local_7280;
          uVar39 = *(undefined8 *)(local_7280 + 2);
          uVar40 = *(undefined8 *)(local_7280 + 4);
          uVar41 = *(undefined8 *)(local_7280 + 6);
          local_68c0 = local_7300;
          uStack_68b8 = uStack_72f8;
          uStack_68b0 = uStack_72f0;
          uStack_68a8 = uStack_72e8;
          local_6880._0_4_ = (float)uVar38;
          local_4b80 = (float)local_6880;
          local_6880._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_4b7c = local_6880._4_4_;
          uStack_6878._0_4_ = (float)uVar39;
          fStack_4b78 = (float)uStack_6878;
          uStack_6878._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4b74 = uStack_6878._4_4_;
          uStack_6870._0_4_ = (float)uVar40;
          fStack_4b70 = (float)uStack_6870;
          uStack_6870._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_4b6c = uStack_6870._4_4_;
          uStack_6868._0_4_ = (float)uVar41;
          fStack_4b68 = (float)uStack_6868;
          uStack_6868._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_52a4 = uStack_6868._4_4_;
          local_52c0 = (float)local_6880 * (float)local_4c60;
          fStack_52bc = local_6880._4_4_ * local_4c60._4_4_;
          fStack_52b8 = (float)uStack_6878 * (float)uStack_4c58;
          fStack_52b4 = uStack_6878._4_4_ * uStack_4c58._4_4_;
          fStack_52b0 = (float)uStack_6870 * (float)uStack_4c50;
          fStack_52ac = uStack_6870._4_4_ * uStack_4c50._4_4_;
          fStack_52a8 = (float)uStack_6868 * (float)uStack_4c48;
          uVar42 = local_7300;
          uVar43 = uStack_72f8;
          uVar44 = uStack_72f0;
          uVar45 = uStack_72e8;
          local_52e0._0_4_ = (float)local_7300;
          local_52e0._4_4_ = (float)((ulong)local_7300 >> 0x20);
          uStack_52d8._0_4_ = (float)uStack_72f8;
          uStack_52d8._4_4_ = (float)((ulong)uStack_72f8 >> 0x20);
          uStack_52d0._0_4_ = (float)uStack_72f0;
          uStack_52d0._4_4_ = (float)((ulong)uStack_72f0 >> 0x20);
          uStack_52c8._0_4_ = (float)uStack_72e8;
          uStack_52c8._4_4_ = (float)((ulong)uStack_72e8 >> 0x20);
          local_7300 = CONCAT44(fStack_52bc + local_52e0._4_4_,local_52c0 + (float)local_52e0);
          uStack_72f8 = CONCAT44(fStack_52b4 + uStack_52d8._4_4_,fStack_52b8 + (float)uStack_52d8);
          uStack_72f0 = CONCAT44(fStack_52ac + uStack_52d0._4_4_,fStack_52b0 + (float)uStack_52d0);
          uStack_72e8 = CONCAT44(uStack_6868._4_4_ + uStack_52c8._4_4_,
                                 fStack_52a8 + (float)uStack_52c8);
          local_7200 = local_7200 + 8;
          local_7268 = local_7268 + 8;
          local_7270 = local_7270 + 8;
          local_7278 = local_7278 + 8;
          local_7280 = local_7280 + 8;
          local_68a0 = local_7380;
          uStack_6898 = uStack_7378;
          uStack_6890 = uStack_7370;
          uStack_6888 = uStack_7368;
          local_6880 = uVar38;
          uStack_6878 = uVar39;
          uStack_6870 = uVar40;
          uStack_6868 = uVar41;
          local_6840 = local_7380;
          uStack_6838 = uStack_7378;
          uStack_6830 = uStack_7370;
          uStack_6828 = uStack_7368;
          local_6820 = uVar30;
          uStack_6818 = uVar31;
          uStack_6810 = uVar32;
          uStack_6808 = uVar33;
          local_67e0 = local_7380;
          uStack_67d8 = uStack_7378;
          uStack_67d0 = uStack_7370;
          uStack_67c8 = uStack_7368;
          local_67c0 = uVar22;
          uStack_67b8 = uVar23;
          uStack_67b0 = uVar24;
          uStack_67a8 = uVar25;
          local_6780 = local_7380;
          uStack_6778 = uStack_7378;
          uStack_6770 = uStack_7370;
          uStack_6768 = uStack_7368;
          local_6760 = uVar14;
          uStack_6758 = uVar15;
          uStack_6750 = uVar16;
          uStack_6748 = uVar17;
          local_53a0 = uVar18;
          uStack_5398 = uVar19;
          uStack_5390 = uVar20;
          uStack_5388 = uVar21;
          local_5360 = uVar26;
          uStack_5358 = uVar27;
          uStack_5350 = uVar28;
          uStack_5348 = uVar29;
          local_5320 = uVar34;
          uStack_5318 = uVar35;
          uStack_5310 = uVar36;
          uStack_5308 = uVar37;
          local_52e0 = uVar42;
          uStack_52d8 = uVar43;
          uStack_52d0 = uVar44;
          uStack_52c8 = uVar45;
          local_4c60 = local_7380;
          uStack_4c58 = uStack_7378;
          uStack_4c50 = uStack_7370;
          uStack_4c48 = uStack_7368;
          fStack_4c24 = fStack_5364;
          local_4c20 = local_7380;
          uStack_4c18 = uStack_7378;
          uStack_4c10 = uStack_7370;
          uStack_4c08 = uStack_7368;
          fStack_4be4 = fStack_5324;
          local_4be0 = local_7380;
          uStack_4bd8 = uStack_7378;
          uStack_4bd0 = uStack_7370;
          uStack_4bc8 = uStack_7368;
          fStack_4ba4 = fStack_52e4;
          local_4ba0 = local_7380;
          uStack_4b98 = uStack_7378;
          uStack_4b90 = uStack_7370;
          uStack_4b88 = uStack_7368;
          fStack_4b64 = fStack_52a4;
        }
        local_5d68 = &local_7390;
        local_5cd8 = &local_72a0;
        local_5ce0 = &local_72c0;
        local_5ce8 = &local_72e0;
        local_5cf0 = &local_7300;
        local_4a00 = local_72a0;
        uStack_49f8 = uStack_7298;
        uStack_49f0 = uStack_7290;
        uStack_49e8 = uStack_7288;
        auVar142._8_8_ = uStack_7298;
        auVar142._0_8_ = local_72a0;
        auVar142._16_8_ = uStack_7290;
        auVar142._24_8_ = uStack_7288;
        local_4a20 = local_72c0;
        uStack_4a18 = uStack_72b8;
        uStack_4a10 = uStack_72b0;
        uStack_4a08 = uStack_72a8;
        auVar141._8_8_ = uStack_72b8;
        auVar141._0_8_ = local_72c0;
        auVar141._16_8_ = uStack_72b0;
        auVar141._24_8_ = uStack_72a8;
        local_5d20 = vhaddps_avx(auVar142,auVar141);
        local_4a40 = local_72e0;
        uStack_4a38 = uStack_72d8;
        uStack_4a30 = uStack_72d0;
        uStack_4a28 = uStack_72c8;
        auVar140._8_8_ = uStack_72d8;
        auVar140._0_8_ = local_72e0;
        auVar140._16_8_ = uStack_72d0;
        auVar140._24_8_ = uStack_72c8;
        local_4a60 = local_7300;
        uStack_4a58 = uStack_72f8;
        uStack_4a50 = uStack_72f0;
        uStack_4a48 = uStack_72e8;
        auVar139._8_8_ = uStack_72f8;
        auVar139._0_8_ = local_7300;
        auVar139._16_8_ = uStack_72f0;
        auVar139._24_8_ = uStack_72e8;
        local_5d40 = vhaddps_avx(auVar140,auVar139);
        local_4a80 = local_5d20._0_8_;
        uStack_4a78 = local_5d20._8_8_;
        uStack_4a70 = local_5d20._16_8_;
        uStack_4a68 = local_5d20._24_8_;
        local_4aa0 = local_5d40._0_8_;
        uStack_4a98 = local_5d40._8_8_;
        uStack_4a90 = local_5d40._16_8_;
        uStack_4a88 = local_5d40._24_8_;
        _local_5d60 = vhaddps_avx(local_5d20,local_5d40);
        uStack_4830 = local_5d60._16_8_;
        uStack_4828 = uStack_5d48;
        local_4840 = local_5d60._0_8_;
        uStack_4838 = local_5d60._8_8_;
        _local_4850 = stack0xffffffffffffa2b0;
        auVar5 = _local_4850;
        local_4860 = local_5d60._0_8_;
        uVar14 = local_4860;
        uStack_4858 = local_5d60._8_8_;
        uVar15 = uStack_4858;
        local_4850._0_4_ = local_5d60._16_4_;
        local_4850._4_4_ = local_5d60._20_4_;
        fStack_4848 = local_5d60._24_4_;
        fStack_4844 = local_5d60._28_4_;
        local_4860._0_4_ = local_5d60._0_4_;
        local_4860._4_4_ = local_5d60._4_4_;
        uStack_4858._0_4_ = local_5d60._8_4_;
        uStack_4858._4_4_ = local_5d60._12_4_;
        local_5d80 = CONCAT44((float)local_4850._4_4_ + local_4860._4_4_,
                              (float)local_4850._0_4_ + (float)local_4860);
        uStack_5d78 = CONCAT44(fStack_4844 + uStack_4858._4_4_,fStack_4848 + (float)uStack_4858);
        local_7390 = *(float *)(local_7208 + (long)local_71ec * 4) +
                     (float)local_4850._0_4_ + (float)local_4860;
        fStack_738c = *(float *)(local_7210 + (long)local_71ec * 4) +
                      (float)local_4850._4_4_ + local_4860._4_4_;
        fStack_7388 = *(float *)(local_7218 + (long)local_71ec * 4) +
                      fStack_4848 + (float)uStack_4858;
        fStack_7384 = *(float *)(local_7220 + (long)local_71ec * 4) +
                      fStack_4844 + uStack_4858._4_4_;
        for (; 0 < (int)local_7308; local_7308 = local_7308 - 1) {
          fVar1 = *local_71f8;
          local_7390 = *local_7248 * fVar1 + local_7390;
          fStack_738c = *local_7250 * fVar1 + fStack_738c;
          fStack_7388 = *local_7258 * fVar1 + fStack_7388;
          fStack_7384 = *local_7260 * fVar1 + fStack_7384;
          local_71f8 = local_71f8 + 1;
          local_7248 = local_7248 + 1;
          local_7250 = local_7250 + 1;
          local_7258 = local_7258 + 1;
          local_7260 = local_7260 + 1;
        }
        for (; 0 < (int)local_7348; local_7348 = local_7348 - 1) {
          fVar1 = *local_7200;
          local_7390 = *local_7268 * fVar1 + local_7390;
          fStack_738c = *local_7270 * fVar1 + fStack_738c;
          fStack_7388 = *local_7278 * fVar1 + fStack_7388;
          fStack_7384 = *local_7280 * fVar1 + fStack_7384;
          local_7200 = local_7200 + 1;
          local_7268 = local_7268 + 1;
          local_7270 = local_7270 + 1;
          local_7278 = local_7278 + 1;
          local_7280 = local_7280 + 1;
        }
        *(float *)(*local_6f30 + (long)local_71ec * 4) = local_7390;
        *(float *)(local_7230 + (long)local_71ec * 4) = fStack_738c;
        *(float *)(local_7238 + (long)local_71ec * 4) = fStack_7388;
        *(float *)(local_7240 + (long)local_71ec * 4) = fStack_7384;
        local_6b60 = ZEXT832(0) << 0x20;
        local_6b40 = ZEXT832(0) << 0x20;
        local_6b20 = ZEXT832(0) << 0x20;
        local_4860 = uVar14;
        uStack_4858 = uVar15;
        _local_4850 = auVar5;
      }
      local_6e20 = local_6eb8;
      local_6e24 = local_74e4;
      local_73a0 = (undefined1 (*) [32])
                   (*local_6eb8 +
                   (long)*(int *)((long)local_6eb8 + 0x2c) * (long)local_74e4 * local_6eb8[2]);
      local_5cc8 = hidden_state;
      local_73a8 = (float *)hidden_state->data;
      local_5cd0 = in_stack_00000008;
      local_73b0 = (float *)*in_stack_00000008;
      local_6e30 = &local_6f30;
      local_6e34 = 0;
      local_73b8 = local_6f30;
      local_6e40 = &local_6f30;
      local_6e44 = 1;
      local_73c0 = (undefined1 (*) [32])(*local_6f30 + local_6f04 * local_6f20);
      local_6e50 = &local_6f30;
      local_6e54 = 2;
      local_73c8 = (undefined1 (*) [32])(*local_6f30 + (long)local_6f04 * 2 * local_6f20);
      local_6e60 = &local_6f30;
      local_6e64 = 3;
      local_73d0 = (uint *)(*local_6f30 + (long)local_6f04 * 3 * local_6f20);
      local_73d8 = local_6ee4 & 7;
      for (; 0 < local_73d4; local_73d4 = local_73d4 + -1) {
        local_69a8 = local_73b8;
        local_5be0 = *(undefined8 *)*local_73b8;
        uStack_5bd8 = *(undefined8 *)(*local_73b8 + 8);
        uStack_5bd0 = *(undefined8 *)(*local_73b8 + 0x10);
        uStack_5bc8 = *(undefined8 *)(*local_73b8 + 0x18);
        local_47ec = 0x3f800000;
        local_1b00 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar151._16_16_ = auVar5;
        auVar151._0_16_ = auVar6;
        local_1b20._0_8_ = auVar6._0_8_;
        local_1b20._8_8_ = auVar6._8_8_;
        local_1b20._16_8_ = auVar5._0_8_;
        local_1b20._24_8_ = auVar5._8_8_;
        local_5c00 = local_1b20._0_8_;
        uStack_5bf8 = local_1b20._8_8_;
        uStack_5bf0 = local_1b20._16_8_;
        uStack_5be8 = local_1b20._24_8_;
        local_35a0 = ZEXT832(0) << 0x20;
        local_1c40 = 0;
        local_5bc0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1c38 = local_5bc0._8_8_;
        uStack_1c30 = 0;
        uStack_1c28 = 0;
        auVar13 = vsubps_avx(ZEXT832((ulong)local_5bc0._8_8_) << 0x40,*local_73b8);
        local_3640 = 0x3f8000003f800000;
        uStack_3638 = 0x3f8000003f800000;
        uStack_3630 = 0x3f8000003f800000;
        uStack_3628 = 0x3f8000003f800000;
        local_35c0._0_8_ = auVar13._0_8_;
        local_18c0 = local_35c0._0_8_;
        local_35c0._8_8_ = auVar13._8_8_;
        uStack_18b8 = local_35c0._8_8_;
        local_35c0._16_8_ = auVar13._16_8_;
        uStack_18b0 = local_35c0._16_8_;
        local_35c0._24_8_ = auVar13._24_8_;
        uStack_18a8 = local_35c0._24_8_;
        local_18e0 = 0x42b0c0a542b0c0a5;
        uStack_18d8 = 0x42b0c0a542b0c0a5;
        uStack_18d0 = 0x42b0c0a542b0c0a5;
        uStack_18c8 = 0x42b0c0a542b0c0a5;
        auVar97._8_8_ = 0x42b0c0a542b0c0a5;
        auVar97._0_8_ = 0x42b0c0a542b0c0a5;
        auVar97._16_8_ = 0x42b0c0a542b0c0a5;
        auVar97._24_8_ = 0x42b0c0a542b0c0a5;
        auVar13 = vminps_avx(auVar13,auVar97);
        local_35c0._0_8_ = auVar13._0_8_;
        local_1780 = local_35c0._0_8_;
        local_35c0._8_8_ = auVar13._8_8_;
        uStack_1778 = local_35c0._8_8_;
        local_35c0._16_8_ = auVar13._16_8_;
        uStack_1770 = local_35c0._16_8_;
        local_35c0._24_8_ = auVar13._24_8_;
        uStack_1768 = local_35c0._24_8_;
        local_17a0 = 0xc2b0c0a5c2b0c0a5;
        uStack_1798 = 0xc2b0c0a5c2b0c0a5;
        uStack_1790 = 0xc2b0c0a5c2b0c0a5;
        uStack_1788 = 0xc2b0c0a5c2b0c0a5;
        auVar102._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar102._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar102._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar102._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar8 = vmaxps_avx(auVar13,auVar102);
        local_35c0._0_8_ = auVar8._0_8_;
        local_3300 = local_35c0._0_8_;
        local_35c0._8_8_ = auVar8._8_8_;
        uStack_32f8 = local_35c0._8_8_;
        local_35c0._16_8_ = auVar8._16_8_;
        uStack_32f0 = local_35c0._16_8_;
        local_35c0._24_8_ = auVar8._24_8_;
        uStack_32e8 = local_35c0._24_8_;
        local_3320 = 0x3fb8aa3b3fb8aa3b;
        uStack_3318 = 0x3fb8aa3b3fb8aa3b;
        uStack_3310 = 0x3fb8aa3b3fb8aa3b;
        uStack_3308 = 0x3fb8aa3b3fb8aa3b;
        local_3340 = 0x3f0000003f000000;
        uStack_3338 = 0x3f0000003f000000;
        uStack_3330 = 0x3f0000003f000000;
        uStack_3328 = 0x3f0000003f000000;
        uVar14 = local_35c0._0_8_;
        uVar15 = local_35c0._8_8_;
        uVar16 = local_35c0._16_8_;
        uVar17 = local_35c0._24_8_;
        local_30e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_30d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_30d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_30c8 = 0x3fb8aa3b3fb8aa3b;
        local_30c0._0_4_ = auVar8._0_4_;
        local_30c0._4_4_ = auVar8._4_4_;
        uStack_30b8._0_4_ = auVar8._8_4_;
        uStack_30b8._4_4_ = auVar8._12_4_;
        uStack_30b0._0_4_ = auVar8._16_4_;
        uStack_30b0._4_4_ = auVar8._20_4_;
        uStack_30a8._0_4_ = auVar8._24_4_;
        uStack_32a4 = 0x3fb8aa3b;
        local_32c0 = (float)local_30c0 * 1.442695;
        fStack_32bc = local_30c0._4_4_ * 1.442695;
        fStack_32b8 = (float)uStack_30b8 * 1.442695;
        fStack_32b4 = uStack_30b8._4_4_ * 1.442695;
        fStack_32b0 = (float)uStack_30b0 * 1.442695;
        fStack_32ac = uStack_30b0._4_4_ * 1.442695;
        fStack_32a8 = (float)uStack_30a8 * 1.442695;
        local_32e0 = 0x3f0000003f000000;
        uStack_32d8 = 0x3f0000003f000000;
        uStack_32d0 = 0x3f0000003f000000;
        uStack_32c8 = 0x3f0000003f000000;
        local_3600._4_4_ = fStack_32bc + 0.5;
        local_3600._0_4_ = local_32c0 + 0.5;
        uStack_35f8._0_4_ = fStack_32b8 + 0.5;
        uStack_35f8._4_4_ = fStack_32b4 + 0.5;
        uStack_35f0._0_4_ = fStack_32b0 + 0.5;
        uStack_35f0._4_4_ = fStack_32ac + 0.5;
        uStack_35e8._0_4_ = fStack_32a8 + 0.5;
        uStack_35e8._4_4_ = 0x3ff8aa3b;
        auVar10 = vroundps_avx(_local_3600,1);
        auVar13 = vcmpps_avx(_local_3600,auVar10,1);
        local_3660._0_8_ = auVar13._0_8_;
        local_1640 = local_3660._0_8_;
        local_3660._8_8_ = auVar13._8_8_;
        uStack_1638 = local_3660._8_8_;
        local_3660._16_8_ = auVar13._16_8_;
        uStack_1630 = local_3660._16_8_;
        local_3660._24_8_ = auVar13._24_8_;
        uStack_1628 = local_3660._24_8_;
        local_1660 = 0x3f8000003f800000;
        uStack_1658 = 0x3f8000003f800000;
        uStack_1650 = 0x3f8000003f800000;
        uStack_1648 = 0x3f8000003f800000;
        auVar107._8_8_ = 0x3f8000003f800000;
        auVar107._0_8_ = 0x3f8000003f800000;
        auVar107._16_8_ = 0x3f8000003f800000;
        auVar107._24_8_ = 0x3f8000003f800000;
        local_3660 = vandps_avx(auVar13,auVar107);
        local_35e0 = auVar10._0_8_;
        local_1e00 = local_35e0;
        uStack_35d8 = auVar10._8_8_;
        uStack_1df8 = uStack_35d8;
        uStack_35d0 = auVar10._16_8_;
        uStack_1df0 = uStack_35d0;
        uStack_35c8 = auVar10._24_8_;
        uStack_1de8 = uStack_35c8;
        local_1e20 = local_3660._0_8_;
        uStack_1e18 = local_3660._8_8_;
        uStack_1e10 = local_3660._16_8_;
        uStack_1e08 = local_3660._24_8_;
        _local_3600 = vsubps_avx(auVar10,local_3660);
        local_1100 = local_3600;
        uStack_10f8 = uStack_35f8;
        uStack_10f0 = uStack_35f0;
        uStack_10e8 = uStack_35e8;
        local_1140 = local_35c0._0_8_;
        uStack_1138 = local_35c0._8_8_;
        uStack_1130 = local_35c0._16_8_;
        uStack_1128 = local_35c0._24_8_;
        local_1120 = 0x3f3180003f318000;
        uStack_1118 = 0x3f3180003f318000;
        uStack_1110 = 0x3f3180003f318000;
        uStack_1108 = 0x3f3180003f318000;
        local_1080 = local_35c0._0_8_;
        uStack_1078 = local_35c0._8_8_;
        uStack_1070 = local_35c0._16_8_;
        uStack_1068 = local_35c0._24_8_;
        local_10e0 = 0x3f3180003f318000;
        uStack_10d8 = 0x3f3180003f318000;
        uStack_10d0 = 0x3f3180003f318000;
        uStack_10c8 = 0x3f3180003f318000;
        local_10c0._0_4_ = local_3600._0_4_;
        local_10c0._4_4_ = local_3600._4_4_;
        uStack_10b8._0_4_ = local_3600._8_4_;
        uStack_10b8._4_4_ = local_3600._12_4_;
        uStack_10b0._0_4_ = local_3600._16_4_;
        uStack_10b0._4_4_ = local_3600._20_4_;
        uStack_10a8._0_4_ = local_3600._24_4_;
        uStack_10a8._4_4_ = local_3600._28_4_;
        fStack_1084 = uStack_10a8._4_4_;
        local_10a0 = (float)local_10c0 * 0.6933594;
        fStack_109c = local_10c0._4_4_ * 0.6933594;
        fStack_1098 = (float)uStack_10b8 * 0.6933594;
        fStack_1094 = uStack_10b8._4_4_ * 0.6933594;
        fStack_1090 = (float)uStack_10b0 * 0.6933594;
        fStack_108c = uStack_10b0._4_4_ * 0.6933594;
        fStack_1088 = (float)uStack_10a8 * 0.6933594;
        auVar115._4_4_ = fStack_109c;
        auVar115._0_4_ = local_10a0;
        auVar115._8_4_ = fStack_1098;
        auVar115._12_4_ = fStack_1094;
        auVar115._16_4_ = fStack_1090;
        auVar115._20_4_ = fStack_108c;
        auVar115._24_4_ = fStack_1088;
        auVar115._28_4_ = uStack_10a8._4_4_;
        auVar13 = vsubps_avx(auVar8,auVar115);
        local_7f60 = auVar13._0_8_;
        uStack_7f58 = auVar13._8_8_;
        uStack_7f50 = auVar13._16_8_;
        uStack_7f48 = auVar13._24_8_;
        local_11e0 = local_3600;
        uStack_11d8 = uStack_35f8;
        uStack_11d0 = uStack_35f0;
        uStack_11c8 = uStack_35e8;
        local_1220 = local_7f60;
        uStack_1218 = uStack_7f58;
        uStack_1210 = uStack_7f50;
        uStack_1208 = uStack_7f48;
        local_1200 = 0xb95e8083b95e8083;
        uStack_11f8 = 0xb95e8083b95e8083;
        uStack_11f0 = 0xb95e8083b95e8083;
        uStack_11e8 = 0xb95e8083b95e8083;
        local_1160 = local_7f60;
        uStack_1158 = uStack_7f58;
        uStack_1150 = uStack_7f50;
        uStack_1148 = uStack_7f48;
        local_11a0 = local_3600;
        uStack_1198 = uStack_35f8;
        uStack_1190 = uStack_35f0;
        uStack_1188 = uStack_35e8;
        local_11c0 = 0xb95e8083b95e8083;
        uStack_11b8 = 0xb95e8083b95e8083;
        uStack_11b0 = 0xb95e8083b95e8083;
        uStack_11a8 = 0xb95e8083b95e8083;
        fStack_1164 = uStack_10a8._4_4_;
        local_1180 = (float)local_10c0 * -0.00021219444;
        fStack_117c = local_10c0._4_4_ * -0.00021219444;
        fStack_1178 = (float)uStack_10b8 * -0.00021219444;
        fStack_1174 = uStack_10b8._4_4_ * -0.00021219444;
        fStack_1170 = (float)uStack_10b0 * -0.00021219444;
        fStack_116c = uStack_10b0._4_4_ * -0.00021219444;
        fStack_1168 = (float)uStack_10a8 * -0.00021219444;
        auVar114._4_4_ = fStack_117c;
        auVar114._0_4_ = local_1180;
        auVar114._8_4_ = fStack_1178;
        auVar114._12_4_ = fStack_1174;
        auVar114._16_4_ = fStack_1170;
        auVar114._20_4_ = fStack_116c;
        auVar114._24_4_ = fStack_1168;
        auVar114._28_4_ = uStack_10a8._4_4_;
        local_35c0 = vsubps_avx(auVar13,auVar114);
        local_7fc0 = local_35c0._0_8_;
        uStack_7fb8 = local_35c0._8_8_;
        uStack_7fb0 = local_35c0._16_8_;
        uStack_7fa8 = local_35c0._24_8_;
        local_2ee0 = local_7fc0;
        uStack_2ed8 = uStack_7fb8;
        uStack_2ed0 = uStack_7fb0;
        uStack_2ec8 = uStack_7fa8;
        local_2ec0._0_4_ = local_35c0._0_4_;
        local_2ec0._4_4_ = local_35c0._4_4_;
        uStack_2eb8._0_4_ = local_35c0._8_4_;
        uStack_2eb8._4_4_ = local_35c0._12_4_;
        uStack_2eb0._0_4_ = local_35c0._16_4_;
        uStack_2eb0._4_4_ = local_35c0._20_4_;
        uStack_2ea8._0_4_ = local_35c0._24_4_;
        uStack_2ea8._4_4_ = local_35c0._28_4_;
        local_35e0 = CONCAT44(local_2ec0._4_4_ * local_2ec0._4_4_,
                              (float)local_2ec0 * (float)local_2ec0);
        uStack_35d8._0_4_ = (float)uStack_2eb8 * (float)uStack_2eb8;
        uStack_35d8._4_4_ = uStack_2eb8._4_4_ * uStack_2eb8._4_4_;
        uStack_35d0._0_4_ = (float)uStack_2eb0 * (float)uStack_2eb0;
        uStack_35d0._4_4_ = uStack_2eb0._4_4_ * uStack_2eb0._4_4_;
        auVar146 = _local_35e0;
        uStack_35c8._0_4_ = (float)uStack_2ea8 * (float)uStack_2ea8;
        uStack_35c8._4_4_ = uStack_2ea8._4_4_;
        auVar143 = _local_35e0;
        local_3360 = 0x3950696739506967;
        uStack_3358 = 0x3950696739506967;
        uStack_3350 = 0x3950696739506967;
        uStack_3348 = 0x3950696739506967;
        local_3380 = local_7fc0;
        uStack_3378 = uStack_7fb8;
        uStack_3370 = uStack_7fb0;
        uStack_3368 = uStack_7fa8;
        local_33a0 = 0x3ab743ce3ab743ce;
        uStack_3398 = 0x3ab743ce3ab743ce;
        uStack_3390 = 0x3ab743ce3ab743ce;
        uStack_3388 = 0x3ab743ce3ab743ce;
        local_3080 = 0x3950696739506967;
        uStack_3078 = 0x3950696739506967;
        uStack_3070 = 0x3950696739506967;
        uStack_3068 = 0x3950696739506967;
        local_30a0 = local_7fc0;
        uStack_3098 = uStack_7fb8;
        uStack_3090 = uStack_7fb0;
        uStack_3088 = uStack_7fa8;
        fStack_3264 = uStack_2ea8._4_4_;
        local_3280 = (float)local_2ec0 * 0.00019875691;
        fStack_327c = local_2ec0._4_4_ * 0.00019875691;
        fStack_3278 = (float)uStack_2eb8 * 0.00019875691;
        fStack_3274 = uStack_2eb8._4_4_ * 0.00019875691;
        fStack_3270 = (float)uStack_2eb0 * 0.00019875691;
        fStack_326c = uStack_2eb0._4_4_ * 0.00019875691;
        fStack_3268 = (float)uStack_2ea8 * 0.00019875691;
        local_32a0 = 0x3ab743ce3ab743ce;
        uStack_3298 = 0x3ab743ce3ab743ce;
        uStack_3290 = 0x3ab743ce3ab743ce;
        uStack_3288 = 0x3ab743ce3ab743ce;
        local_3680 = CONCAT44(fStack_327c + 0.0013981999,local_3280 + 0.0013981999);
        uStack_3678 = CONCAT44(fStack_3274 + 0.0013981999,fStack_3278 + 0.0013981999);
        uStack_3670 = CONCAT44(fStack_326c + 0.0013981999,fStack_3270 + 0.0013981999);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + 0.0013981999,fStack_3268 + 0.0013981999);
        local_33c0 = local_3680;
        uStack_33b8 = uStack_3678;
        uStack_33b0 = uStack_3670;
        uStack_33a8 = uStack_3668;
        local_33e0 = local_7fc0;
        uStack_33d8 = uStack_7fb8;
        uStack_33d0 = uStack_7fb0;
        uStack_33c8 = uStack_7fa8;
        local_3400 = 0x3c0889083c088908;
        uStack_33f8 = 0x3c0889083c088908;
        uStack_33f0 = 0x3c0889083c088908;
        uStack_33e8 = 0x3c0889083c088908;
        local_3040 = local_3680;
        uStack_3038 = uStack_3678;
        uStack_3030 = uStack_3670;
        uStack_3028 = uStack_3668;
        local_3060 = local_7fc0;
        uStack_3058 = uStack_7fb8;
        uStack_3050 = uStack_7fb0;
        uStack_3048 = uStack_7fa8;
        fStack_3224 = uStack_2ea8._4_4_;
        local_3240 = (local_3280 + 0.0013981999) * (float)local_2ec0;
        fStack_323c = (fStack_327c + 0.0013981999) * local_2ec0._4_4_;
        fStack_3238 = (fStack_3278 + 0.0013981999) * (float)uStack_2eb8;
        fStack_3234 = (fStack_3274 + 0.0013981999) * uStack_2eb8._4_4_;
        fStack_3230 = (fStack_3270 + 0.0013981999) * (float)uStack_2eb0;
        fStack_322c = (fStack_326c + 0.0013981999) * uStack_2eb0._4_4_;
        fStack_3228 = (fStack_3268 + 0.0013981999) * (float)uStack_2ea8;
        local_3260 = 0x3c0889083c088908;
        uStack_3258 = 0x3c0889083c088908;
        uStack_3250 = 0x3c0889083c088908;
        uStack_3248 = 0x3c0889083c088908;
        local_3680 = CONCAT44(fStack_323c + 0.008333452,local_3240 + 0.008333452);
        uStack_3678 = CONCAT44(fStack_3234 + 0.008333452,fStack_3238 + 0.008333452);
        uStack_3670 = CONCAT44(fStack_322c + 0.008333452,fStack_3230 + 0.008333452);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + 0.008333452,fStack_3228 + 0.008333452);
        local_3420 = local_3680;
        uStack_3418 = uStack_3678;
        uStack_3410 = uStack_3670;
        uStack_3408 = uStack_3668;
        local_3440 = local_7fc0;
        uStack_3438 = uStack_7fb8;
        uStack_3430 = uStack_7fb0;
        uStack_3428 = uStack_7fa8;
        local_3460 = 0x3d2aa9c13d2aa9c1;
        uStack_3458 = 0x3d2aa9c13d2aa9c1;
        uStack_3450 = 0x3d2aa9c13d2aa9c1;
        uStack_3448 = 0x3d2aa9c13d2aa9c1;
        local_3000 = local_3680;
        uStack_2ff8 = uStack_3678;
        uStack_2ff0 = uStack_3670;
        uStack_2fe8 = uStack_3668;
        local_3020 = local_7fc0;
        uStack_3018 = uStack_7fb8;
        uStack_3010 = uStack_7fb0;
        uStack_3008 = uStack_7fa8;
        fStack_31e4 = uStack_2ea8._4_4_;
        local_3200 = (local_3240 + 0.008333452) * (float)local_2ec0;
        fStack_31fc = (fStack_323c + 0.008333452) * local_2ec0._4_4_;
        fStack_31f8 = (fStack_3238 + 0.008333452) * (float)uStack_2eb8;
        fStack_31f4 = (fStack_3234 + 0.008333452) * uStack_2eb8._4_4_;
        fStack_31f0 = (fStack_3230 + 0.008333452) * (float)uStack_2eb0;
        fStack_31ec = (fStack_322c + 0.008333452) * uStack_2eb0._4_4_;
        fStack_31e8 = (fStack_3228 + 0.008333452) * (float)uStack_2ea8;
        local_3220 = 0x3d2aa9c13d2aa9c1;
        uStack_3218 = 0x3d2aa9c13d2aa9c1;
        uStack_3210 = 0x3d2aa9c13d2aa9c1;
        uStack_3208 = 0x3d2aa9c13d2aa9c1;
        local_3680 = CONCAT44(fStack_31fc + 0.041665796,local_3200 + 0.041665796);
        uStack_3678 = CONCAT44(fStack_31f4 + 0.041665796,fStack_31f8 + 0.041665796);
        uStack_3670 = CONCAT44(fStack_31ec + 0.041665796,fStack_31f0 + 0.041665796);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + 0.041665796,fStack_31e8 + 0.041665796);
        local_3480 = local_3680;
        uStack_3478 = uStack_3678;
        uStack_3470 = uStack_3670;
        uStack_3468 = uStack_3668;
        local_34a0 = local_7fc0;
        uStack_3498 = uStack_7fb8;
        uStack_3490 = uStack_7fb0;
        uStack_3488 = uStack_7fa8;
        local_34c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_34b8 = 0x3e2aaaaa3e2aaaaa;
        uStack_34b0 = 0x3e2aaaaa3e2aaaaa;
        uStack_34a8 = 0x3e2aaaaa3e2aaaaa;
        local_2fc0 = local_3680;
        uStack_2fb8 = uStack_3678;
        uStack_2fb0 = uStack_3670;
        uStack_2fa8 = uStack_3668;
        local_2fe0 = local_7fc0;
        uStack_2fd8 = uStack_7fb8;
        uStack_2fd0 = uStack_7fb0;
        uStack_2fc8 = uStack_7fa8;
        fStack_31a4 = uStack_2ea8._4_4_;
        local_31c0 = (local_3200 + 0.041665796) * (float)local_2ec0;
        fStack_31bc = (fStack_31fc + 0.041665796) * local_2ec0._4_4_;
        fStack_31b8 = (fStack_31f8 + 0.041665796) * (float)uStack_2eb8;
        fStack_31b4 = (fStack_31f4 + 0.041665796) * uStack_2eb8._4_4_;
        fStack_31b0 = (fStack_31f0 + 0.041665796) * (float)uStack_2eb0;
        fStack_31ac = (fStack_31ec + 0.041665796) * uStack_2eb0._4_4_;
        fStack_31a8 = (fStack_31e8 + 0.041665796) * (float)uStack_2ea8;
        local_31e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_31d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_31d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_31c8 = 0x3e2aaaaa3e2aaaaa;
        local_3680 = CONCAT44(fStack_31bc + 0.16666666,local_31c0 + 0.16666666);
        uStack_3678 = CONCAT44(fStack_31b4 + 0.16666666,fStack_31b8 + 0.16666666);
        uStack_3670 = CONCAT44(fStack_31ac + 0.16666666,fStack_31b0 + 0.16666666);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + 0.16666666,fStack_31a8 + 0.16666666);
        local_34e0 = local_3680;
        uStack_34d8 = uStack_3678;
        uStack_34d0 = uStack_3670;
        uStack_34c8 = uStack_3668;
        local_3500 = local_7fc0;
        uStack_34f8 = uStack_7fb8;
        uStack_34f0 = uStack_7fb0;
        uStack_34e8 = uStack_7fa8;
        local_3520 = 0x3f0000003f000000;
        uStack_3518 = 0x3f0000003f000000;
        uStack_3510 = 0x3f0000003f000000;
        uStack_3508 = 0x3f0000003f000000;
        local_2f80 = local_3680;
        uStack_2f78 = uStack_3678;
        uStack_2f70 = uStack_3670;
        uStack_2f68 = uStack_3668;
        local_2fa0 = local_7fc0;
        uStack_2f98 = uStack_7fb8;
        uStack_2f90 = uStack_7fb0;
        uStack_2f88 = uStack_7fa8;
        fStack_3164 = uStack_2ea8._4_4_;
        local_3180 = (local_31c0 + 0.16666666) * (float)local_2ec0;
        fStack_317c = (fStack_31bc + 0.16666666) * local_2ec0._4_4_;
        fStack_3178 = (fStack_31b8 + 0.16666666) * (float)uStack_2eb8;
        fStack_3174 = (fStack_31b4 + 0.16666666) * uStack_2eb8._4_4_;
        fStack_3170 = (fStack_31b0 + 0.16666666) * (float)uStack_2eb0;
        fStack_316c = (fStack_31ac + 0.16666666) * uStack_2eb0._4_4_;
        fStack_3168 = (fStack_31a8 + 0.16666666) * (float)uStack_2ea8;
        local_31a0 = 0x3f0000003f000000;
        uStack_3198 = 0x3f0000003f000000;
        uStack_3190 = 0x3f0000003f000000;
        uStack_3188 = 0x3f0000003f000000;
        local_3680 = CONCAT44(fStack_317c + 0.5,local_3180 + 0.5);
        uStack_3678 = CONCAT44(fStack_3174 + 0.5,fStack_3178 + 0.5);
        uStack_3670 = CONCAT44(fStack_316c + 0.5,fStack_3170 + 0.5);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + 0.5,fStack_3168 + 0.5);
        local_3540 = local_3680;
        uStack_3538 = uStack_3678;
        uStack_3530 = uStack_3670;
        uStack_3528 = uStack_3668;
        local_3560 = local_35e0;
        uStack_3558 = uStack_35d8;
        uStack_35d0 = auVar146._16_8_;
        uStack_3550 = uStack_35d0;
        uStack_35c8 = auVar143._24_8_;
        uStack_3548 = uStack_35c8;
        local_3580 = local_7fc0;
        uStack_3578 = uStack_7fb8;
        uStack_3570 = uStack_7fb0;
        uStack_3568 = uStack_7fa8;
        local_2f40 = local_3680;
        uStack_2f38 = uStack_3678;
        uStack_2f30 = uStack_3670;
        uStack_2f28 = uStack_3668;
        local_2f60 = local_35e0;
        uStack_2f58 = uStack_35d8;
        uStack_2f50 = uStack_35d0;
        uStack_2f48 = uStack_35c8;
        fStack_3124 = uStack_2ea8._4_4_;
        local_3140 = (local_3180 + 0.5) * (float)local_2ec0 * (float)local_2ec0;
        fStack_313c = (fStack_317c + 0.5) * local_2ec0._4_4_ * local_2ec0._4_4_;
        fStack_3138 = (fStack_3178 + 0.5) * (float)uStack_2eb8 * (float)uStack_2eb8;
        fStack_3134 = (fStack_3174 + 0.5) * uStack_2eb8._4_4_ * uStack_2eb8._4_4_;
        fStack_3130 = (fStack_3170 + 0.5) * (float)uStack_2eb0 * (float)uStack_2eb0;
        fStack_312c = (fStack_316c + 0.5) * uStack_2eb0._4_4_ * uStack_2eb0._4_4_;
        fStack_3128 = (fStack_3168 + 0.5) * (float)uStack_2ea8 * (float)uStack_2ea8;
        local_3160 = local_7fc0;
        uStack_3158 = uStack_7fb8;
        uStack_3150 = uStack_7fb0;
        uStack_3148 = uStack_7fa8;
        local_3680 = CONCAT44(fStack_313c + local_2ec0._4_4_,local_3140 + (float)local_2ec0);
        uStack_3678 = CONCAT44(fStack_3134 + uStack_2eb8._4_4_,fStack_3138 + (float)uStack_2eb8);
        uStack_3670 = CONCAT44(fStack_312c + uStack_2eb0._4_4_,fStack_3130 + (float)uStack_2eb0);
        uStack_3668 = CONCAT44(uStack_2ea8._4_4_ + uStack_2ea8._4_4_,
                               fStack_3128 + (float)uStack_2ea8);
        local_3100 = local_3680;
        uStack_30f8 = uStack_3678;
        uStack_30f0 = uStack_3670;
        uStack_30e8 = uStack_3668;
        local_3120 = 0x3f8000003f800000;
        uStack_3118 = 0x3f8000003f800000;
        uStack_3110 = 0x3f8000003f800000;
        uStack_3108 = 0x3f8000003f800000;
        local_4760 = local_3140 + (float)local_2ec0 + 1.0;
        fStack_475c = fStack_313c + local_2ec0._4_4_ + 1.0;
        fStack_4758 = fStack_3138 + (float)uStack_2eb8 + 1.0;
        fStack_4754 = fStack_3134 + uStack_2eb8._4_4_ + 1.0;
        fStack_4750 = fStack_3130 + (float)uStack_2eb0 + 1.0;
        fStack_474c = fStack_312c + uStack_2eb0._4_4_ + 1.0;
        fStack_4748 = fStack_3128 + (float)uStack_2ea8 + 1.0;
        fStack_4744 = uStack_2ea8._4_4_ + uStack_2ea8._4_4_ + 1.0;
        local_3680 = CONCAT44(fStack_475c,local_4760);
        uStack_3678 = CONCAT44(fStack_4754,fStack_4758);
        uStack_3670 = CONCAT44(fStack_474c,fStack_4750);
        uStack_3668 = CONCAT44(fStack_4744,fStack_4748);
        local_ca0 = local_3600;
        uStack_c98 = uStack_35f8;
        uStack_c90 = uStack_35f0;
        uStack_c88 = uStack_35e8;
        local_3620 = CONCAT44((int)local_10c0._4_4_,(int)(float)local_10c0);
        uStack_3618 = CONCAT44((int)uStack_10b8._4_4_,(int)(float)uStack_10b8);
        uStack_3610 = CONCAT44((int)uStack_10b0._4_4_,(int)(float)uStack_10b0);
        uStack_3608 = CONCAT44((int)uStack_10a8._4_4_,(int)(float)uStack_10a8);
        local_960 = local_3620;
        uStack_958 = uStack_3618;
        uStack_950 = uStack_3610;
        uStack_948 = uStack_3608;
        local_980 = 0x7f0000007f;
        uStack_978 = 0x7f0000007f;
        uStack_970 = 0x7f0000007f;
        uStack_968 = 0x7f0000007f;
        local_a00 = local_3620;
        uStack_9f8 = uStack_3618;
        uStack_9f0 = uStack_3610;
        uStack_9e8 = uStack_3608;
        local_a20 = 0x7f0000007f;
        uStack_a18 = 0x7f0000007f;
        uStack_a10 = 0x7f0000007f;
        uStack_a08 = 0x7f0000007f;
        local_9b0 = 0x7f0000007f;
        uStack_9a8 = 0x7f0000007f;
        local_9c0 = 0x7f0000007f;
        uStack_9b8 = 0x7f0000007f;
        local_230 = local_3620;
        uStack_228 = uStack_3618;
        local_240 = 0x7f0000007f;
        uStack_238 = 0x7f0000007f;
        auVar130._8_8_ = uStack_3618;
        auVar130._0_8_ = local_3620;
        auVar129._8_8_ = 0x7f0000007f;
        auVar129._0_8_ = 0x7f0000007f;
        local_990 = vpaddd_avx(auVar130,auVar129);
        local_250 = uStack_3610;
        uStack_248 = uStack_3608;
        local_260 = 0x7f0000007f;
        uStack_258 = 0x7f0000007f;
        auVar128._8_8_ = uStack_3608;
        auVar128._0_8_ = uStack_3610;
        auVar7._8_8_ = 0x7f0000007f;
        auVar7._0_8_ = 0x7f0000007f;
        local_9a0 = vpaddd_avx(auVar128,auVar7);
        local_a40 = local_990._0_8_;
        uStack_a38 = local_990._8_8_;
        uStack_a30 = local_9a0._0_8_;
        uStack_a28 = local_9a0._8_8_;
        local_9e0 = local_990._0_8_;
        uStack_9d8 = local_990._8_8_;
        uStack_9d0 = local_9a0._0_8_;
        uStack_9c8 = local_9a0._8_8_;
        local_520 = local_990._0_8_;
        uStack_518 = local_990._8_8_;
        uStack_510 = local_9a0._0_8_;
        uStack_508 = local_9a0._8_8_;
        local_524 = 0x17;
        local_5a0 = local_990._0_8_;
        uStack_598 = local_990._8_8_;
        uStack_590 = local_9a0._0_8_;
        uStack_588 = local_9a0._8_8_;
        local_f0 = local_990._0_8_;
        uStack_e8 = local_990._8_8_;
        local_f4 = 0x17;
        local_540 = vpslld_avx(local_990,ZEXT416(0x17));
        local_110 = local_9a0._0_8_;
        uStack_108 = local_9a0._8_8_;
        local_114 = 0x17;
        local_550 = vpslld_avx(local_9a0,ZEXT416(0x17));
        local_5c0 = local_540._0_8_;
        uStack_5b8 = local_540._8_8_;
        uStack_5b0 = local_550._0_8_;
        uStack_5a8 = local_550._8_8_;
        local_580 = local_540._0_8_;
        uStack_578 = local_540._8_8_;
        uStack_570 = local_550._0_8_;
        uStack_568 = local_550._8_8_;
        local_3620 = local_540._0_8_;
        uStack_3618 = local_540._8_8_;
        uStack_3610 = local_550._0_8_;
        uStack_3608 = local_550._8_8_;
        local_340 = local_540._0_8_;
        uStack_338 = local_540._8_8_;
        uStack_330 = local_550._0_8_;
        uStack_328 = local_550._8_8_;
        local_36a0 = local_540._0_8_;
        uStack_3698 = local_540._8_8_;
        uStack_3690 = local_550._0_8_;
        uStack_3688 = local_550._8_8_;
        local_2f00 = local_3680;
        uStack_2ef8 = uStack_3678;
        uStack_2ef0 = uStack_3670;
        uStack_2ee8 = uStack_3668;
        local_2f20._0_4_ = local_540._0_4_;
        local_2f20._4_4_ = local_540._4_4_;
        uStack_2f18._0_4_ = local_540._8_4_;
        uStack_2f18._4_4_ = local_540._12_4_;
        uStack_2f10._0_4_ = local_550._0_4_;
        uStack_2f10._4_4_ = local_550._4_4_;
        uStack_2f08._0_4_ = local_550._8_4_;
        local_4760 = local_4760 * (float)local_2f20;
        fStack_475c = fStack_475c * local_2f20._4_4_;
        fStack_4758 = fStack_4758 * (float)uStack_2f18;
        fStack_4754 = fStack_4754 * uStack_2f18._4_4_;
        fStack_4750 = fStack_4750 * (float)uStack_2f10;
        fStack_474c = fStack_474c * uStack_2f10._4_4_;
        fStack_4748 = fStack_4748 * (float)uStack_2f08;
        local_3680 = CONCAT44(fStack_475c,local_4760);
        uStack_3678 = CONCAT44(fStack_4754,fStack_4758);
        uStack_3670 = CONCAT44(fStack_474c,fStack_4750);
        uStack_3668 = CONCAT44(fStack_4744,fStack_4748);
        local_4740 = local_1b20._0_8_;
        uStack_4738 = local_1b20._8_8_;
        uStack_4730 = local_1b20._16_8_;
        uStack_4728 = local_1b20._24_8_;
        local_59a0 = local_3680;
        uStack_5998 = uStack_3678;
        uStack_5990 = uStack_3670;
        uStack_5988 = uStack_3668;
        local_5980._0_4_ = auVar6._0_4_;
        local_5980._4_4_ = auVar6._4_4_;
        uStack_5978._0_4_ = auVar6._8_4_;
        uStack_5978._4_4_ = auVar6._12_4_;
        uStack_5970._0_4_ = auVar5._0_4_;
        uStack_5970._4_4_ = auVar5._4_4_;
        uStack_5968._0_4_ = auVar5._8_4_;
        uStack_5968._4_4_ = auVar5._12_4_;
        local_4760 = (float)local_5980 + local_4760;
        fStack_475c = local_5980._4_4_ + fStack_475c;
        fStack_4758 = (float)uStack_5978 + fStack_4758;
        fStack_4754 = uStack_5978._4_4_ + fStack_4754;
        fStack_4750 = (float)uStack_5970 + fStack_4750;
        fStack_474c = uStack_5970._4_4_ + fStack_474c;
        fStack_4748 = (float)uStack_5968 + fStack_4748;
        fStack_4744 = uStack_5968._4_4_ + fStack_4744;
        auVar84._16_8_ = local_1b20._16_8_;
        auVar84._0_16_ = auVar6;
        auVar84._24_8_ = local_1b20._24_8_;
        auVar83._4_4_ = fStack_475c;
        auVar83._0_4_ = local_4760;
        auVar83._8_4_ = fStack_4758;
        auVar83._12_4_ = fStack_4754;
        auVar83._16_4_ = fStack_4750;
        auVar83._20_4_ = fStack_474c;
        auVar83._24_4_ = fStack_4748;
        auVar83._28_4_ = fStack_4744;
        auVar8 = vdivps_avx(auVar84,auVar83);
        local_8040 = auVar8._0_8_;
        uStack_8038 = auVar8._8_8_;
        uStack_8030 = auVar8._16_8_;
        uStack_8028 = auVar8._24_8_;
        local_69b0 = local_73c0;
        local_5c40 = *(undefined8 *)*local_73c0;
        uStack_5c38 = *(undefined8 *)(*local_73c0 + 8);
        uStack_5c30 = *(undefined8 *)(*local_73c0 + 0x10);
        uStack_5c28 = *(undefined8 *)(*local_73c0 + 0x18);
        local_47e8 = 0x3f800000;
        local_1b40 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar152._16_16_ = auVar5;
        auVar152._0_16_ = auVar6;
        local_1b60._0_8_ = auVar6._0_8_;
        local_1b60._8_8_ = auVar6._8_8_;
        local_1b60._16_8_ = auVar5._0_8_;
        local_1b60._24_8_ = auVar5._8_8_;
        local_5c60 = local_1b60._0_8_;
        uStack_5c58 = local_1b60._8_8_;
        uStack_5c50 = local_1b60._16_8_;
        uStack_5c48 = local_1b60._24_8_;
        local_2da0 = ZEXT832(0) << 0x20;
        local_1c00 = 0;
        local_5c20._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1bf8 = local_5c20._8_8_;
        uStack_1bf0 = 0;
        uStack_1be8 = 0;
        auVar13 = vsubps_avx(ZEXT832((ulong)local_5c20._8_8_) << 0x40,*local_73c0);
        local_2e40 = 0x3f8000003f800000;
        uStack_2e38 = 0x3f8000003f800000;
        uStack_2e30 = 0x3f8000003f800000;
        uStack_2e28 = 0x3f8000003f800000;
        local_2dc0._0_8_ = auVar13._0_8_;
        local_1900 = local_2dc0._0_8_;
        local_2dc0._8_8_ = auVar13._8_8_;
        uStack_18f8 = local_2dc0._8_8_;
        local_2dc0._16_8_ = auVar13._16_8_;
        uStack_18f0 = local_2dc0._16_8_;
        local_2dc0._24_8_ = auVar13._24_8_;
        uStack_18e8 = local_2dc0._24_8_;
        local_1920 = 0x42b0c0a542b0c0a5;
        uStack_1918 = 0x42b0c0a542b0c0a5;
        uStack_1910 = 0x42b0c0a542b0c0a5;
        uStack_1908 = 0x42b0c0a542b0c0a5;
        auVar96._8_8_ = 0x42b0c0a542b0c0a5;
        auVar96._0_8_ = 0x42b0c0a542b0c0a5;
        auVar96._16_8_ = 0x42b0c0a542b0c0a5;
        auVar96._24_8_ = 0x42b0c0a542b0c0a5;
        auVar13 = vminps_avx(auVar13,auVar96);
        local_2dc0._0_8_ = auVar13._0_8_;
        local_17c0 = local_2dc0._0_8_;
        local_2dc0._8_8_ = auVar13._8_8_;
        uStack_17b8 = local_2dc0._8_8_;
        local_2dc0._16_8_ = auVar13._16_8_;
        uStack_17b0 = local_2dc0._16_8_;
        local_2dc0._24_8_ = auVar13._24_8_;
        uStack_17a8 = local_2dc0._24_8_;
        local_17e0 = 0xc2b0c0a5c2b0c0a5;
        uStack_17d8 = 0xc2b0c0a5c2b0c0a5;
        uStack_17d0 = 0xc2b0c0a5c2b0c0a5;
        uStack_17c8 = 0xc2b0c0a5c2b0c0a5;
        auVar101._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar101._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar101._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar10 = vmaxps_avx(auVar13,auVar101);
        local_2dc0._0_8_ = auVar10._0_8_;
        local_2b00 = local_2dc0._0_8_;
        local_2dc0._8_8_ = auVar10._8_8_;
        uStack_2af8 = local_2dc0._8_8_;
        local_2dc0._16_8_ = auVar10._16_8_;
        uStack_2af0 = local_2dc0._16_8_;
        local_2dc0._24_8_ = auVar10._24_8_;
        uStack_2ae8 = local_2dc0._24_8_;
        local_2b20 = 0x3fb8aa3b3fb8aa3b;
        uStack_2b18 = 0x3fb8aa3b3fb8aa3b;
        uStack_2b10 = 0x3fb8aa3b3fb8aa3b;
        uStack_2b08 = 0x3fb8aa3b3fb8aa3b;
        local_2b40 = 0x3f0000003f000000;
        uStack_2b38 = 0x3f0000003f000000;
        uStack_2b30 = 0x3f0000003f000000;
        uStack_2b28 = 0x3f0000003f000000;
        uVar18 = local_2dc0._0_8_;
        uVar19 = local_2dc0._8_8_;
        uVar20 = local_2dc0._16_8_;
        uVar21 = local_2dc0._24_8_;
        local_28e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_28d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_28d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_28c8 = 0x3fb8aa3b3fb8aa3b;
        local_28c0._0_4_ = auVar10._0_4_;
        local_28c0._4_4_ = auVar10._4_4_;
        uStack_28b8._0_4_ = auVar10._8_4_;
        uStack_28b8._4_4_ = auVar10._12_4_;
        uStack_28b0._0_4_ = auVar10._16_4_;
        uStack_28b0._4_4_ = auVar10._20_4_;
        uStack_28a8._0_4_ = auVar10._24_4_;
        uStack_2aa4 = 0x3fb8aa3b;
        local_2ac0 = (float)local_28c0 * 1.442695;
        fStack_2abc = local_28c0._4_4_ * 1.442695;
        fStack_2ab8 = (float)uStack_28b8 * 1.442695;
        fStack_2ab4 = uStack_28b8._4_4_ * 1.442695;
        fStack_2ab0 = (float)uStack_28b0 * 1.442695;
        fStack_2aac = uStack_28b0._4_4_ * 1.442695;
        fStack_2aa8 = (float)uStack_28a8 * 1.442695;
        local_2ae0 = 0x3f0000003f000000;
        uStack_2ad8 = 0x3f0000003f000000;
        uStack_2ad0 = 0x3f0000003f000000;
        uStack_2ac8 = 0x3f0000003f000000;
        local_2e00._4_4_ = fStack_2abc + 0.5;
        local_2e00._0_4_ = local_2ac0 + 0.5;
        uStack_2df8._0_4_ = fStack_2ab8 + 0.5;
        uStack_2df8._4_4_ = fStack_2ab4 + 0.5;
        uStack_2df0._0_4_ = fStack_2ab0 + 0.5;
        uStack_2df0._4_4_ = fStack_2aac + 0.5;
        uStack_2de8._0_4_ = fStack_2aa8 + 0.5;
        uStack_2de8._4_4_ = 0x3ff8aa3b;
        auVar11 = vroundps_avx(_local_2e00,1);
        auVar13 = vcmpps_avx(_local_2e00,auVar11,1);
        local_2e60._0_8_ = auVar13._0_8_;
        local_1680 = local_2e60._0_8_;
        local_2e60._8_8_ = auVar13._8_8_;
        uStack_1678 = local_2e60._8_8_;
        local_2e60._16_8_ = auVar13._16_8_;
        uStack_1670 = local_2e60._16_8_;
        local_2e60._24_8_ = auVar13._24_8_;
        uStack_1668 = local_2e60._24_8_;
        local_16a0 = 0x3f8000003f800000;
        uStack_1698 = 0x3f8000003f800000;
        uStack_1690 = 0x3f8000003f800000;
        uStack_1688 = 0x3f8000003f800000;
        auVar106._8_8_ = 0x3f8000003f800000;
        auVar106._0_8_ = 0x3f8000003f800000;
        auVar106._16_8_ = 0x3f8000003f800000;
        auVar106._24_8_ = 0x3f8000003f800000;
        local_2e60 = vandps_avx(auVar13,auVar106);
        local_2de0 = auVar11._0_8_;
        local_1e40 = local_2de0;
        uStack_2dd8 = auVar11._8_8_;
        uStack_1e38 = uStack_2dd8;
        uStack_2dd0 = auVar11._16_8_;
        uStack_1e30 = uStack_2dd0;
        uStack_2dc8 = auVar11._24_8_;
        uStack_1e28 = uStack_2dc8;
        local_1e60 = local_2e60._0_8_;
        uStack_1e58 = local_2e60._8_8_;
        uStack_1e50 = local_2e60._16_8_;
        uStack_1e48 = local_2e60._24_8_;
        _local_2e00 = vsubps_avx(auVar11,local_2e60);
        local_12c0 = local_2e00;
        uStack_12b8 = uStack_2df8;
        uStack_12b0 = uStack_2df0;
        uStack_12a8 = uStack_2de8;
        local_1300 = local_2dc0._0_8_;
        uStack_12f8 = local_2dc0._8_8_;
        uStack_12f0 = local_2dc0._16_8_;
        uStack_12e8 = local_2dc0._24_8_;
        local_12e0 = 0x3f3180003f318000;
        uStack_12d8 = 0x3f3180003f318000;
        uStack_12d0 = 0x3f3180003f318000;
        uStack_12c8 = 0x3f3180003f318000;
        local_1240 = local_2dc0._0_8_;
        uStack_1238 = local_2dc0._8_8_;
        uStack_1230 = local_2dc0._16_8_;
        uStack_1228 = local_2dc0._24_8_;
        local_12a0 = 0x3f3180003f318000;
        uStack_1298 = 0x3f3180003f318000;
        uStack_1290 = 0x3f3180003f318000;
        uStack_1288 = 0x3f3180003f318000;
        local_1280._0_4_ = local_2e00._0_4_;
        local_1280._4_4_ = local_2e00._4_4_;
        uStack_1278._0_4_ = local_2e00._8_4_;
        uStack_1278._4_4_ = local_2e00._12_4_;
        uStack_1270._0_4_ = local_2e00._16_4_;
        uStack_1270._4_4_ = local_2e00._20_4_;
        uStack_1268._0_4_ = local_2e00._24_4_;
        uStack_1268._4_4_ = local_2e00._28_4_;
        fStack_1244 = uStack_1268._4_4_;
        local_1260 = (float)local_1280 * 0.6933594;
        fStack_125c = local_1280._4_4_ * 0.6933594;
        fStack_1258 = (float)uStack_1278 * 0.6933594;
        fStack_1254 = uStack_1278._4_4_ * 0.6933594;
        fStack_1250 = (float)uStack_1270 * 0.6933594;
        fStack_124c = uStack_1270._4_4_ * 0.6933594;
        fStack_1248 = (float)uStack_1268 * 0.6933594;
        auVar113._4_4_ = fStack_125c;
        auVar113._0_4_ = local_1260;
        auVar113._8_4_ = fStack_1258;
        auVar113._12_4_ = fStack_1254;
        auVar113._16_4_ = fStack_1250;
        auVar113._20_4_ = fStack_124c;
        auVar113._24_4_ = fStack_1248;
        auVar113._28_4_ = uStack_1268._4_4_;
        auVar13 = vsubps_avx(auVar10,auVar113);
        local_80c0 = auVar13._0_8_;
        uStack_80b8 = auVar13._8_8_;
        uStack_80b0 = auVar13._16_8_;
        uStack_80a8 = auVar13._24_8_;
        local_13a0 = local_2e00;
        uStack_1398 = uStack_2df8;
        uStack_1390 = uStack_2df0;
        uStack_1388 = uStack_2de8;
        local_13e0 = local_80c0;
        uStack_13d8 = uStack_80b8;
        uStack_13d0 = uStack_80b0;
        uStack_13c8 = uStack_80a8;
        local_13c0 = 0xb95e8083b95e8083;
        uStack_13b8 = 0xb95e8083b95e8083;
        uStack_13b0 = 0xb95e8083b95e8083;
        uStack_13a8 = 0xb95e8083b95e8083;
        local_1320 = local_80c0;
        uStack_1318 = uStack_80b8;
        uStack_1310 = uStack_80b0;
        uStack_1308 = uStack_80a8;
        local_1360 = local_2e00;
        uStack_1358 = uStack_2df8;
        uStack_1350 = uStack_2df0;
        uStack_1348 = uStack_2de8;
        local_1380 = 0xb95e8083b95e8083;
        uStack_1378 = 0xb95e8083b95e8083;
        uStack_1370 = 0xb95e8083b95e8083;
        uStack_1368 = 0xb95e8083b95e8083;
        fStack_1324 = uStack_1268._4_4_;
        local_1340 = (float)local_1280 * -0.00021219444;
        fStack_133c = local_1280._4_4_ * -0.00021219444;
        fStack_1338 = (float)uStack_1278 * -0.00021219444;
        fStack_1334 = uStack_1278._4_4_ * -0.00021219444;
        fStack_1330 = (float)uStack_1270 * -0.00021219444;
        fStack_132c = uStack_1270._4_4_ * -0.00021219444;
        fStack_1328 = (float)uStack_1268 * -0.00021219444;
        auVar112._4_4_ = fStack_133c;
        auVar112._0_4_ = local_1340;
        auVar112._8_4_ = fStack_1338;
        auVar112._12_4_ = fStack_1334;
        auVar112._16_4_ = fStack_1330;
        auVar112._20_4_ = fStack_132c;
        auVar112._24_4_ = fStack_1328;
        auVar112._28_4_ = uStack_1268._4_4_;
        local_2dc0 = vsubps_avx(auVar13,auVar112);
        local_8120 = local_2dc0._0_8_;
        uStack_8118 = local_2dc0._8_8_;
        uStack_8110 = local_2dc0._16_8_;
        uStack_8108 = local_2dc0._24_8_;
        local_26e0 = local_8120;
        uStack_26d8 = uStack_8118;
        uStack_26d0 = uStack_8110;
        uStack_26c8 = uStack_8108;
        local_26c0._0_4_ = local_2dc0._0_4_;
        local_26c0._4_4_ = local_2dc0._4_4_;
        uStack_26b8._0_4_ = local_2dc0._8_4_;
        uStack_26b8._4_4_ = local_2dc0._12_4_;
        uStack_26b0._0_4_ = local_2dc0._16_4_;
        uStack_26b0._4_4_ = local_2dc0._20_4_;
        uStack_26a8._0_4_ = local_2dc0._24_4_;
        uStack_26a8._4_4_ = local_2dc0._28_4_;
        local_2de0 = CONCAT44(local_26c0._4_4_ * local_26c0._4_4_,
                              (float)local_26c0 * (float)local_26c0);
        uStack_2dd8._0_4_ = (float)uStack_26b8 * (float)uStack_26b8;
        uStack_2dd8._4_4_ = uStack_26b8._4_4_ * uStack_26b8._4_4_;
        uStack_2dd0._0_4_ = (float)uStack_26b0 * (float)uStack_26b0;
        uStack_2dd0._4_4_ = uStack_26b0._4_4_ * uStack_26b0._4_4_;
        auVar146 = _local_2de0;
        uStack_2dc8._0_4_ = (float)uStack_26a8 * (float)uStack_26a8;
        uStack_2dc8._4_4_ = uStack_26a8._4_4_;
        auVar144 = _local_2de0;
        local_2b60 = 0x3950696739506967;
        uStack_2b58 = 0x3950696739506967;
        uStack_2b50 = 0x3950696739506967;
        uStack_2b48 = 0x3950696739506967;
        local_2b80 = local_8120;
        uStack_2b78 = uStack_8118;
        uStack_2b70 = uStack_8110;
        uStack_2b68 = uStack_8108;
        local_2ba0 = 0x3ab743ce3ab743ce;
        uStack_2b98 = 0x3ab743ce3ab743ce;
        uStack_2b90 = 0x3ab743ce3ab743ce;
        uStack_2b88 = 0x3ab743ce3ab743ce;
        local_2880 = 0x3950696739506967;
        uStack_2878 = 0x3950696739506967;
        uStack_2870 = 0x3950696739506967;
        uStack_2868 = 0x3950696739506967;
        local_28a0 = local_8120;
        uStack_2898 = uStack_8118;
        uStack_2890 = uStack_8110;
        uStack_2888 = uStack_8108;
        fStack_2a64 = uStack_26a8._4_4_;
        local_2a80 = (float)local_26c0 * 0.00019875691;
        fStack_2a7c = local_26c0._4_4_ * 0.00019875691;
        fStack_2a78 = (float)uStack_26b8 * 0.00019875691;
        fStack_2a74 = uStack_26b8._4_4_ * 0.00019875691;
        fStack_2a70 = (float)uStack_26b0 * 0.00019875691;
        fStack_2a6c = uStack_26b0._4_4_ * 0.00019875691;
        fStack_2a68 = (float)uStack_26a8 * 0.00019875691;
        local_2aa0 = 0x3ab743ce3ab743ce;
        uStack_2a98 = 0x3ab743ce3ab743ce;
        uStack_2a90 = 0x3ab743ce3ab743ce;
        uStack_2a88 = 0x3ab743ce3ab743ce;
        local_2e80 = CONCAT44(fStack_2a7c + 0.0013981999,local_2a80 + 0.0013981999);
        uStack_2e78 = CONCAT44(fStack_2a74 + 0.0013981999,fStack_2a78 + 0.0013981999);
        uStack_2e70 = CONCAT44(fStack_2a6c + 0.0013981999,fStack_2a70 + 0.0013981999);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + 0.0013981999,fStack_2a68 + 0.0013981999);
        local_2bc0 = local_2e80;
        uStack_2bb8 = uStack_2e78;
        uStack_2bb0 = uStack_2e70;
        uStack_2ba8 = uStack_2e68;
        local_2be0 = local_8120;
        uStack_2bd8 = uStack_8118;
        uStack_2bd0 = uStack_8110;
        uStack_2bc8 = uStack_8108;
        local_2c00 = 0x3c0889083c088908;
        uStack_2bf8 = 0x3c0889083c088908;
        uStack_2bf0 = 0x3c0889083c088908;
        uStack_2be8 = 0x3c0889083c088908;
        local_2840 = local_2e80;
        uStack_2838 = uStack_2e78;
        uStack_2830 = uStack_2e70;
        uStack_2828 = uStack_2e68;
        local_2860 = local_8120;
        uStack_2858 = uStack_8118;
        uStack_2850 = uStack_8110;
        uStack_2848 = uStack_8108;
        fStack_2a24 = uStack_26a8._4_4_;
        local_2a40 = (local_2a80 + 0.0013981999) * (float)local_26c0;
        fStack_2a3c = (fStack_2a7c + 0.0013981999) * local_26c0._4_4_;
        fStack_2a38 = (fStack_2a78 + 0.0013981999) * (float)uStack_26b8;
        fStack_2a34 = (fStack_2a74 + 0.0013981999) * uStack_26b8._4_4_;
        fStack_2a30 = (fStack_2a70 + 0.0013981999) * (float)uStack_26b0;
        fStack_2a2c = (fStack_2a6c + 0.0013981999) * uStack_26b0._4_4_;
        fStack_2a28 = (fStack_2a68 + 0.0013981999) * (float)uStack_26a8;
        local_2a60 = 0x3c0889083c088908;
        uStack_2a58 = 0x3c0889083c088908;
        uStack_2a50 = 0x3c0889083c088908;
        uStack_2a48 = 0x3c0889083c088908;
        local_2e80 = CONCAT44(fStack_2a3c + 0.008333452,local_2a40 + 0.008333452);
        uStack_2e78 = CONCAT44(fStack_2a34 + 0.008333452,fStack_2a38 + 0.008333452);
        uStack_2e70 = CONCAT44(fStack_2a2c + 0.008333452,fStack_2a30 + 0.008333452);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + 0.008333452,fStack_2a28 + 0.008333452);
        local_2c20 = local_2e80;
        uStack_2c18 = uStack_2e78;
        uStack_2c10 = uStack_2e70;
        uStack_2c08 = uStack_2e68;
        local_2c40 = local_8120;
        uStack_2c38 = uStack_8118;
        uStack_2c30 = uStack_8110;
        uStack_2c28 = uStack_8108;
        local_2c60 = 0x3d2aa9c13d2aa9c1;
        uStack_2c58 = 0x3d2aa9c13d2aa9c1;
        uStack_2c50 = 0x3d2aa9c13d2aa9c1;
        uStack_2c48 = 0x3d2aa9c13d2aa9c1;
        local_2800 = local_2e80;
        uStack_27f8 = uStack_2e78;
        uStack_27f0 = uStack_2e70;
        uStack_27e8 = uStack_2e68;
        local_2820 = local_8120;
        uStack_2818 = uStack_8118;
        uStack_2810 = uStack_8110;
        uStack_2808 = uStack_8108;
        fStack_29e4 = uStack_26a8._4_4_;
        local_2a00 = (local_2a40 + 0.008333452) * (float)local_26c0;
        fStack_29fc = (fStack_2a3c + 0.008333452) * local_26c0._4_4_;
        fStack_29f8 = (fStack_2a38 + 0.008333452) * (float)uStack_26b8;
        fStack_29f4 = (fStack_2a34 + 0.008333452) * uStack_26b8._4_4_;
        fStack_29f0 = (fStack_2a30 + 0.008333452) * (float)uStack_26b0;
        fStack_29ec = (fStack_2a2c + 0.008333452) * uStack_26b0._4_4_;
        fStack_29e8 = (fStack_2a28 + 0.008333452) * (float)uStack_26a8;
        local_2a20 = 0x3d2aa9c13d2aa9c1;
        uStack_2a18 = 0x3d2aa9c13d2aa9c1;
        uStack_2a10 = 0x3d2aa9c13d2aa9c1;
        uStack_2a08 = 0x3d2aa9c13d2aa9c1;
        local_2e80 = CONCAT44(fStack_29fc + 0.041665796,local_2a00 + 0.041665796);
        uStack_2e78 = CONCAT44(fStack_29f4 + 0.041665796,fStack_29f8 + 0.041665796);
        uStack_2e70 = CONCAT44(fStack_29ec + 0.041665796,fStack_29f0 + 0.041665796);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + 0.041665796,fStack_29e8 + 0.041665796);
        local_2c80 = local_2e80;
        uStack_2c78 = uStack_2e78;
        uStack_2c70 = uStack_2e70;
        uStack_2c68 = uStack_2e68;
        local_2ca0 = local_8120;
        uStack_2c98 = uStack_8118;
        uStack_2c90 = uStack_8110;
        uStack_2c88 = uStack_8108;
        local_2cc0 = 0x3e2aaaaa3e2aaaaa;
        uStack_2cb8 = 0x3e2aaaaa3e2aaaaa;
        uStack_2cb0 = 0x3e2aaaaa3e2aaaaa;
        uStack_2ca8 = 0x3e2aaaaa3e2aaaaa;
        local_27c0 = local_2e80;
        uStack_27b8 = uStack_2e78;
        uStack_27b0 = uStack_2e70;
        uStack_27a8 = uStack_2e68;
        local_27e0 = local_8120;
        uStack_27d8 = uStack_8118;
        uStack_27d0 = uStack_8110;
        uStack_27c8 = uStack_8108;
        fStack_29a4 = uStack_26a8._4_4_;
        local_29c0 = (local_2a00 + 0.041665796) * (float)local_26c0;
        fStack_29bc = (fStack_29fc + 0.041665796) * local_26c0._4_4_;
        fStack_29b8 = (fStack_29f8 + 0.041665796) * (float)uStack_26b8;
        fStack_29b4 = (fStack_29f4 + 0.041665796) * uStack_26b8._4_4_;
        fStack_29b0 = (fStack_29f0 + 0.041665796) * (float)uStack_26b0;
        fStack_29ac = (fStack_29ec + 0.041665796) * uStack_26b0._4_4_;
        fStack_29a8 = (fStack_29e8 + 0.041665796) * (float)uStack_26a8;
        local_29e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_29d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_29d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_29c8 = 0x3e2aaaaa3e2aaaaa;
        local_2e80 = CONCAT44(fStack_29bc + 0.16666666,local_29c0 + 0.16666666);
        uStack_2e78 = CONCAT44(fStack_29b4 + 0.16666666,fStack_29b8 + 0.16666666);
        uStack_2e70 = CONCAT44(fStack_29ac + 0.16666666,fStack_29b0 + 0.16666666);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + 0.16666666,fStack_29a8 + 0.16666666);
        local_2ce0 = local_2e80;
        uStack_2cd8 = uStack_2e78;
        uStack_2cd0 = uStack_2e70;
        uStack_2cc8 = uStack_2e68;
        local_2d00 = local_8120;
        uStack_2cf8 = uStack_8118;
        uStack_2cf0 = uStack_8110;
        uStack_2ce8 = uStack_8108;
        local_2d20 = 0x3f0000003f000000;
        uStack_2d18 = 0x3f0000003f000000;
        uStack_2d10 = 0x3f0000003f000000;
        uStack_2d08 = 0x3f0000003f000000;
        local_2780 = local_2e80;
        uStack_2778 = uStack_2e78;
        uStack_2770 = uStack_2e70;
        uStack_2768 = uStack_2e68;
        local_27a0 = local_8120;
        uStack_2798 = uStack_8118;
        uStack_2790 = uStack_8110;
        uStack_2788 = uStack_8108;
        fStack_2964 = uStack_26a8._4_4_;
        local_2980 = (local_29c0 + 0.16666666) * (float)local_26c0;
        fStack_297c = (fStack_29bc + 0.16666666) * local_26c0._4_4_;
        fStack_2978 = (fStack_29b8 + 0.16666666) * (float)uStack_26b8;
        fStack_2974 = (fStack_29b4 + 0.16666666) * uStack_26b8._4_4_;
        fStack_2970 = (fStack_29b0 + 0.16666666) * (float)uStack_26b0;
        fStack_296c = (fStack_29ac + 0.16666666) * uStack_26b0._4_4_;
        fStack_2968 = (fStack_29a8 + 0.16666666) * (float)uStack_26a8;
        local_29a0 = 0x3f0000003f000000;
        uStack_2998 = 0x3f0000003f000000;
        uStack_2990 = 0x3f0000003f000000;
        uStack_2988 = 0x3f0000003f000000;
        local_2e80 = CONCAT44(fStack_297c + 0.5,local_2980 + 0.5);
        uStack_2e78 = CONCAT44(fStack_2974 + 0.5,fStack_2978 + 0.5);
        uStack_2e70 = CONCAT44(fStack_296c + 0.5,fStack_2970 + 0.5);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + 0.5,fStack_2968 + 0.5);
        local_2d40 = local_2e80;
        uStack_2d38 = uStack_2e78;
        uStack_2d30 = uStack_2e70;
        uStack_2d28 = uStack_2e68;
        local_2d60 = local_2de0;
        uStack_2d58 = uStack_2dd8;
        uStack_2dd0 = auVar146._16_8_;
        uStack_2d50 = uStack_2dd0;
        uStack_2dc8 = auVar144._24_8_;
        uStack_2d48 = uStack_2dc8;
        local_2d80 = local_8120;
        uStack_2d78 = uStack_8118;
        uStack_2d70 = uStack_8110;
        uStack_2d68 = uStack_8108;
        local_2740 = local_2e80;
        uStack_2738 = uStack_2e78;
        uStack_2730 = uStack_2e70;
        uStack_2728 = uStack_2e68;
        local_2760 = local_2de0;
        uStack_2758 = uStack_2dd8;
        uStack_2750 = uStack_2dd0;
        uStack_2748 = uStack_2dc8;
        fStack_2924 = uStack_26a8._4_4_;
        local_2940 = (local_2980 + 0.5) * (float)local_26c0 * (float)local_26c0;
        fStack_293c = (fStack_297c + 0.5) * local_26c0._4_4_ * local_26c0._4_4_;
        fStack_2938 = (fStack_2978 + 0.5) * (float)uStack_26b8 * (float)uStack_26b8;
        fStack_2934 = (fStack_2974 + 0.5) * uStack_26b8._4_4_ * uStack_26b8._4_4_;
        fStack_2930 = (fStack_2970 + 0.5) * (float)uStack_26b0 * (float)uStack_26b0;
        fStack_292c = (fStack_296c + 0.5) * uStack_26b0._4_4_ * uStack_26b0._4_4_;
        fStack_2928 = (fStack_2968 + 0.5) * (float)uStack_26a8 * (float)uStack_26a8;
        local_2960 = local_8120;
        uStack_2958 = uStack_8118;
        uStack_2950 = uStack_8110;
        uStack_2948 = uStack_8108;
        local_2e80 = CONCAT44(fStack_293c + local_26c0._4_4_,local_2940 + (float)local_26c0);
        uStack_2e78 = CONCAT44(fStack_2934 + uStack_26b8._4_4_,fStack_2938 + (float)uStack_26b8);
        uStack_2e70 = CONCAT44(fStack_292c + uStack_26b0._4_4_,fStack_2930 + (float)uStack_26b0);
        uStack_2e68 = CONCAT44(uStack_26a8._4_4_ + uStack_26a8._4_4_,
                               fStack_2928 + (float)uStack_26a8);
        local_2900 = local_2e80;
        uStack_28f8 = uStack_2e78;
        uStack_28f0 = uStack_2e70;
        uStack_28e8 = uStack_2e68;
        local_2920 = 0x3f8000003f800000;
        uStack_2918 = 0x3f8000003f800000;
        uStack_2910 = 0x3f8000003f800000;
        uStack_2908 = 0x3f8000003f800000;
        local_4720 = local_2940 + (float)local_26c0 + 1.0;
        fStack_471c = fStack_293c + local_26c0._4_4_ + 1.0;
        fStack_4718 = fStack_2938 + (float)uStack_26b8 + 1.0;
        fStack_4714 = fStack_2934 + uStack_26b8._4_4_ + 1.0;
        fStack_4710 = fStack_2930 + (float)uStack_26b0 + 1.0;
        fStack_470c = fStack_292c + uStack_26b0._4_4_ + 1.0;
        fStack_4708 = fStack_2928 + (float)uStack_26a8 + 1.0;
        fStack_4704 = uStack_26a8._4_4_ + uStack_26a8._4_4_ + 1.0;
        local_2e80 = CONCAT44(fStack_471c,local_4720);
        uStack_2e78 = CONCAT44(fStack_4714,fStack_4718);
        uStack_2e70 = CONCAT44(fStack_470c,fStack_4710);
        uStack_2e68 = CONCAT44(fStack_4704,fStack_4708);
        local_cc0 = local_2e00;
        uStack_cb8 = uStack_2df8;
        uStack_cb0 = uStack_2df0;
        uStack_ca8 = uStack_2de8;
        local_2e20 = CONCAT44((int)local_1280._4_4_,(int)(float)local_1280);
        uStack_2e18 = CONCAT44((int)uStack_1278._4_4_,(int)(float)uStack_1278);
        uStack_2e10 = CONCAT44((int)uStack_1270._4_4_,(int)(float)uStack_1270);
        uStack_2e08 = CONCAT44((int)uStack_1268._4_4_,(int)(float)uStack_1268);
        local_a60 = local_2e20;
        uStack_a58 = uStack_2e18;
        uStack_a50 = uStack_2e10;
        uStack_a48 = uStack_2e08;
        local_a80 = 0x7f0000007f;
        uStack_a78 = 0x7f0000007f;
        uStack_a70 = 0x7f0000007f;
        uStack_a68 = 0x7f0000007f;
        local_b00 = local_2e20;
        uStack_af8 = uStack_2e18;
        uStack_af0 = uStack_2e10;
        uStack_ae8 = uStack_2e08;
        local_b20 = 0x7f0000007f;
        uStack_b18 = 0x7f0000007f;
        uStack_b10 = 0x7f0000007f;
        uStack_b08 = 0x7f0000007f;
        local_ab0 = 0x7f0000007f;
        uStack_aa8 = 0x7f0000007f;
        local_ac0 = 0x7f0000007f;
        uStack_ab8 = 0x7f0000007f;
        local_1f0 = local_2e20;
        uStack_1e8 = uStack_2e18;
        local_200 = 0x7f0000007f;
        uStack_1f8 = 0x7f0000007f;
        auVar134._8_8_ = uStack_2e18;
        auVar134._0_8_ = local_2e20;
        auVar133._8_8_ = 0x7f0000007f;
        auVar133._0_8_ = 0x7f0000007f;
        local_a90 = vpaddd_avx(auVar134,auVar133);
        local_210 = uStack_2e10;
        uStack_208 = uStack_2e08;
        local_220 = 0x7f0000007f;
        uStack_218 = 0x7f0000007f;
        auVar132._8_8_ = uStack_2e08;
        auVar132._0_8_ = uStack_2e10;
        auVar131._8_8_ = 0x7f0000007f;
        auVar131._0_8_ = 0x7f0000007f;
        local_aa0 = vpaddd_avx(auVar132,auVar131);
        local_b40 = local_a90._0_8_;
        uStack_b38 = local_a90._8_8_;
        uStack_b30 = local_aa0._0_8_;
        uStack_b28 = local_aa0._8_8_;
        local_ae0 = local_a90._0_8_;
        uStack_ad8 = local_a90._8_8_;
        uStack_ad0 = local_aa0._0_8_;
        uStack_ac8 = local_aa0._8_8_;
        local_5e0 = local_a90._0_8_;
        uStack_5d8 = local_a90._8_8_;
        uStack_5d0 = local_aa0._0_8_;
        uStack_5c8 = local_aa0._8_8_;
        local_5e4 = 0x17;
        local_660 = local_a90._0_8_;
        uStack_658 = local_a90._8_8_;
        uStack_650 = local_aa0._0_8_;
        uStack_648 = local_aa0._8_8_;
        local_b0 = local_a90._0_8_;
        uStack_a8 = local_a90._8_8_;
        local_b4 = 0x17;
        local_600 = vpslld_avx(local_a90,ZEXT416(0x17));
        local_d0 = local_aa0._0_8_;
        uStack_c8 = local_aa0._8_8_;
        local_d4 = 0x17;
        local_610 = vpslld_avx(local_aa0,ZEXT416(0x17));
        local_680 = local_600._0_8_;
        uStack_678 = local_600._8_8_;
        uStack_670 = local_610._0_8_;
        uStack_668 = local_610._8_8_;
        local_640 = local_600._0_8_;
        uStack_638 = local_600._8_8_;
        uStack_630 = local_610._0_8_;
        uStack_628 = local_610._8_8_;
        local_2e20 = local_600._0_8_;
        uStack_2e18 = local_600._8_8_;
        uStack_2e10 = local_610._0_8_;
        uStack_2e08 = local_610._8_8_;
        local_360 = local_600._0_8_;
        uStack_358 = local_600._8_8_;
        uStack_350 = local_610._0_8_;
        uStack_348 = local_610._8_8_;
        local_2ea0 = local_600._0_8_;
        uStack_2e98 = local_600._8_8_;
        uStack_2e90 = local_610._0_8_;
        uStack_2e88 = local_610._8_8_;
        local_2700 = local_2e80;
        uStack_26f8 = uStack_2e78;
        uStack_26f0 = uStack_2e70;
        uStack_26e8 = uStack_2e68;
        local_2720._0_4_ = local_600._0_4_;
        local_2720._4_4_ = local_600._4_4_;
        uStack_2718._0_4_ = local_600._8_4_;
        uStack_2718._4_4_ = local_600._12_4_;
        uStack_2710._0_4_ = local_610._0_4_;
        uStack_2710._4_4_ = local_610._4_4_;
        uStack_2708._0_4_ = local_610._8_4_;
        local_4720 = local_4720 * (float)local_2720;
        fStack_471c = fStack_471c * local_2720._4_4_;
        fStack_4718 = fStack_4718 * (float)uStack_2718;
        fStack_4714 = fStack_4714 * uStack_2718._4_4_;
        fStack_4710 = fStack_4710 * (float)uStack_2710;
        fStack_470c = fStack_470c * uStack_2710._4_4_;
        fStack_4708 = fStack_4708 * (float)uStack_2708;
        local_2e80 = CONCAT44(fStack_471c,local_4720);
        uStack_2e78 = CONCAT44(fStack_4714,fStack_4718);
        uStack_2e70 = CONCAT44(fStack_470c,fStack_4710);
        uStack_2e68 = CONCAT44(fStack_4704,fStack_4708);
        local_4700 = local_1b60._0_8_;
        uStack_46f8 = local_1b60._8_8_;
        uStack_46f0 = local_1b60._16_8_;
        uStack_46e8 = local_1b60._24_8_;
        local_5960 = local_2e80;
        uStack_5958 = uStack_2e78;
        uStack_5950 = uStack_2e70;
        uStack_5948 = uStack_2e68;
        local_5940._0_4_ = auVar6._0_4_;
        local_5940._4_4_ = auVar6._4_4_;
        uStack_5938._0_4_ = auVar6._8_4_;
        uStack_5938._4_4_ = auVar6._12_4_;
        uStack_5930._0_4_ = auVar5._0_4_;
        uStack_5930._4_4_ = auVar5._4_4_;
        uStack_5928._0_4_ = auVar5._8_4_;
        uStack_5928._4_4_ = auVar5._12_4_;
        local_4720 = (float)local_5940 + local_4720;
        fStack_471c = local_5940._4_4_ + fStack_471c;
        fStack_4718 = (float)uStack_5938 + fStack_4718;
        fStack_4714 = uStack_5938._4_4_ + fStack_4714;
        fStack_4710 = (float)uStack_5930 + fStack_4710;
        fStack_470c = uStack_5930._4_4_ + fStack_470c;
        fStack_4708 = (float)uStack_5928 + fStack_4708;
        fStack_4704 = uStack_5928._4_4_ + fStack_4704;
        auVar86._16_8_ = local_1b60._16_8_;
        auVar86._0_16_ = auVar6;
        auVar86._24_8_ = local_1b60._24_8_;
        auVar85._4_4_ = fStack_471c;
        auVar85._0_4_ = local_4720;
        auVar85._8_4_ = fStack_4718;
        auVar85._12_4_ = fStack_4714;
        auVar85._16_4_ = fStack_4710;
        auVar85._20_4_ = fStack_470c;
        auVar85._24_4_ = fStack_4708;
        auVar85._28_4_ = fStack_4704;
        auVar10 = vdivps_avx(auVar86,auVar85);
        local_81a0 = auVar10._0_8_;
        uStack_8198 = auVar10._8_8_;
        uStack_8190 = auVar10._16_8_;
        uStack_8188 = auVar10._24_8_;
        local_69b8 = local_73c8;
        local_5ca0 = *(undefined8 *)*local_73c8;
        uStack_5c98 = *(undefined8 *)(*local_73c8 + 8);
        uStack_5c90 = *(undefined8 *)(*local_73c8 + 0x10);
        uStack_5c88 = *(undefined8 *)(*local_73c8 + 0x18);
        local_47e4 = 0x3f800000;
        local_1b80 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar153._16_16_ = auVar5;
        auVar153._0_16_ = auVar6;
        local_1ba0._0_8_ = auVar6._0_8_;
        local_1ba0._8_8_ = auVar6._8_8_;
        local_1ba0._16_8_ = auVar5._0_8_;
        local_1ba0._24_8_ = auVar5._8_8_;
        local_5cc0 = local_1ba0._0_8_;
        uStack_5cb8 = local_1ba0._8_8_;
        uStack_5cb0 = local_1ba0._16_8_;
        uStack_5ca8 = local_1ba0._24_8_;
        local_25a0 = ZEXT832(0) << 0x20;
        local_1bc0 = 0;
        local_5c80._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1bb8 = local_5c80._8_8_;
        uStack_1bb0 = 0;
        uStack_1ba8 = 0;
        auVar13 = vsubps_avx(ZEXT832((ulong)local_5c80._8_8_) << 0x40,*local_73c8);
        local_2640 = 0x3f8000003f800000;
        uStack_2638 = 0x3f8000003f800000;
        uStack_2630 = 0x3f8000003f800000;
        uStack_2628 = 0x3f8000003f800000;
        local_25c0._0_8_ = auVar13._0_8_;
        local_1940 = local_25c0._0_8_;
        local_25c0._8_8_ = auVar13._8_8_;
        uStack_1938 = local_25c0._8_8_;
        local_25c0._16_8_ = auVar13._16_8_;
        uStack_1930 = local_25c0._16_8_;
        local_25c0._24_8_ = auVar13._24_8_;
        uStack_1928 = local_25c0._24_8_;
        local_1960 = 0x42b0c0a542b0c0a5;
        uStack_1958 = 0x42b0c0a542b0c0a5;
        uStack_1950 = 0x42b0c0a542b0c0a5;
        uStack_1948 = 0x42b0c0a542b0c0a5;
        auVar95._8_8_ = 0x42b0c0a542b0c0a5;
        auVar95._0_8_ = 0x42b0c0a542b0c0a5;
        auVar95._16_8_ = 0x42b0c0a542b0c0a5;
        auVar95._24_8_ = 0x42b0c0a542b0c0a5;
        auVar13 = vminps_avx(auVar13,auVar95);
        local_25c0._0_8_ = auVar13._0_8_;
        local_1800 = local_25c0._0_8_;
        local_25c0._8_8_ = auVar13._8_8_;
        uStack_17f8 = local_25c0._8_8_;
        local_25c0._16_8_ = auVar13._16_8_;
        uStack_17f0 = local_25c0._16_8_;
        local_25c0._24_8_ = auVar13._24_8_;
        uStack_17e8 = local_25c0._24_8_;
        local_1820 = 0xc2b0c0a5c2b0c0a5;
        uStack_1818 = 0xc2b0c0a5c2b0c0a5;
        uStack_1810 = 0xc2b0c0a5c2b0c0a5;
        uStack_1808 = 0xc2b0c0a5c2b0c0a5;
        auVar100._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar100._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar100._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11 = vmaxps_avx(auVar13,auVar100);
        local_25c0._0_8_ = auVar11._0_8_;
        local_2300 = local_25c0._0_8_;
        local_25c0._8_8_ = auVar11._8_8_;
        uStack_22f8 = local_25c0._8_8_;
        local_25c0._16_8_ = auVar11._16_8_;
        uStack_22f0 = local_25c0._16_8_;
        local_25c0._24_8_ = auVar11._24_8_;
        uStack_22e8 = local_25c0._24_8_;
        local_2320 = 0x3fb8aa3b3fb8aa3b;
        uStack_2318 = 0x3fb8aa3b3fb8aa3b;
        uStack_2310 = 0x3fb8aa3b3fb8aa3b;
        uStack_2308 = 0x3fb8aa3b3fb8aa3b;
        local_2340 = 0x3f0000003f000000;
        uStack_2338 = 0x3f0000003f000000;
        uStack_2330 = 0x3f0000003f000000;
        uStack_2328 = 0x3f0000003f000000;
        uVar22 = local_25c0._0_8_;
        uVar23 = local_25c0._8_8_;
        uVar24 = local_25c0._16_8_;
        uVar25 = local_25c0._24_8_;
        local_20e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_20d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_20d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_20c8 = 0x3fb8aa3b3fb8aa3b;
        local_20c0._0_4_ = auVar11._0_4_;
        local_20c0._4_4_ = auVar11._4_4_;
        uStack_20b8._0_4_ = auVar11._8_4_;
        uStack_20b8._4_4_ = auVar11._12_4_;
        uStack_20b0._0_4_ = auVar11._16_4_;
        uStack_20b0._4_4_ = auVar11._20_4_;
        uStack_20a8._0_4_ = auVar11._24_4_;
        uStack_22a4 = 0x3fb8aa3b;
        local_22c0 = (float)local_20c0 * 1.442695;
        fStack_22bc = local_20c0._4_4_ * 1.442695;
        fStack_22b8 = (float)uStack_20b8 * 1.442695;
        fStack_22b4 = uStack_20b8._4_4_ * 1.442695;
        fStack_22b0 = (float)uStack_20b0 * 1.442695;
        fStack_22ac = uStack_20b0._4_4_ * 1.442695;
        fStack_22a8 = (float)uStack_20a8 * 1.442695;
        local_22e0 = 0x3f0000003f000000;
        uStack_22d8 = 0x3f0000003f000000;
        uStack_22d0 = 0x3f0000003f000000;
        uStack_22c8 = 0x3f0000003f000000;
        local_2600._4_4_ = fStack_22bc + 0.5;
        local_2600._0_4_ = local_22c0 + 0.5;
        uStack_25f8._0_4_ = fStack_22b8 + 0.5;
        uStack_25f8._4_4_ = fStack_22b4 + 0.5;
        uStack_25f0._0_4_ = fStack_22b0 + 0.5;
        uStack_25f0._4_4_ = fStack_22ac + 0.5;
        uStack_25e8._0_4_ = fStack_22a8 + 0.5;
        uStack_25e8._4_4_ = 0x3ff8aa3b;
        auVar12 = vroundps_avx(_local_2600,1);
        auVar13 = vcmpps_avx(_local_2600,auVar12,1);
        local_2660._0_8_ = auVar13._0_8_;
        local_16c0 = local_2660._0_8_;
        local_2660._8_8_ = auVar13._8_8_;
        uStack_16b8 = local_2660._8_8_;
        local_2660._16_8_ = auVar13._16_8_;
        uStack_16b0 = local_2660._16_8_;
        local_2660._24_8_ = auVar13._24_8_;
        uStack_16a8 = local_2660._24_8_;
        local_16e0 = 0x3f8000003f800000;
        uStack_16d8 = 0x3f8000003f800000;
        uStack_16d0 = 0x3f8000003f800000;
        uStack_16c8 = 0x3f8000003f800000;
        auVar105._8_8_ = 0x3f8000003f800000;
        auVar105._0_8_ = 0x3f8000003f800000;
        auVar105._16_8_ = 0x3f8000003f800000;
        auVar105._24_8_ = 0x3f8000003f800000;
        local_2660 = vandps_avx(auVar13,auVar105);
        local_25e0 = auVar12._0_8_;
        local_1e80 = local_25e0;
        uStack_25d8 = auVar12._8_8_;
        uStack_1e78 = uStack_25d8;
        uStack_25d0 = auVar12._16_8_;
        uStack_1e70 = uStack_25d0;
        uStack_25c8 = auVar12._24_8_;
        uStack_1e68 = uStack_25c8;
        local_1ea0 = local_2660._0_8_;
        uStack_1e98 = local_2660._8_8_;
        uStack_1e90 = local_2660._16_8_;
        uStack_1e88 = local_2660._24_8_;
        _local_2600 = vsubps_avx(auVar12,local_2660);
        local_1480 = local_2600;
        uStack_1478 = uStack_25f8;
        uStack_1470 = uStack_25f0;
        uStack_1468 = uStack_25e8;
        local_14c0 = local_25c0._0_8_;
        uStack_14b8 = local_25c0._8_8_;
        uStack_14b0 = local_25c0._16_8_;
        uStack_14a8 = local_25c0._24_8_;
        local_14a0 = 0x3f3180003f318000;
        uStack_1498 = 0x3f3180003f318000;
        uStack_1490 = 0x3f3180003f318000;
        uStack_1488 = 0x3f3180003f318000;
        local_1400 = local_25c0._0_8_;
        uStack_13f8 = local_25c0._8_8_;
        uStack_13f0 = local_25c0._16_8_;
        uStack_13e8 = local_25c0._24_8_;
        local_1460 = 0x3f3180003f318000;
        uStack_1458 = 0x3f3180003f318000;
        uStack_1450 = 0x3f3180003f318000;
        uStack_1448 = 0x3f3180003f318000;
        local_1440._0_4_ = local_2600._0_4_;
        local_1440._4_4_ = local_2600._4_4_;
        uStack_1438._0_4_ = local_2600._8_4_;
        uStack_1438._4_4_ = local_2600._12_4_;
        uStack_1430._0_4_ = local_2600._16_4_;
        uStack_1430._4_4_ = local_2600._20_4_;
        uStack_1428._0_4_ = local_2600._24_4_;
        uStack_1428._4_4_ = local_2600._28_4_;
        fStack_1404 = uStack_1428._4_4_;
        local_1420 = (float)local_1440 * 0.6933594;
        fStack_141c = local_1440._4_4_ * 0.6933594;
        fStack_1418 = (float)uStack_1438 * 0.6933594;
        fStack_1414 = uStack_1438._4_4_ * 0.6933594;
        fStack_1410 = (float)uStack_1430 * 0.6933594;
        fStack_140c = uStack_1430._4_4_ * 0.6933594;
        fStack_1408 = (float)uStack_1428 * 0.6933594;
        auVar111._4_4_ = fStack_141c;
        auVar111._0_4_ = local_1420;
        auVar111._8_4_ = fStack_1418;
        auVar111._12_4_ = fStack_1414;
        auVar111._16_4_ = fStack_1410;
        auVar111._20_4_ = fStack_140c;
        auVar111._24_4_ = fStack_1408;
        auVar111._28_4_ = uStack_1428._4_4_;
        auVar13 = vsubps_avx(auVar11,auVar111);
        local_8220 = auVar13._0_8_;
        uStack_8218 = auVar13._8_8_;
        uStack_8210 = auVar13._16_8_;
        uStack_8208 = auVar13._24_8_;
        local_1560 = local_2600;
        uStack_1558 = uStack_25f8;
        uStack_1550 = uStack_25f0;
        uStack_1548 = uStack_25e8;
        local_15a0 = local_8220;
        uStack_1598 = uStack_8218;
        uStack_1590 = uStack_8210;
        uStack_1588 = uStack_8208;
        local_1580 = 0xb95e8083b95e8083;
        uStack_1578 = 0xb95e8083b95e8083;
        uStack_1570 = 0xb95e8083b95e8083;
        uStack_1568 = 0xb95e8083b95e8083;
        local_14e0 = local_8220;
        uStack_14d8 = uStack_8218;
        uStack_14d0 = uStack_8210;
        uStack_14c8 = uStack_8208;
        local_1520 = local_2600;
        uStack_1518 = uStack_25f8;
        uStack_1510 = uStack_25f0;
        uStack_1508 = uStack_25e8;
        local_1540 = 0xb95e8083b95e8083;
        uStack_1538 = 0xb95e8083b95e8083;
        uStack_1530 = 0xb95e8083b95e8083;
        uStack_1528 = 0xb95e8083b95e8083;
        fStack_14e4 = uStack_1428._4_4_;
        local_1500 = (float)local_1440 * -0.00021219444;
        fStack_14fc = local_1440._4_4_ * -0.00021219444;
        fStack_14f8 = (float)uStack_1438 * -0.00021219444;
        fStack_14f4 = uStack_1438._4_4_ * -0.00021219444;
        fStack_14f0 = (float)uStack_1430 * -0.00021219444;
        fStack_14ec = uStack_1430._4_4_ * -0.00021219444;
        fStack_14e8 = (float)uStack_1428 * -0.00021219444;
        auVar110._4_4_ = fStack_14fc;
        auVar110._0_4_ = local_1500;
        auVar110._8_4_ = fStack_14f8;
        auVar110._12_4_ = fStack_14f4;
        auVar110._16_4_ = fStack_14f0;
        auVar110._20_4_ = fStack_14ec;
        auVar110._24_4_ = fStack_14e8;
        auVar110._28_4_ = uStack_1428._4_4_;
        local_25c0 = vsubps_avx(auVar13,auVar110);
        local_8280 = local_25c0._0_8_;
        uStack_8278 = local_25c0._8_8_;
        uStack_8270 = local_25c0._16_8_;
        uStack_8268 = local_25c0._24_8_;
        local_1ee0 = local_8280;
        uStack_1ed8 = uStack_8278;
        uStack_1ed0 = uStack_8270;
        uStack_1ec8 = uStack_8268;
        local_1ec0._0_4_ = local_25c0._0_4_;
        local_1ec0._4_4_ = local_25c0._4_4_;
        uStack_1eb8._0_4_ = local_25c0._8_4_;
        uStack_1eb8._4_4_ = local_25c0._12_4_;
        uStack_1eb0._0_4_ = local_25c0._16_4_;
        uStack_1eb0._4_4_ = local_25c0._20_4_;
        uStack_1ea8._0_4_ = local_25c0._24_4_;
        uStack_1ea8._4_4_ = local_25c0._28_4_;
        local_25e0 = CONCAT44(local_1ec0._4_4_ * local_1ec0._4_4_,
                              (float)local_1ec0 * (float)local_1ec0);
        uStack_25d8._0_4_ = (float)uStack_1eb8 * (float)uStack_1eb8;
        uStack_25d8._4_4_ = uStack_1eb8._4_4_ * uStack_1eb8._4_4_;
        uStack_25d0._0_4_ = (float)uStack_1eb0 * (float)uStack_1eb0;
        uStack_25d0._4_4_ = uStack_1eb0._4_4_ * uStack_1eb0._4_4_;
        auVar146 = _local_25e0;
        uStack_25c8._0_4_ = (float)uStack_1ea8 * (float)uStack_1ea8;
        uStack_25c8._4_4_ = uStack_1ea8._4_4_;
        auVar145 = _local_25e0;
        local_2360 = 0x3950696739506967;
        uStack_2358 = 0x3950696739506967;
        uStack_2350 = 0x3950696739506967;
        uStack_2348 = 0x3950696739506967;
        local_2380 = local_8280;
        uStack_2378 = uStack_8278;
        uStack_2370 = uStack_8270;
        uStack_2368 = uStack_8268;
        local_23a0 = 0x3ab743ce3ab743ce;
        uStack_2398 = 0x3ab743ce3ab743ce;
        uStack_2390 = 0x3ab743ce3ab743ce;
        uStack_2388 = 0x3ab743ce3ab743ce;
        local_2080 = 0x3950696739506967;
        uStack_2078 = 0x3950696739506967;
        uStack_2070 = 0x3950696739506967;
        uStack_2068 = 0x3950696739506967;
        local_20a0 = local_8280;
        uStack_2098 = uStack_8278;
        uStack_2090 = uStack_8270;
        uStack_2088 = uStack_8268;
        fStack_2264 = uStack_1ea8._4_4_;
        local_2280 = (float)local_1ec0 * 0.00019875691;
        fStack_227c = local_1ec0._4_4_ * 0.00019875691;
        fStack_2278 = (float)uStack_1eb8 * 0.00019875691;
        fStack_2274 = uStack_1eb8._4_4_ * 0.00019875691;
        fStack_2270 = (float)uStack_1eb0 * 0.00019875691;
        fStack_226c = uStack_1eb0._4_4_ * 0.00019875691;
        fStack_2268 = (float)uStack_1ea8 * 0.00019875691;
        local_22a0 = 0x3ab743ce3ab743ce;
        uStack_2298 = 0x3ab743ce3ab743ce;
        uStack_2290 = 0x3ab743ce3ab743ce;
        uStack_2288 = 0x3ab743ce3ab743ce;
        local_2680 = CONCAT44(fStack_227c + 0.0013981999,local_2280 + 0.0013981999);
        uStack_2678 = CONCAT44(fStack_2274 + 0.0013981999,fStack_2278 + 0.0013981999);
        uStack_2670 = CONCAT44(fStack_226c + 0.0013981999,fStack_2270 + 0.0013981999);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + 0.0013981999,fStack_2268 + 0.0013981999);
        local_23c0 = local_2680;
        uStack_23b8 = uStack_2678;
        uStack_23b0 = uStack_2670;
        uStack_23a8 = uStack_2668;
        local_23e0 = local_8280;
        uStack_23d8 = uStack_8278;
        uStack_23d0 = uStack_8270;
        uStack_23c8 = uStack_8268;
        local_2400 = 0x3c0889083c088908;
        uStack_23f8 = 0x3c0889083c088908;
        uStack_23f0 = 0x3c0889083c088908;
        uStack_23e8 = 0x3c0889083c088908;
        local_2040 = local_2680;
        uStack_2038 = uStack_2678;
        uStack_2030 = uStack_2670;
        uStack_2028 = uStack_2668;
        local_2060 = local_8280;
        uStack_2058 = uStack_8278;
        uStack_2050 = uStack_8270;
        uStack_2048 = uStack_8268;
        fStack_2224 = uStack_1ea8._4_4_;
        local_2240 = (local_2280 + 0.0013981999) * (float)local_1ec0;
        fStack_223c = (fStack_227c + 0.0013981999) * local_1ec0._4_4_;
        fStack_2238 = (fStack_2278 + 0.0013981999) * (float)uStack_1eb8;
        fStack_2234 = (fStack_2274 + 0.0013981999) * uStack_1eb8._4_4_;
        fStack_2230 = (fStack_2270 + 0.0013981999) * (float)uStack_1eb0;
        fStack_222c = (fStack_226c + 0.0013981999) * uStack_1eb0._4_4_;
        fStack_2228 = (fStack_2268 + 0.0013981999) * (float)uStack_1ea8;
        local_2260 = 0x3c0889083c088908;
        uStack_2258 = 0x3c0889083c088908;
        uStack_2250 = 0x3c0889083c088908;
        uStack_2248 = 0x3c0889083c088908;
        local_2680 = CONCAT44(fStack_223c + 0.008333452,local_2240 + 0.008333452);
        uStack_2678 = CONCAT44(fStack_2234 + 0.008333452,fStack_2238 + 0.008333452);
        uStack_2670 = CONCAT44(fStack_222c + 0.008333452,fStack_2230 + 0.008333452);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + 0.008333452,fStack_2228 + 0.008333452);
        local_2420 = local_2680;
        uStack_2418 = uStack_2678;
        uStack_2410 = uStack_2670;
        uStack_2408 = uStack_2668;
        local_2440 = local_8280;
        uStack_2438 = uStack_8278;
        uStack_2430 = uStack_8270;
        uStack_2428 = uStack_8268;
        local_2460 = 0x3d2aa9c13d2aa9c1;
        uStack_2458 = 0x3d2aa9c13d2aa9c1;
        uStack_2450 = 0x3d2aa9c13d2aa9c1;
        uStack_2448 = 0x3d2aa9c13d2aa9c1;
        local_2000 = local_2680;
        uStack_1ff8 = uStack_2678;
        uStack_1ff0 = uStack_2670;
        uStack_1fe8 = uStack_2668;
        local_2020 = local_8280;
        uStack_2018 = uStack_8278;
        uStack_2010 = uStack_8270;
        uStack_2008 = uStack_8268;
        fStack_21e4 = uStack_1ea8._4_4_;
        local_2200 = (local_2240 + 0.008333452) * (float)local_1ec0;
        fStack_21fc = (fStack_223c + 0.008333452) * local_1ec0._4_4_;
        fStack_21f8 = (fStack_2238 + 0.008333452) * (float)uStack_1eb8;
        fStack_21f4 = (fStack_2234 + 0.008333452) * uStack_1eb8._4_4_;
        fStack_21f0 = (fStack_2230 + 0.008333452) * (float)uStack_1eb0;
        fStack_21ec = (fStack_222c + 0.008333452) * uStack_1eb0._4_4_;
        fStack_21e8 = (fStack_2228 + 0.008333452) * (float)uStack_1ea8;
        local_2220 = 0x3d2aa9c13d2aa9c1;
        uStack_2218 = 0x3d2aa9c13d2aa9c1;
        uStack_2210 = 0x3d2aa9c13d2aa9c1;
        uStack_2208 = 0x3d2aa9c13d2aa9c1;
        local_2680 = CONCAT44(fStack_21fc + 0.041665796,local_2200 + 0.041665796);
        uStack_2678 = CONCAT44(fStack_21f4 + 0.041665796,fStack_21f8 + 0.041665796);
        uStack_2670 = CONCAT44(fStack_21ec + 0.041665796,fStack_21f0 + 0.041665796);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + 0.041665796,fStack_21e8 + 0.041665796);
        local_2480 = local_2680;
        uStack_2478 = uStack_2678;
        uStack_2470 = uStack_2670;
        uStack_2468 = uStack_2668;
        local_24a0 = local_8280;
        uStack_2498 = uStack_8278;
        uStack_2490 = uStack_8270;
        uStack_2488 = uStack_8268;
        local_24c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_24b8 = 0x3e2aaaaa3e2aaaaa;
        uStack_24b0 = 0x3e2aaaaa3e2aaaaa;
        uStack_24a8 = 0x3e2aaaaa3e2aaaaa;
        local_1fc0 = local_2680;
        uStack_1fb8 = uStack_2678;
        uStack_1fb0 = uStack_2670;
        uStack_1fa8 = uStack_2668;
        local_1fe0 = local_8280;
        uStack_1fd8 = uStack_8278;
        uStack_1fd0 = uStack_8270;
        uStack_1fc8 = uStack_8268;
        fStack_21a4 = uStack_1ea8._4_4_;
        local_21c0 = (local_2200 + 0.041665796) * (float)local_1ec0;
        fStack_21bc = (fStack_21fc + 0.041665796) * local_1ec0._4_4_;
        fStack_21b8 = (fStack_21f8 + 0.041665796) * (float)uStack_1eb8;
        fStack_21b4 = (fStack_21f4 + 0.041665796) * uStack_1eb8._4_4_;
        fStack_21b0 = (fStack_21f0 + 0.041665796) * (float)uStack_1eb0;
        fStack_21ac = (fStack_21ec + 0.041665796) * uStack_1eb0._4_4_;
        fStack_21a8 = (fStack_21e8 + 0.041665796) * (float)uStack_1ea8;
        local_21e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_21d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_21d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_21c8 = 0x3e2aaaaa3e2aaaaa;
        local_2680 = CONCAT44(fStack_21bc + 0.16666666,local_21c0 + 0.16666666);
        uStack_2678 = CONCAT44(fStack_21b4 + 0.16666666,fStack_21b8 + 0.16666666);
        uStack_2670 = CONCAT44(fStack_21ac + 0.16666666,fStack_21b0 + 0.16666666);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + 0.16666666,fStack_21a8 + 0.16666666);
        local_24e0 = local_2680;
        uStack_24d8 = uStack_2678;
        uStack_24d0 = uStack_2670;
        uStack_24c8 = uStack_2668;
        local_2500 = local_8280;
        uStack_24f8 = uStack_8278;
        uStack_24f0 = uStack_8270;
        uStack_24e8 = uStack_8268;
        local_2520 = 0x3f0000003f000000;
        uStack_2518 = 0x3f0000003f000000;
        uStack_2510 = 0x3f0000003f000000;
        uStack_2508 = 0x3f0000003f000000;
        local_1f80 = local_2680;
        uStack_1f78 = uStack_2678;
        uStack_1f70 = uStack_2670;
        uStack_1f68 = uStack_2668;
        local_1fa0 = local_8280;
        uStack_1f98 = uStack_8278;
        uStack_1f90 = uStack_8270;
        uStack_1f88 = uStack_8268;
        fStack_2164 = uStack_1ea8._4_4_;
        local_2180 = (local_21c0 + 0.16666666) * (float)local_1ec0;
        fStack_217c = (fStack_21bc + 0.16666666) * local_1ec0._4_4_;
        fStack_2178 = (fStack_21b8 + 0.16666666) * (float)uStack_1eb8;
        fStack_2174 = (fStack_21b4 + 0.16666666) * uStack_1eb8._4_4_;
        fStack_2170 = (fStack_21b0 + 0.16666666) * (float)uStack_1eb0;
        fStack_216c = (fStack_21ac + 0.16666666) * uStack_1eb0._4_4_;
        fStack_2168 = (fStack_21a8 + 0.16666666) * (float)uStack_1ea8;
        local_21a0 = 0x3f0000003f000000;
        uStack_2198 = 0x3f0000003f000000;
        uStack_2190 = 0x3f0000003f000000;
        uStack_2188 = 0x3f0000003f000000;
        local_2680 = CONCAT44(fStack_217c + 0.5,local_2180 + 0.5);
        uStack_2678 = CONCAT44(fStack_2174 + 0.5,fStack_2178 + 0.5);
        uStack_2670 = CONCAT44(fStack_216c + 0.5,fStack_2170 + 0.5);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + 0.5,fStack_2168 + 0.5);
        local_2540 = local_2680;
        uStack_2538 = uStack_2678;
        uStack_2530 = uStack_2670;
        uStack_2528 = uStack_2668;
        local_2560 = local_25e0;
        uStack_2558 = uStack_25d8;
        uStack_25d0 = auVar146._16_8_;
        uStack_2550 = uStack_25d0;
        uStack_25c8 = auVar145._24_8_;
        uStack_2548 = uStack_25c8;
        local_2580 = local_8280;
        uStack_2578 = uStack_8278;
        uStack_2570 = uStack_8270;
        uStack_2568 = uStack_8268;
        local_1f40 = local_2680;
        uStack_1f38 = uStack_2678;
        uStack_1f30 = uStack_2670;
        uStack_1f28 = uStack_2668;
        local_1f60 = local_25e0;
        uStack_1f58 = uStack_25d8;
        uStack_1f50 = uStack_25d0;
        uStack_1f48 = uStack_25c8;
        fStack_2124 = uStack_1ea8._4_4_;
        local_2140 = (local_2180 + 0.5) * (float)local_1ec0 * (float)local_1ec0;
        fStack_213c = (fStack_217c + 0.5) * local_1ec0._4_4_ * local_1ec0._4_4_;
        fStack_2138 = (fStack_2178 + 0.5) * (float)uStack_1eb8 * (float)uStack_1eb8;
        fStack_2134 = (fStack_2174 + 0.5) * uStack_1eb8._4_4_ * uStack_1eb8._4_4_;
        fStack_2130 = (fStack_2170 + 0.5) * (float)uStack_1eb0 * (float)uStack_1eb0;
        fStack_212c = (fStack_216c + 0.5) * uStack_1eb0._4_4_ * uStack_1eb0._4_4_;
        fStack_2128 = (fStack_2168 + 0.5) * (float)uStack_1ea8 * (float)uStack_1ea8;
        local_2160 = local_8280;
        uStack_2158 = uStack_8278;
        uStack_2150 = uStack_8270;
        uStack_2148 = uStack_8268;
        local_2680 = CONCAT44(fStack_213c + local_1ec0._4_4_,local_2140 + (float)local_1ec0);
        uStack_2678 = CONCAT44(fStack_2134 + uStack_1eb8._4_4_,fStack_2138 + (float)uStack_1eb8);
        uStack_2670 = CONCAT44(fStack_212c + uStack_1eb0._4_4_,fStack_2130 + (float)uStack_1eb0);
        uStack_2668 = CONCAT44(uStack_1ea8._4_4_ + uStack_1ea8._4_4_,
                               fStack_2128 + (float)uStack_1ea8);
        local_2100 = local_2680;
        uStack_20f8 = uStack_2678;
        uStack_20f0 = uStack_2670;
        uStack_20e8 = uStack_2668;
        local_2120 = 0x3f8000003f800000;
        uStack_2118 = 0x3f8000003f800000;
        uStack_2110 = 0x3f8000003f800000;
        uStack_2108 = 0x3f8000003f800000;
        local_46e0 = local_2140 + (float)local_1ec0 + 1.0;
        fStack_46dc = fStack_213c + local_1ec0._4_4_ + 1.0;
        fStack_46d8 = fStack_2138 + (float)uStack_1eb8 + 1.0;
        fStack_46d4 = fStack_2134 + uStack_1eb8._4_4_ + 1.0;
        fStack_46d0 = fStack_2130 + (float)uStack_1eb0 + 1.0;
        fStack_46cc = fStack_212c + uStack_1eb0._4_4_ + 1.0;
        fStack_46c8 = fStack_2128 + (float)uStack_1ea8 + 1.0;
        fStack_46c4 = uStack_1ea8._4_4_ + uStack_1ea8._4_4_ + 1.0;
        local_2680 = CONCAT44(fStack_46dc,local_46e0);
        uStack_2678 = CONCAT44(fStack_46d4,fStack_46d8);
        uStack_2670 = CONCAT44(fStack_46cc,fStack_46d0);
        uStack_2668 = CONCAT44(fStack_46c4,fStack_46c8);
        local_ce0 = local_2600;
        uStack_cd8 = uStack_25f8;
        uStack_cd0 = uStack_25f0;
        uStack_cc8 = uStack_25e8;
        local_2620 = CONCAT44((int)local_1440._4_4_,(int)(float)local_1440);
        uStack_2618 = CONCAT44((int)uStack_1438._4_4_,(int)(float)uStack_1438);
        uStack_2610 = CONCAT44((int)uStack_1430._4_4_,(int)(float)uStack_1430);
        uStack_2608 = CONCAT44((int)uStack_1428._4_4_,(int)(float)uStack_1428);
        local_b60 = local_2620;
        uStack_b58 = uStack_2618;
        uStack_b50 = uStack_2610;
        uStack_b48 = uStack_2608;
        local_b80 = 0x7f0000007f;
        uStack_b78 = 0x7f0000007f;
        uStack_b70 = 0x7f0000007f;
        uStack_b68 = 0x7f0000007f;
        local_c00 = local_2620;
        uStack_bf8 = uStack_2618;
        uStack_bf0 = uStack_2610;
        uStack_be8 = uStack_2608;
        local_c20 = 0x7f0000007f;
        uStack_c18 = 0x7f0000007f;
        uStack_c10 = 0x7f0000007f;
        uStack_c08 = 0x7f0000007f;
        local_bb0 = 0x7f0000007f;
        uStack_ba8 = 0x7f0000007f;
        local_bc0 = 0x7f0000007f;
        uStack_bb8 = 0x7f0000007f;
        local_1b0 = local_2620;
        uStack_1a8 = uStack_2618;
        local_1c0 = 0x7f0000007f;
        uStack_1b8 = 0x7f0000007f;
        auVar138._8_8_ = uStack_2618;
        auVar138._0_8_ = local_2620;
        auVar137._8_8_ = 0x7f0000007f;
        auVar137._0_8_ = 0x7f0000007f;
        local_b90 = vpaddd_avx(auVar138,auVar137);
        local_1d0 = uStack_2610;
        uStack_1c8 = uStack_2608;
        local_1e0 = 0x7f0000007f;
        uStack_1d8 = 0x7f0000007f;
        auVar136._8_8_ = uStack_2608;
        auVar136._0_8_ = uStack_2610;
        auVar135._8_8_ = 0x7f0000007f;
        auVar135._0_8_ = 0x7f0000007f;
        local_ba0 = vpaddd_avx(auVar136,auVar135);
        local_c40 = local_b90._0_8_;
        uStack_c38 = local_b90._8_8_;
        uStack_c30 = local_ba0._0_8_;
        uStack_c28 = local_ba0._8_8_;
        local_be0 = local_b90._0_8_;
        uStack_bd8 = local_b90._8_8_;
        uStack_bd0 = local_ba0._0_8_;
        uStack_bc8 = local_ba0._8_8_;
        local_6a0 = local_b90._0_8_;
        uStack_698 = local_b90._8_8_;
        uStack_690 = local_ba0._0_8_;
        uStack_688 = local_ba0._8_8_;
        local_6a4 = 0x17;
        local_720 = local_b90._0_8_;
        uStack_718 = local_b90._8_8_;
        uStack_710 = local_ba0._0_8_;
        uStack_708 = local_ba0._8_8_;
        local_70 = local_b90._0_8_;
        uStack_68 = local_b90._8_8_;
        local_74 = 0x17;
        local_6c0 = vpslld_avx(local_b90,ZEXT416(0x17));
        local_90 = local_ba0._0_8_;
        uStack_88 = local_ba0._8_8_;
        local_94 = 0x17;
        local_6d0 = vpslld_avx(local_ba0,ZEXT416(0x17));
        local_740 = local_6c0._0_8_;
        uStack_738 = local_6c0._8_8_;
        uStack_730 = local_6d0._0_8_;
        uStack_728 = local_6d0._8_8_;
        local_700 = local_6c0._0_8_;
        uStack_6f8 = local_6c0._8_8_;
        uStack_6f0 = local_6d0._0_8_;
        uStack_6e8 = local_6d0._8_8_;
        local_2620 = local_6c0._0_8_;
        uStack_2618 = local_6c0._8_8_;
        uStack_2610 = local_6d0._0_8_;
        uStack_2608 = local_6d0._8_8_;
        local_380 = local_6c0._0_8_;
        uStack_378 = local_6c0._8_8_;
        uStack_370 = local_6d0._0_8_;
        uStack_368 = local_6d0._8_8_;
        local_26a0 = local_6c0._0_8_;
        uStack_2698 = local_6c0._8_8_;
        uStack_2690 = local_6d0._0_8_;
        uStack_2688 = local_6d0._8_8_;
        local_1f00 = local_2680;
        uStack_1ef8 = uStack_2678;
        uStack_1ef0 = uStack_2670;
        uStack_1ee8 = uStack_2668;
        local_1f20._0_4_ = local_6c0._0_4_;
        local_1f20._4_4_ = local_6c0._4_4_;
        uStack_1f18._0_4_ = local_6c0._8_4_;
        uStack_1f18._4_4_ = local_6c0._12_4_;
        uStack_1f10._0_4_ = local_6d0._0_4_;
        uStack_1f10._4_4_ = local_6d0._4_4_;
        uStack_1f08._0_4_ = local_6d0._8_4_;
        local_46e0 = local_46e0 * (float)local_1f20;
        fStack_46dc = fStack_46dc * local_1f20._4_4_;
        fStack_46d8 = fStack_46d8 * (float)uStack_1f18;
        fStack_46d4 = fStack_46d4 * uStack_1f18._4_4_;
        fStack_46d0 = fStack_46d0 * (float)uStack_1f10;
        fStack_46cc = fStack_46cc * uStack_1f10._4_4_;
        fStack_46c8 = fStack_46c8 * (float)uStack_1f08;
        local_2680 = CONCAT44(fStack_46dc,local_46e0);
        uStack_2678 = CONCAT44(fStack_46d4,fStack_46d8);
        uStack_2670 = CONCAT44(fStack_46cc,fStack_46d0);
        uStack_2668 = CONCAT44(fStack_46c4,fStack_46c8);
        local_46c0 = local_1ba0._0_8_;
        uStack_46b8 = local_1ba0._8_8_;
        uStack_46b0 = local_1ba0._16_8_;
        uStack_46a8 = local_1ba0._24_8_;
        local_5920 = local_2680;
        uStack_5918 = uStack_2678;
        uStack_5910 = uStack_2670;
        uStack_5908 = uStack_2668;
        local_5900._0_4_ = auVar6._0_4_;
        local_5900._4_4_ = auVar6._4_4_;
        uStack_58f8._0_4_ = auVar6._8_4_;
        uStack_58f8._4_4_ = auVar6._12_4_;
        uStack_58f0._0_4_ = auVar5._0_4_;
        uStack_58f0._4_4_ = auVar5._4_4_;
        uStack_58e8._0_4_ = auVar5._8_4_;
        uStack_58e8._4_4_ = auVar5._12_4_;
        local_46e0 = (float)local_5900 + local_46e0;
        fStack_46dc = local_5900._4_4_ + fStack_46dc;
        fStack_46d8 = (float)uStack_58f8 + fStack_46d8;
        fStack_46d4 = uStack_58f8._4_4_ + fStack_46d4;
        fStack_46d0 = (float)uStack_58f0 + fStack_46d0;
        fStack_46cc = uStack_58f0._4_4_ + fStack_46cc;
        fStack_46c8 = (float)uStack_58e8 + fStack_46c8;
        fStack_46c4 = uStack_58e8._4_4_ + fStack_46c4;
        auVar88._16_8_ = local_1ba0._16_8_;
        auVar88._0_16_ = auVar6;
        auVar88._24_8_ = local_1ba0._24_8_;
        auVar87._4_4_ = fStack_46dc;
        auVar87._0_4_ = local_46e0;
        auVar87._8_4_ = fStack_46d8;
        auVar87._12_4_ = fStack_46d4;
        auVar87._16_4_ = fStack_46d0;
        auVar87._20_4_ = fStack_46cc;
        auVar87._24_4_ = fStack_46c8;
        auVar87._28_4_ = fStack_46c4;
        _local_4b40 = vdivps_avx(auVar88,auVar87);
        local_69c0 = local_73d0;
        local_5aa0 = *(undefined8 *)local_73d0;
        uStack_5a98 = *(undefined8 *)(local_73d0 + 2);
        uStack_5a90 = *(undefined8 *)(local_73d0 + 4);
        uStack_5a88 = *(undefined8 *)(local_73d0 + 6);
        local_47fc = 0x3f800000;
        local_1a00 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar154._16_16_ = auVar5;
        auVar154._0_16_ = auVar6;
        local_1a20._0_8_ = auVar6._0_8_;
        local_1a20._8_8_ = auVar6._8_8_;
        local_1a20._16_8_ = auVar5._0_8_;
        local_1a20._24_8_ = auVar5._8_8_;
        local_5ac0 = local_1a20._0_8_;
        uStack_5ab8 = local_1a20._8_8_;
        uStack_5ab0 = local_1a20._16_8_;
        uStack_5aa8 = local_1a20._24_8_;
        local_4800 = 0x40000000;
        local_19c0 = 0x40000000;
        auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
        auVar155._16_16_ = auVar5;
        auVar155._0_16_ = auVar7;
        local_19e0._0_8_ = auVar7._0_8_;
        local_19e0._8_8_ = auVar7._8_8_;
        local_19e0._16_8_ = auVar5._0_8_;
        local_19e0._24_8_ = auVar5._8_8_;
        local_5ae0 = local_19e0._0_8_;
        uStack_5ad8 = local_19e0._8_8_;
        uStack_5ad0 = local_19e0._16_8_;
        uStack_5ac8 = local_19e0._24_8_;
        local_5200._0_4_ = (float)local_5aa0;
        local_5200._4_4_ = (float)((ulong)local_5aa0 >> 0x20);
        uStack_51f8._0_4_ = (float)uStack_5a98;
        uStack_51f8._4_4_ = (float)((ulong)uStack_5a98 >> 0x20);
        uStack_51f0._0_4_ = (float)uStack_5a90;
        uStack_51f0._4_4_ = (float)((ulong)uStack_5a90 >> 0x20);
        uStack_51e8._0_4_ = (float)uStack_5a88;
        uStack_51e8._4_4_ = (undefined4)((ulong)uStack_5a88 >> 0x20);
        uStack_5a44 = uStack_51e8._4_4_;
        local_5220._0_4_ = auVar7._0_4_;
        local_5220._4_4_ = auVar7._4_4_;
        uStack_5218._0_4_ = auVar7._8_4_;
        uStack_5218._4_4_ = auVar7._12_4_;
        uStack_5210._0_4_ = auVar5._0_4_;
        uStack_5210._4_4_ = auVar5._4_4_;
        uStack_5208._0_4_ = auVar5._8_4_;
        local_5a60 = (float)local_5200 * (float)local_5220;
        fStack_5a5c = local_5200._4_4_ * local_5220._4_4_;
        fStack_5a58 = (float)uStack_51f8 * (float)uStack_5218;
        fStack_5a54 = uStack_51f8._4_4_ * uStack_5218._4_4_;
        fStack_5a50 = (float)uStack_51f0 * (float)uStack_5210;
        fStack_5a4c = uStack_51f0._4_4_ * uStack_5210._4_4_;
        fStack_5a48 = (float)uStack_51e8 * (float)uStack_5208;
        local_4804 = 0x3f800000;
        local_1980 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar156._16_16_ = auVar5;
        auVar156._0_16_ = auVar7;
        local_19a0._0_8_ = auVar7._0_8_;
        local_19a0._8_8_ = auVar7._8_8_;
        local_19a0._16_8_ = auVar5._0_8_;
        local_19a0._24_8_ = auVar5._8_8_;
        local_5a80 = local_19a0._0_8_;
        uStack_5a78 = local_19a0._8_8_;
        uStack_5a70 = local_19a0._16_8_;
        uStack_5a68 = local_19a0._24_8_;
        local_45a0 = ZEXT832(0) << 0x20;
        local_1d00 = 0;
        local_5a40._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1cf8 = local_5a40._8_8_;
        uStack_1cf0 = 0;
        uStack_1ce8 = 0;
        local_1d20 = CONCAT44(fStack_5a5c,local_5a60);
        uStack_1d18 = CONCAT44(fStack_5a54,fStack_5a58);
        uStack_1d10 = CONCAT44(fStack_5a4c,fStack_5a50);
        uStack_1d08 = CONCAT44(uStack_51e8._4_4_,fStack_5a48);
        auVar91._8_8_ = uStack_1d18;
        auVar91._0_8_ = local_1d20;
        auVar91._16_8_ = uStack_1d10;
        auVar91._24_8_ = uStack_1d08;
        auVar13 = vsubps_avx(ZEXT832((ulong)local_5a40._8_8_) << 0x40,auVar91);
        local_4640 = 0x3f8000003f800000;
        uStack_4638 = 0x3f8000003f800000;
        uStack_4630 = 0x3f8000003f800000;
        uStack_4628 = 0x3f8000003f800000;
        local_45c0._0_8_ = auVar13._0_8_;
        local_1840 = local_45c0._0_8_;
        local_45c0._8_8_ = auVar13._8_8_;
        uStack_1838 = local_45c0._8_8_;
        local_45c0._16_8_ = auVar13._16_8_;
        uStack_1830 = local_45c0._16_8_;
        local_45c0._24_8_ = auVar13._24_8_;
        uStack_1828 = local_45c0._24_8_;
        local_1860 = 0x42b0c0a542b0c0a5;
        uStack_1858 = 0x42b0c0a542b0c0a5;
        uStack_1850 = 0x42b0c0a542b0c0a5;
        uStack_1848 = 0x42b0c0a542b0c0a5;
        auVar99._8_8_ = 0x42b0c0a542b0c0a5;
        auVar99._0_8_ = 0x42b0c0a542b0c0a5;
        auVar99._16_8_ = 0x42b0c0a542b0c0a5;
        auVar99._24_8_ = 0x42b0c0a542b0c0a5;
        auVar13 = vminps_avx(auVar13,auVar99);
        local_45c0._0_8_ = auVar13._0_8_;
        local_1700 = local_45c0._0_8_;
        local_45c0._8_8_ = auVar13._8_8_;
        uStack_16f8 = local_45c0._8_8_;
        local_45c0._16_8_ = auVar13._16_8_;
        uStack_16f0 = local_45c0._16_8_;
        local_45c0._24_8_ = auVar13._24_8_;
        uStack_16e8 = local_45c0._24_8_;
        local_1720 = 0xc2b0c0a5c2b0c0a5;
        uStack_1718 = 0xc2b0c0a5c2b0c0a5;
        uStack_1710 = 0xc2b0c0a5c2b0c0a5;
        uStack_1708 = 0xc2b0c0a5c2b0c0a5;
        auVar104._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar104._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar104._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11 = vmaxps_avx(auVar13,auVar104);
        local_45c0._0_8_ = auVar11._0_8_;
        local_4300 = local_45c0._0_8_;
        local_45c0._8_8_ = auVar11._8_8_;
        uStack_42f8 = local_45c0._8_8_;
        local_45c0._16_8_ = auVar11._16_8_;
        uStack_42f0 = local_45c0._16_8_;
        local_45c0._24_8_ = auVar11._24_8_;
        uStack_42e8 = local_45c0._24_8_;
        local_4320 = 0x3fb8aa3b3fb8aa3b;
        uStack_4318 = 0x3fb8aa3b3fb8aa3b;
        uStack_4310 = 0x3fb8aa3b3fb8aa3b;
        uStack_4308 = 0x3fb8aa3b3fb8aa3b;
        local_4340 = 0x3f0000003f000000;
        uStack_4338 = 0x3f0000003f000000;
        uStack_4330 = 0x3f0000003f000000;
        uStack_4328 = 0x3f0000003f000000;
        uVar26 = local_45c0._0_8_;
        uVar27 = local_45c0._8_8_;
        uVar28 = local_45c0._16_8_;
        uVar29 = local_45c0._24_8_;
        local_40e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_40d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_40d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_40c8 = 0x3fb8aa3b3fb8aa3b;
        local_40c0._0_4_ = auVar11._0_4_;
        local_40c0._4_4_ = auVar11._4_4_;
        uStack_40b8._0_4_ = auVar11._8_4_;
        uStack_40b8._4_4_ = auVar11._12_4_;
        uStack_40b0._0_4_ = auVar11._16_4_;
        uStack_40b0._4_4_ = auVar11._20_4_;
        uStack_40a8._0_4_ = auVar11._24_4_;
        uStack_42a4 = 0x3fb8aa3b;
        local_42c0 = (float)local_40c0 * 1.442695;
        fStack_42bc = local_40c0._4_4_ * 1.442695;
        fStack_42b8 = (float)uStack_40b8 * 1.442695;
        fStack_42b4 = uStack_40b8._4_4_ * 1.442695;
        fStack_42b0 = (float)uStack_40b0 * 1.442695;
        fStack_42ac = uStack_40b0._4_4_ * 1.442695;
        fStack_42a8 = (float)uStack_40a8 * 1.442695;
        local_42e0 = 0x3f0000003f000000;
        uStack_42d8 = 0x3f0000003f000000;
        uStack_42d0 = 0x3f0000003f000000;
        uStack_42c8 = 0x3f0000003f000000;
        local_4600._4_4_ = fStack_42bc + 0.5;
        local_4600._0_4_ = local_42c0 + 0.5;
        uStack_45f8._0_4_ = fStack_42b8 + 0.5;
        uStack_45f8._4_4_ = fStack_42b4 + 0.5;
        uStack_45f0._0_4_ = fStack_42b0 + 0.5;
        uStack_45f0._4_4_ = fStack_42ac + 0.5;
        uStack_45e8._0_4_ = fStack_42a8 + 0.5;
        uStack_45e8._4_4_ = 0x3ff8aa3b;
        auVar12 = vroundps_avx(_local_4600,1);
        auVar13 = vcmpps_avx(_local_4600,auVar12,1);
        local_4660._0_8_ = auVar13._0_8_;
        local_15c0 = local_4660._0_8_;
        local_4660._8_8_ = auVar13._8_8_;
        uStack_15b8 = local_4660._8_8_;
        local_4660._16_8_ = auVar13._16_8_;
        uStack_15b0 = local_4660._16_8_;
        local_4660._24_8_ = auVar13._24_8_;
        uStack_15a8 = local_4660._24_8_;
        local_15e0 = 0x3f8000003f800000;
        uStack_15d8 = 0x3f8000003f800000;
        uStack_15d0 = 0x3f8000003f800000;
        uStack_15c8 = 0x3f8000003f800000;
        auVar109._8_8_ = 0x3f8000003f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._16_8_ = 0x3f8000003f800000;
        auVar109._24_8_ = 0x3f8000003f800000;
        local_4660 = vandps_avx(auVar13,auVar109);
        local_45e0 = auVar12._0_8_;
        local_1d80 = local_45e0;
        uStack_45d8 = auVar12._8_8_;
        uStack_1d78 = uStack_45d8;
        uStack_45d0 = auVar12._16_8_;
        uStack_1d70 = uStack_45d0;
        uStack_45c8 = auVar12._24_8_;
        uStack_1d68 = uStack_45c8;
        local_1da0 = local_4660._0_8_;
        uStack_1d98 = local_4660._8_8_;
        uStack_1d90 = local_4660._16_8_;
        uStack_1d88 = local_4660._24_8_;
        _local_4600 = vsubps_avx(auVar12,local_4660);
        local_d80 = local_4600;
        uStack_d78 = uStack_45f8;
        uStack_d70 = uStack_45f0;
        uStack_d68 = uStack_45e8;
        local_dc0 = local_45c0._0_8_;
        uStack_db8 = local_45c0._8_8_;
        uStack_db0 = local_45c0._16_8_;
        uStack_da8 = local_45c0._24_8_;
        local_da0 = 0x3f3180003f318000;
        uStack_d98 = 0x3f3180003f318000;
        uStack_d90 = 0x3f3180003f318000;
        uStack_d88 = 0x3f3180003f318000;
        local_d00 = local_45c0._0_8_;
        uStack_cf8 = local_45c0._8_8_;
        uStack_cf0 = local_45c0._16_8_;
        uStack_ce8 = local_45c0._24_8_;
        local_d60 = 0x3f3180003f318000;
        uStack_d58 = 0x3f3180003f318000;
        uStack_d50 = 0x3f3180003f318000;
        uStack_d48 = 0x3f3180003f318000;
        local_d40._0_4_ = local_4600._0_4_;
        local_d40._4_4_ = local_4600._4_4_;
        uStack_d38._0_4_ = local_4600._8_4_;
        uStack_d38._4_4_ = local_4600._12_4_;
        uStack_d30._0_4_ = local_4600._16_4_;
        uStack_d30._4_4_ = local_4600._20_4_;
        uStack_d28._0_4_ = local_4600._24_4_;
        uStack_d28._4_4_ = local_4600._28_4_;
        fStack_d04 = uStack_d28._4_4_;
        local_d20 = (float)local_d40 * 0.6933594;
        fStack_d1c = local_d40._4_4_ * 0.6933594;
        fStack_d18 = (float)uStack_d38 * 0.6933594;
        fStack_d14 = uStack_d38._4_4_ * 0.6933594;
        fStack_d10 = (float)uStack_d30 * 0.6933594;
        fStack_d0c = uStack_d30._4_4_ * 0.6933594;
        fStack_d08 = (float)uStack_d28 * 0.6933594;
        auVar119._4_4_ = fStack_d1c;
        auVar119._0_4_ = local_d20;
        auVar119._8_4_ = fStack_d18;
        auVar119._12_4_ = fStack_d14;
        auVar119._16_4_ = fStack_d10;
        auVar119._20_4_ = fStack_d0c;
        auVar119._24_4_ = fStack_d08;
        auVar119._28_4_ = uStack_d28._4_4_;
        auVar13 = vsubps_avx(auVar11,auVar119);
        local_8400 = auVar13._0_8_;
        uStack_83f8 = auVar13._8_8_;
        uStack_83f0 = auVar13._16_8_;
        uStack_83e8 = auVar13._24_8_;
        local_e60 = local_4600;
        uStack_e58 = uStack_45f8;
        uStack_e50 = uStack_45f0;
        uStack_e48 = uStack_45e8;
        local_ea0 = local_8400;
        uStack_e98 = uStack_83f8;
        uStack_e90 = uStack_83f0;
        uStack_e88 = uStack_83e8;
        local_e80 = 0xb95e8083b95e8083;
        uStack_e78 = 0xb95e8083b95e8083;
        uStack_e70 = 0xb95e8083b95e8083;
        uStack_e68 = 0xb95e8083b95e8083;
        local_de0 = local_8400;
        uStack_dd8 = uStack_83f8;
        uStack_dd0 = uStack_83f0;
        uStack_dc8 = uStack_83e8;
        local_e20 = local_4600;
        uStack_e18 = uStack_45f8;
        uStack_e10 = uStack_45f0;
        uStack_e08 = uStack_45e8;
        local_e40 = 0xb95e8083b95e8083;
        uStack_e38 = 0xb95e8083b95e8083;
        uStack_e30 = 0xb95e8083b95e8083;
        uStack_e28 = 0xb95e8083b95e8083;
        fStack_de4 = uStack_d28._4_4_;
        local_e00 = (float)local_d40 * -0.00021219444;
        fStack_dfc = local_d40._4_4_ * -0.00021219444;
        fStack_df8 = (float)uStack_d38 * -0.00021219444;
        fStack_df4 = uStack_d38._4_4_ * -0.00021219444;
        fStack_df0 = (float)uStack_d30 * -0.00021219444;
        fStack_dec = uStack_d30._4_4_ * -0.00021219444;
        fStack_de8 = (float)uStack_d28 * -0.00021219444;
        auVar118._4_4_ = fStack_dfc;
        auVar118._0_4_ = local_e00;
        auVar118._8_4_ = fStack_df8;
        auVar118._12_4_ = fStack_df4;
        auVar118._16_4_ = fStack_df0;
        auVar118._20_4_ = fStack_dec;
        auVar118._24_4_ = fStack_de8;
        auVar118._28_4_ = uStack_d28._4_4_;
        local_45c0 = vsubps_avx(auVar13,auVar118);
        local_8460 = local_45c0._0_8_;
        uStack_8458 = local_45c0._8_8_;
        uStack_8450 = local_45c0._16_8_;
        uStack_8448 = local_45c0._24_8_;
        local_3ee0 = local_8460;
        uStack_3ed8 = uStack_8458;
        uStack_3ed0 = uStack_8450;
        uStack_3ec8 = uStack_8448;
        local_3ec0._0_4_ = local_45c0._0_4_;
        local_3ec0._4_4_ = local_45c0._4_4_;
        uStack_3eb8._0_4_ = local_45c0._8_4_;
        uStack_3eb8._4_4_ = local_45c0._12_4_;
        uStack_3eb0._0_4_ = local_45c0._16_4_;
        uStack_3eb0._4_4_ = local_45c0._20_4_;
        uStack_3ea8._0_4_ = local_45c0._24_4_;
        uStack_3ea8._4_4_ = local_45c0._28_4_;
        local_45e0 = CONCAT44(local_3ec0._4_4_ * local_3ec0._4_4_,
                              (float)local_3ec0 * (float)local_3ec0);
        uStack_45d8._0_4_ = (float)uStack_3eb8 * (float)uStack_3eb8;
        uStack_45d8._4_4_ = uStack_3eb8._4_4_ * uStack_3eb8._4_4_;
        uStack_45d0._0_4_ = (float)uStack_3eb0 * (float)uStack_3eb0;
        uStack_45d0._4_4_ = uStack_3eb0._4_4_ * uStack_3eb0._4_4_;
        auVar146 = _local_45e0;
        uStack_45c8._0_4_ = (float)uStack_3ea8 * (float)uStack_3ea8;
        uStack_45c8._4_4_ = uStack_3ea8._4_4_;
        auVar11 = _local_45e0;
        local_4360 = 0x3950696739506967;
        uStack_4358 = 0x3950696739506967;
        uStack_4350 = 0x3950696739506967;
        uStack_4348 = 0x3950696739506967;
        local_4380 = local_8460;
        uStack_4378 = uStack_8458;
        uStack_4370 = uStack_8450;
        uStack_4368 = uStack_8448;
        local_43a0 = 0x3ab743ce3ab743ce;
        uStack_4398 = 0x3ab743ce3ab743ce;
        uStack_4390 = 0x3ab743ce3ab743ce;
        uStack_4388 = 0x3ab743ce3ab743ce;
        local_4080 = 0x3950696739506967;
        uStack_4078 = 0x3950696739506967;
        uStack_4070 = 0x3950696739506967;
        uStack_4068 = 0x3950696739506967;
        local_40a0 = local_8460;
        uStack_4098 = uStack_8458;
        uStack_4090 = uStack_8450;
        uStack_4088 = uStack_8448;
        fStack_4264 = uStack_3ea8._4_4_;
        local_4280 = (float)local_3ec0 * 0.00019875691;
        fStack_427c = local_3ec0._4_4_ * 0.00019875691;
        fStack_4278 = (float)uStack_3eb8 * 0.00019875691;
        fStack_4274 = uStack_3eb8._4_4_ * 0.00019875691;
        fStack_4270 = (float)uStack_3eb0 * 0.00019875691;
        fStack_426c = uStack_3eb0._4_4_ * 0.00019875691;
        fStack_4268 = (float)uStack_3ea8 * 0.00019875691;
        local_42a0 = 0x3ab743ce3ab743ce;
        uStack_4298 = 0x3ab743ce3ab743ce;
        uStack_4290 = 0x3ab743ce3ab743ce;
        uStack_4288 = 0x3ab743ce3ab743ce;
        local_4680 = CONCAT44(fStack_427c + 0.0013981999,local_4280 + 0.0013981999);
        uStack_4678 = CONCAT44(fStack_4274 + 0.0013981999,fStack_4278 + 0.0013981999);
        uStack_4670 = CONCAT44(fStack_426c + 0.0013981999,fStack_4270 + 0.0013981999);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + 0.0013981999,fStack_4268 + 0.0013981999);
        local_43c0 = local_4680;
        uStack_43b8 = uStack_4678;
        uStack_43b0 = uStack_4670;
        uStack_43a8 = uStack_4668;
        local_43e0 = local_8460;
        uStack_43d8 = uStack_8458;
        uStack_43d0 = uStack_8450;
        uStack_43c8 = uStack_8448;
        local_4400 = 0x3c0889083c088908;
        uStack_43f8 = 0x3c0889083c088908;
        uStack_43f0 = 0x3c0889083c088908;
        uStack_43e8 = 0x3c0889083c088908;
        local_4040 = local_4680;
        uStack_4038 = uStack_4678;
        uStack_4030 = uStack_4670;
        uStack_4028 = uStack_4668;
        local_4060 = local_8460;
        uStack_4058 = uStack_8458;
        uStack_4050 = uStack_8450;
        uStack_4048 = uStack_8448;
        fStack_4224 = uStack_3ea8._4_4_;
        local_4240 = (local_4280 + 0.0013981999) * (float)local_3ec0;
        fStack_423c = (fStack_427c + 0.0013981999) * local_3ec0._4_4_;
        fStack_4238 = (fStack_4278 + 0.0013981999) * (float)uStack_3eb8;
        fStack_4234 = (fStack_4274 + 0.0013981999) * uStack_3eb8._4_4_;
        fStack_4230 = (fStack_4270 + 0.0013981999) * (float)uStack_3eb0;
        fStack_422c = (fStack_426c + 0.0013981999) * uStack_3eb0._4_4_;
        fStack_4228 = (fStack_4268 + 0.0013981999) * (float)uStack_3ea8;
        local_4260 = 0x3c0889083c088908;
        uStack_4258 = 0x3c0889083c088908;
        uStack_4250 = 0x3c0889083c088908;
        uStack_4248 = 0x3c0889083c088908;
        local_4680 = CONCAT44(fStack_423c + 0.008333452,local_4240 + 0.008333452);
        uStack_4678 = CONCAT44(fStack_4234 + 0.008333452,fStack_4238 + 0.008333452);
        uStack_4670 = CONCAT44(fStack_422c + 0.008333452,fStack_4230 + 0.008333452);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + 0.008333452,fStack_4228 + 0.008333452);
        local_4420 = local_4680;
        uStack_4418 = uStack_4678;
        uStack_4410 = uStack_4670;
        uStack_4408 = uStack_4668;
        local_4440 = local_8460;
        uStack_4438 = uStack_8458;
        uStack_4430 = uStack_8450;
        uStack_4428 = uStack_8448;
        local_4460 = 0x3d2aa9c13d2aa9c1;
        uStack_4458 = 0x3d2aa9c13d2aa9c1;
        uStack_4450 = 0x3d2aa9c13d2aa9c1;
        uStack_4448 = 0x3d2aa9c13d2aa9c1;
        local_4000 = local_4680;
        uStack_3ff8 = uStack_4678;
        uStack_3ff0 = uStack_4670;
        uStack_3fe8 = uStack_4668;
        local_4020 = local_8460;
        uStack_4018 = uStack_8458;
        uStack_4010 = uStack_8450;
        uStack_4008 = uStack_8448;
        fStack_41e4 = uStack_3ea8._4_4_;
        local_4200 = (local_4240 + 0.008333452) * (float)local_3ec0;
        fStack_41fc = (fStack_423c + 0.008333452) * local_3ec0._4_4_;
        fStack_41f8 = (fStack_4238 + 0.008333452) * (float)uStack_3eb8;
        fStack_41f4 = (fStack_4234 + 0.008333452) * uStack_3eb8._4_4_;
        fStack_41f0 = (fStack_4230 + 0.008333452) * (float)uStack_3eb0;
        fStack_41ec = (fStack_422c + 0.008333452) * uStack_3eb0._4_4_;
        fStack_41e8 = (fStack_4228 + 0.008333452) * (float)uStack_3ea8;
        local_4220 = 0x3d2aa9c13d2aa9c1;
        uStack_4218 = 0x3d2aa9c13d2aa9c1;
        uStack_4210 = 0x3d2aa9c13d2aa9c1;
        uStack_4208 = 0x3d2aa9c13d2aa9c1;
        local_4680 = CONCAT44(fStack_41fc + 0.041665796,local_4200 + 0.041665796);
        uStack_4678 = CONCAT44(fStack_41f4 + 0.041665796,fStack_41f8 + 0.041665796);
        uStack_4670 = CONCAT44(fStack_41ec + 0.041665796,fStack_41f0 + 0.041665796);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + 0.041665796,fStack_41e8 + 0.041665796);
        local_4480 = local_4680;
        uStack_4478 = uStack_4678;
        uStack_4470 = uStack_4670;
        uStack_4468 = uStack_4668;
        local_44a0 = local_8460;
        uStack_4498 = uStack_8458;
        uStack_4490 = uStack_8450;
        uStack_4488 = uStack_8448;
        local_44c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_44b8 = 0x3e2aaaaa3e2aaaaa;
        uStack_44b0 = 0x3e2aaaaa3e2aaaaa;
        uStack_44a8 = 0x3e2aaaaa3e2aaaaa;
        local_3fc0 = local_4680;
        uStack_3fb8 = uStack_4678;
        uStack_3fb0 = uStack_4670;
        uStack_3fa8 = uStack_4668;
        local_3fe0 = local_8460;
        uStack_3fd8 = uStack_8458;
        uStack_3fd0 = uStack_8450;
        uStack_3fc8 = uStack_8448;
        fStack_41a4 = uStack_3ea8._4_4_;
        local_41c0 = (local_4200 + 0.041665796) * (float)local_3ec0;
        fStack_41bc = (fStack_41fc + 0.041665796) * local_3ec0._4_4_;
        fStack_41b8 = (fStack_41f8 + 0.041665796) * (float)uStack_3eb8;
        fStack_41b4 = (fStack_41f4 + 0.041665796) * uStack_3eb8._4_4_;
        fStack_41b0 = (fStack_41f0 + 0.041665796) * (float)uStack_3eb0;
        fStack_41ac = (fStack_41ec + 0.041665796) * uStack_3eb0._4_4_;
        fStack_41a8 = (fStack_41e8 + 0.041665796) * (float)uStack_3ea8;
        local_41e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_41d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_41d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_41c8 = 0x3e2aaaaa3e2aaaaa;
        local_4680 = CONCAT44(fStack_41bc + 0.16666666,local_41c0 + 0.16666666);
        uStack_4678 = CONCAT44(fStack_41b4 + 0.16666666,fStack_41b8 + 0.16666666);
        uStack_4670 = CONCAT44(fStack_41ac + 0.16666666,fStack_41b0 + 0.16666666);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + 0.16666666,fStack_41a8 + 0.16666666);
        local_44e0 = local_4680;
        uStack_44d8 = uStack_4678;
        uStack_44d0 = uStack_4670;
        uStack_44c8 = uStack_4668;
        local_4500 = local_8460;
        uStack_44f8 = uStack_8458;
        uStack_44f0 = uStack_8450;
        uStack_44e8 = uStack_8448;
        local_4520 = 0x3f0000003f000000;
        uStack_4518 = 0x3f0000003f000000;
        uStack_4510 = 0x3f0000003f000000;
        uStack_4508 = 0x3f0000003f000000;
        local_3f80 = local_4680;
        uStack_3f78 = uStack_4678;
        uStack_3f70 = uStack_4670;
        uStack_3f68 = uStack_4668;
        local_3fa0 = local_8460;
        uStack_3f98 = uStack_8458;
        uStack_3f90 = uStack_8450;
        uStack_3f88 = uStack_8448;
        fStack_4164 = uStack_3ea8._4_4_;
        local_4180 = (local_41c0 + 0.16666666) * (float)local_3ec0;
        fStack_417c = (fStack_41bc + 0.16666666) * local_3ec0._4_4_;
        fStack_4178 = (fStack_41b8 + 0.16666666) * (float)uStack_3eb8;
        fStack_4174 = (fStack_41b4 + 0.16666666) * uStack_3eb8._4_4_;
        fStack_4170 = (fStack_41b0 + 0.16666666) * (float)uStack_3eb0;
        fStack_416c = (fStack_41ac + 0.16666666) * uStack_3eb0._4_4_;
        fStack_4168 = (fStack_41a8 + 0.16666666) * (float)uStack_3ea8;
        local_41a0 = 0x3f0000003f000000;
        uStack_4198 = 0x3f0000003f000000;
        uStack_4190 = 0x3f0000003f000000;
        uStack_4188 = 0x3f0000003f000000;
        local_4680 = CONCAT44(fStack_417c + 0.5,local_4180 + 0.5);
        uStack_4678 = CONCAT44(fStack_4174 + 0.5,fStack_4178 + 0.5);
        uStack_4670 = CONCAT44(fStack_416c + 0.5,fStack_4170 + 0.5);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + 0.5,fStack_4168 + 0.5);
        local_4540 = local_4680;
        uStack_4538 = uStack_4678;
        uStack_4530 = uStack_4670;
        uStack_4528 = uStack_4668;
        local_4560 = local_45e0;
        uStack_4558 = uStack_45d8;
        uStack_45d0 = auVar146._16_8_;
        uStack_4550 = uStack_45d0;
        uStack_45c8 = auVar11._24_8_;
        uStack_4548 = uStack_45c8;
        local_4580 = local_8460;
        uStack_4578 = uStack_8458;
        uStack_4570 = uStack_8450;
        uStack_4568 = uStack_8448;
        local_3f40 = local_4680;
        uStack_3f38 = uStack_4678;
        uStack_3f30 = uStack_4670;
        uStack_3f28 = uStack_4668;
        local_3f60 = local_45e0;
        uStack_3f58 = uStack_45d8;
        uStack_3f50 = uStack_45d0;
        uStack_3f48 = uStack_45c8;
        fStack_4124 = uStack_3ea8._4_4_;
        local_4140 = (local_4180 + 0.5) * (float)local_3ec0 * (float)local_3ec0;
        fStack_413c = (fStack_417c + 0.5) * local_3ec0._4_4_ * local_3ec0._4_4_;
        fStack_4138 = (fStack_4178 + 0.5) * (float)uStack_3eb8 * (float)uStack_3eb8;
        fStack_4134 = (fStack_4174 + 0.5) * uStack_3eb8._4_4_ * uStack_3eb8._4_4_;
        fStack_4130 = (fStack_4170 + 0.5) * (float)uStack_3eb0 * (float)uStack_3eb0;
        fStack_412c = (fStack_416c + 0.5) * uStack_3eb0._4_4_ * uStack_3eb0._4_4_;
        fStack_4128 = (fStack_4168 + 0.5) * (float)uStack_3ea8 * (float)uStack_3ea8;
        local_4160 = local_8460;
        uStack_4158 = uStack_8458;
        uStack_4150 = uStack_8450;
        uStack_4148 = uStack_8448;
        local_4680 = CONCAT44(fStack_413c + local_3ec0._4_4_,local_4140 + (float)local_3ec0);
        uStack_4678 = CONCAT44(fStack_4134 + uStack_3eb8._4_4_,fStack_4138 + (float)uStack_3eb8);
        uStack_4670 = CONCAT44(fStack_412c + uStack_3eb0._4_4_,fStack_4130 + (float)uStack_3eb0);
        uStack_4668 = CONCAT44(uStack_3ea8._4_4_ + uStack_3ea8._4_4_,
                               fStack_4128 + (float)uStack_3ea8);
        local_4100 = local_4680;
        uStack_40f8 = uStack_4678;
        uStack_40f0 = uStack_4670;
        uStack_40e8 = uStack_4668;
        local_4120 = 0x3f8000003f800000;
        uStack_4118 = 0x3f8000003f800000;
        uStack_4110 = 0x3f8000003f800000;
        uStack_4108 = 0x3f8000003f800000;
        local_47e0 = local_4140 + (float)local_3ec0 + 1.0;
        fStack_47dc = fStack_413c + local_3ec0._4_4_ + 1.0;
        fStack_47d8 = fStack_4138 + (float)uStack_3eb8 + 1.0;
        fStack_47d4 = fStack_4134 + uStack_3eb8._4_4_ + 1.0;
        fStack_47d0 = fStack_4130 + (float)uStack_3eb0 + 1.0;
        fStack_47cc = fStack_412c + uStack_3eb0._4_4_ + 1.0;
        fStack_47c8 = fStack_4128 + (float)uStack_3ea8 + 1.0;
        fStack_47c4 = uStack_3ea8._4_4_ + uStack_3ea8._4_4_ + 1.0;
        local_4680 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4678 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4670 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4668 = CONCAT44(fStack_47c4,fStack_47c8);
        local_c60 = local_4600;
        uStack_c58 = uStack_45f8;
        uStack_c50 = uStack_45f0;
        uStack_c48 = uStack_45e8;
        local_4620 = CONCAT44((int)local_d40._4_4_,(int)(float)local_d40);
        uStack_4618 = CONCAT44((int)uStack_d38._4_4_,(int)(float)uStack_d38);
        uStack_4610 = CONCAT44((int)uStack_d30._4_4_,(int)(float)uStack_d30);
        uStack_4608 = CONCAT44((int)uStack_d28._4_4_,(int)(float)uStack_d28);
        local_760 = local_4620;
        uStack_758 = uStack_4618;
        uStack_750 = uStack_4610;
        uStack_748 = uStack_4608;
        local_780 = 0x7f0000007f;
        uStack_778 = 0x7f0000007f;
        uStack_770 = 0x7f0000007f;
        uStack_768 = 0x7f0000007f;
        local_800 = local_4620;
        uStack_7f8 = uStack_4618;
        uStack_7f0 = uStack_4610;
        uStack_7e8 = uStack_4608;
        local_820 = 0x7f0000007f;
        uStack_818 = 0x7f0000007f;
        uStack_810 = 0x7f0000007f;
        uStack_808 = 0x7f0000007f;
        local_7b0 = 0x7f0000007f;
        uStack_7a8 = 0x7f0000007f;
        local_7c0 = 0x7f0000007f;
        uStack_7b8 = 0x7f0000007f;
        local_2b0 = local_4620;
        uStack_2a8 = uStack_4618;
        local_2c0 = 0x7f0000007f;
        uStack_2b8 = 0x7f0000007f;
        auVar123._8_8_ = uStack_4618;
        auVar123._0_8_ = local_4620;
        auVar122._8_8_ = 0x7f0000007f;
        auVar122._0_8_ = 0x7f0000007f;
        local_790 = vpaddd_avx(auVar123,auVar122);
        local_2d0 = uStack_4610;
        uStack_2c8 = uStack_4608;
        local_2e0 = 0x7f0000007f;
        uStack_2d8 = 0x7f0000007f;
        auVar121._8_8_ = uStack_4608;
        auVar121._0_8_ = uStack_4610;
        auVar120._8_8_ = 0x7f0000007f;
        auVar120._0_8_ = 0x7f0000007f;
        local_7a0 = vpaddd_avx(auVar121,auVar120);
        local_840 = local_790._0_8_;
        uStack_838 = local_790._8_8_;
        uStack_830 = local_7a0._0_8_;
        uStack_828 = local_7a0._8_8_;
        local_7e0 = local_790._0_8_;
        uStack_7d8 = local_790._8_8_;
        uStack_7d0 = local_7a0._0_8_;
        uStack_7c8 = local_7a0._8_8_;
        local_3a0 = local_790._0_8_;
        uStack_398 = local_790._8_8_;
        uStack_390 = local_7a0._0_8_;
        uStack_388 = local_7a0._8_8_;
        local_3a4 = 0x17;
        local_420 = local_790._0_8_;
        uStack_418 = local_790._8_8_;
        uStack_410 = local_7a0._0_8_;
        uStack_408 = local_7a0._8_8_;
        local_170 = local_790._0_8_;
        uStack_168 = local_790._8_8_;
        local_174 = 0x17;
        local_3c0 = vpslld_avx(local_790,ZEXT416(0x17));
        local_190 = local_7a0._0_8_;
        uStack_188 = local_7a0._8_8_;
        local_194 = 0x17;
        local_3d0 = vpslld_avx(local_7a0,ZEXT416(0x17));
        local_440 = local_3c0._0_8_;
        uStack_438 = local_3c0._8_8_;
        uStack_430 = local_3d0._0_8_;
        uStack_428 = local_3d0._8_8_;
        local_400 = local_3c0._0_8_;
        uStack_3f8 = local_3c0._8_8_;
        uStack_3f0 = local_3d0._0_8_;
        uStack_3e8 = local_3d0._8_8_;
        local_4620 = local_3c0._0_8_;
        uStack_4618 = local_3c0._8_8_;
        uStack_4610 = local_3d0._0_8_;
        uStack_4608 = local_3d0._8_8_;
        local_300 = local_3c0._0_8_;
        uStack_2f8 = local_3c0._8_8_;
        uStack_2f0 = local_3d0._0_8_;
        uStack_2e8 = local_3d0._8_8_;
        local_46a0 = local_3c0._0_8_;
        uStack_4698 = local_3c0._8_8_;
        uStack_4690 = local_3d0._0_8_;
        uStack_4688 = local_3d0._8_8_;
        local_3f00 = local_4680;
        uStack_3ef8 = uStack_4678;
        uStack_3ef0 = uStack_4670;
        uStack_3ee8 = uStack_4668;
        local_3f20._0_4_ = local_3c0._0_4_;
        local_3f20._4_4_ = local_3c0._4_4_;
        uStack_3f18._0_4_ = local_3c0._8_4_;
        uStack_3f18._4_4_ = local_3c0._12_4_;
        uStack_3f10._0_4_ = local_3d0._0_4_;
        uStack_3f10._4_4_ = local_3d0._4_4_;
        uStack_3f08._0_4_ = local_3d0._8_4_;
        local_47e0 = local_47e0 * (float)local_3f20;
        fStack_47dc = fStack_47dc * local_3f20._4_4_;
        fStack_47d8 = fStack_47d8 * (float)uStack_3f18;
        fStack_47d4 = fStack_47d4 * uStack_3f18._4_4_;
        fStack_47d0 = fStack_47d0 * (float)uStack_3f10;
        fStack_47cc = fStack_47cc * uStack_3f10._4_4_;
        fStack_47c8 = fStack_47c8 * (float)uStack_3f08;
        local_4680 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4678 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4670 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4668 = CONCAT44(fStack_47c4,fStack_47c8);
        local_47c0 = local_19a0._0_8_;
        uStack_47b8 = local_19a0._8_8_;
        uStack_47b0 = local_19a0._16_8_;
        uStack_47a8 = local_19a0._24_8_;
        local_5a20 = local_4680;
        uStack_5a18 = uStack_4678;
        uStack_5a10 = uStack_4670;
        uStack_5a08 = uStack_4668;
        local_5a00._0_4_ = auVar7._0_4_;
        local_5a00._4_4_ = auVar7._4_4_;
        uStack_59f8._0_4_ = auVar7._8_4_;
        uStack_59f8._4_4_ = auVar7._12_4_;
        uStack_59f0._0_4_ = auVar5._0_4_;
        uStack_59f0._4_4_ = auVar5._4_4_;
        uStack_59e8._0_4_ = auVar5._8_4_;
        uStack_59e8._4_4_ = auVar5._12_4_;
        local_47e0 = (float)local_5a00 + local_47e0;
        fStack_47dc = local_5a00._4_4_ + fStack_47dc;
        fStack_47d8 = (float)uStack_59f8 + fStack_47d8;
        fStack_47d4 = uStack_59f8._4_4_ + fStack_47d4;
        fStack_47d0 = (float)uStack_59f0 + fStack_47d0;
        fStack_47cc = uStack_59f0._4_4_ + fStack_47cc;
        fStack_47c8 = (float)uStack_59e8 + fStack_47c8;
        fStack_47c4 = uStack_59e8._4_4_ + fStack_47c4;
        auVar80._16_8_ = local_19a0._16_8_;
        auVar80._0_16_ = auVar7;
        auVar80._24_8_ = local_19a0._24_8_;
        auVar79._4_4_ = fStack_47dc;
        auVar79._0_4_ = local_47e0;
        auVar79._8_4_ = fStack_47d8;
        auVar79._12_4_ = fStack_47d4;
        auVar79._16_4_ = fStack_47d0;
        auVar79._20_4_ = fStack_47cc;
        auVar79._24_4_ = fStack_47c8;
        auVar79._28_4_ = fStack_47c4;
        _local_5240 = vdivps_avx(auVar80,auVar79);
        local_5260 = local_19e0._0_8_;
        uStack_5258 = local_19e0._8_8_;
        uStack_5250 = local_19e0._16_8_;
        uStack_5248 = local_19e0._24_8_;
        local_1d40 = (float)local_5240._0_4_ * (float)local_5220;
        fStack_1d3c = (float)local_5240._4_4_ * local_5220._4_4_;
        fStack_1d38 = fStack_5238 * (float)uStack_5218;
        fStack_1d34 = fStack_5234 * uStack_5218._4_4_;
        fStack_1d30 = fStack_5230 * (float)uStack_5210;
        fStack_1d2c = fStack_522c * uStack_5210._4_4_;
        uStack_1d24 = local_5240._28_4_;
        fStack_1d28 = fStack_5228 * (float)uStack_5208;
        local_1d60 = local_1a20._0_8_;
        uStack_1d58 = local_1a20._8_8_;
        uStack_1d50 = local_1a20._16_8_;
        uStack_1d48 = local_1a20._24_8_;
        auVar90._4_4_ = fStack_1d3c;
        auVar90._0_4_ = local_1d40;
        auVar90._8_4_ = fStack_1d38;
        auVar90._12_4_ = fStack_1d34;
        auVar90._16_4_ = fStack_1d30;
        auVar90._20_4_ = fStack_1d2c;
        auVar90._24_4_ = fStack_1d28;
        auVar90._28_4_ = uStack_1d24;
        auVar89._16_8_ = local_1a20._16_8_;
        auVar89._0_16_ = auVar6;
        auVar89._24_8_ = local_1a20._24_8_;
        auVar13 = vsubps_avx(auVar90,auVar89);
        local_84e0 = auVar13._0_8_;
        uStack_84d8 = auVar13._8_8_;
        uStack_84d0 = auVar13._16_8_;
        uStack_84c8 = auVar13._24_8_;
        local_69c8 = local_73a8;
        uVar30 = *(undefined8 *)local_73a8;
        uVar31 = *(undefined8 *)(local_73a8 + 2);
        uVar32 = *(undefined8 *)(local_73a8 + 4);
        uStack_4ac8 = *(undefined8 *)(local_73a8 + 6);
        local_4ac0._0_4_ = auVar10._0_4_;
        local_4ac0._4_4_ = auVar10._4_4_;
        uStack_4ab8._0_4_ = auVar10._8_4_;
        uStack_4ab8._4_4_ = auVar10._12_4_;
        uStack_4ab0._0_4_ = auVar10._16_4_;
        uStack_4ab0._4_4_ = auVar10._20_4_;
        uStack_4aa8._0_4_ = auVar10._24_4_;
        uStack_4aa8._4_4_ = auVar10._28_4_;
        local_4ae0._0_4_ = (float)uVar30;
        local_4ae0._4_4_ = (float)((ulong)uVar30 >> 0x20);
        uStack_4ad8._0_4_ = (float)uVar31;
        uStack_4ad8._4_4_ = (float)((ulong)uVar31 >> 0x20);
        uStack_4ad0._0_4_ = (float)uVar32;
        uStack_4ad0._4_4_ = (float)((ulong)uVar32 >> 0x20);
        local_4b00._0_4_ = auVar8._0_4_;
        local_4b00._4_4_ = auVar8._4_4_;
        uStack_4af8._0_4_ = auVar8._8_4_;
        uStack_4af8._4_4_ = auVar8._12_4_;
        uStack_4af0._0_4_ = auVar8._16_4_;
        uStack_4af0._4_4_ = auVar8._20_4_;
        uStack_4ae8._0_4_ = auVar8._24_4_;
        uStack_4ae8._4_4_ = auVar8._28_4_;
        local_4b20._0_4_ = auVar13._0_4_;
        local_4b20._4_4_ = auVar13._4_4_;
        uStack_4b18._0_4_ = auVar13._8_4_;
        uStack_4b18._4_4_ = auVar13._12_4_;
        uStack_4b10._0_4_ = auVar13._16_4_;
        uStack_4b10._4_4_ = auVar13._20_4_;
        uStack_4b08._0_4_ = auVar13._24_4_;
        local_52a0 = CONCAT44(local_4b00._4_4_ * local_4b20._4_4_,
                              (float)local_4b00 * (float)local_4b20);
        uStack_5298 = CONCAT44(uStack_4af8._4_4_ * uStack_4b18._4_4_,
                               (float)uStack_4af8 * (float)uStack_4b18);
        uStack_5290 = CONCAT44(uStack_4af0._4_4_ * uStack_4b10._4_4_,
                               (float)uStack_4af0 * (float)uStack_4b10);
        uStack_5288 = CONCAT44(uStack_4ae8._4_4_,(float)uStack_4ae8 * (float)uStack_4b08);
        local_5280 = CONCAT44(local_4ac0._4_4_ * local_4ae0._4_4_,
                              (float)local_4ac0 * (float)local_4ae0);
        uStack_5278 = CONCAT44(uStack_4ab8._4_4_ * uStack_4ad8._4_4_,
                               (float)uStack_4ab8 * (float)uStack_4ad8);
        uStack_5270 = CONCAT44(uStack_4ab0._4_4_ * uStack_4ad0._4_4_,
                               (float)uStack_4ab0 * (float)uStack_4ad0);
        uStack_5268 = CONCAT44(uStack_4aa8._4_4_,(float)uStack_4aa8 * (float)uStack_4ac8);
        local_5b20 = (float)local_4ac0 * (float)local_4ae0 + (float)local_4b00 * (float)local_4b20;
        fStack_5b1c = local_4ac0._4_4_ * local_4ae0._4_4_ + local_4b00._4_4_ * local_4b20._4_4_;
        fStack_5b18 = (float)uStack_4ab8 * (float)uStack_4ad8 +
                      (float)uStack_4af8 * (float)uStack_4b18;
        fStack_5b14 = uStack_4ab8._4_4_ * uStack_4ad8._4_4_ + uStack_4af8._4_4_ * uStack_4b18._4_4_;
        fStack_5b10 = (float)uStack_4ab0 * (float)uStack_4ad0 +
                      (float)uStack_4af0 * (float)uStack_4b10;
        fStack_5b0c = uStack_4ab0._4_4_ * uStack_4ad0._4_4_ + uStack_4af0._4_4_ * uStack_4b10._4_4_;
        fStack_5b08 = (float)uStack_4aa8 * (float)uStack_4ac8 +
                      (float)uStack_4ae8 * (float)uStack_4b08;
        fStack_5b04 = uStack_4aa8._4_4_ + uStack_4ae8._4_4_;
        local_5f40 = CONCAT44(fStack_5b1c,local_5b20);
        uStack_5f38 = CONCAT44(fStack_5b14,fStack_5b18);
        uStack_5f30 = CONCAT44(fStack_5b0c,fStack_5b10);
        uStack_5f28 = CONCAT44(fStack_5b04,fStack_5b08);
        local_47f0 = 0x3f800000;
        local_1ac0 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar157._16_16_ = auVar5;
        auVar157._0_16_ = auVar6;
        local_1ae0._0_8_ = auVar6._0_8_;
        local_1ae0._8_8_ = auVar6._8_8_;
        local_1ae0._16_8_ = auVar5._0_8_;
        local_1ae0._24_8_ = auVar5._8_8_;
        local_5b80 = local_1ae0._0_8_;
        uStack_5b78 = local_1ae0._8_8_;
        uStack_5b70 = local_1ae0._16_8_;
        uStack_5b68 = local_1ae0._24_8_;
        local_47f4 = 0x40000000;
        local_1a80 = 0x40000000;
        auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
        auVar158._16_16_ = auVar5;
        auVar158._0_16_ = auVar7;
        local_1aa0._0_8_ = auVar7._0_8_;
        local_1aa0._8_8_ = auVar7._8_8_;
        local_1aa0._16_8_ = auVar5._0_8_;
        local_1aa0._24_8_ = auVar5._8_8_;
        local_5ba0 = local_1aa0._0_8_;
        uStack_5b98 = local_1aa0._8_8_;
        uStack_5b90 = local_1aa0._16_8_;
        uStack_5b88 = local_1aa0._24_8_;
        local_51a0._0_4_ = auVar7._0_4_;
        local_51a0._4_4_ = auVar7._4_4_;
        uStack_5198._0_4_ = auVar7._8_4_;
        uStack_5198._4_4_ = auVar7._12_4_;
        uStack_5190._0_4_ = auVar5._0_4_;
        uStack_5190._4_4_ = auVar5._4_4_;
        uStack_5188._0_4_ = auVar5._8_4_;
        local_5b20 = local_5b20 * (float)local_51a0;
        fStack_5b1c = fStack_5b1c * local_51a0._4_4_;
        fStack_5b18 = fStack_5b18 * (float)uStack_5198;
        fStack_5b14 = fStack_5b14 * uStack_5198._4_4_;
        fStack_5b10 = fStack_5b10 * (float)uStack_5190;
        fStack_5b0c = fStack_5b0c * uStack_5190._4_4_;
        fStack_5b08 = fStack_5b08 * (float)uStack_5188;
        local_47f8 = 0x3f800000;
        local_1a40 = 0x3f800000;
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
        auVar159._16_16_ = auVar5;
        auVar159._0_16_ = auVar7;
        local_1a60._0_8_ = auVar7._0_8_;
        local_1a60._8_8_ = auVar7._8_8_;
        local_1a60._16_8_ = auVar5._0_8_;
        local_1a60._24_8_ = auVar5._8_8_;
        local_5b40 = local_1a60._0_8_;
        uStack_5b38 = local_1a60._8_8_;
        uStack_5b30 = local_1a60._16_8_;
        uStack_5b28 = local_1a60._24_8_;
        local_3da0 = ZEXT832(0) << 0x20;
        local_1c80 = 0;
        local_5b00._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1c78 = local_5b00._8_8_;
        uStack_1c70 = 0;
        uStack_1c68 = 0;
        local_1ca0 = CONCAT44(fStack_5b1c,local_5b20);
        uStack_1c98 = CONCAT44(fStack_5b14,fStack_5b18);
        uStack_1c90 = CONCAT44(fStack_5b0c,fStack_5b10);
        uStack_1c88 = CONCAT44(fStack_5b04,fStack_5b08);
        auVar94._8_8_ = uStack_1c98;
        auVar94._0_8_ = local_1ca0;
        auVar94._16_8_ = uStack_1c90;
        auVar94._24_8_ = uStack_1c88;
        auVar13 = vsubps_avx(ZEXT832((ulong)local_5b00._8_8_) << 0x40,auVar94);
        local_3e40 = 0x3f8000003f800000;
        uStack_3e38 = 0x3f8000003f800000;
        uStack_3e30 = 0x3f8000003f800000;
        uStack_3e28 = 0x3f8000003f800000;
        local_3dc0._0_8_ = auVar13._0_8_;
        local_1880 = local_3dc0._0_8_;
        local_3dc0._8_8_ = auVar13._8_8_;
        uStack_1878 = local_3dc0._8_8_;
        local_3dc0._16_8_ = auVar13._16_8_;
        uStack_1870 = local_3dc0._16_8_;
        local_3dc0._24_8_ = auVar13._24_8_;
        uStack_1868 = local_3dc0._24_8_;
        local_18a0 = 0x42b0c0a542b0c0a5;
        uStack_1898 = 0x42b0c0a542b0c0a5;
        uStack_1890 = 0x42b0c0a542b0c0a5;
        uStack_1888 = 0x42b0c0a542b0c0a5;
        auVar98._8_8_ = 0x42b0c0a542b0c0a5;
        auVar98._0_8_ = 0x42b0c0a542b0c0a5;
        auVar98._16_8_ = 0x42b0c0a542b0c0a5;
        auVar98._24_8_ = 0x42b0c0a542b0c0a5;
        auVar13 = vminps_avx(auVar13,auVar98);
        local_3dc0._0_8_ = auVar13._0_8_;
        local_1740 = local_3dc0._0_8_;
        local_3dc0._8_8_ = auVar13._8_8_;
        uStack_1738 = local_3dc0._8_8_;
        local_3dc0._16_8_ = auVar13._16_8_;
        uStack_1730 = local_3dc0._16_8_;
        local_3dc0._24_8_ = auVar13._24_8_;
        uStack_1728 = local_3dc0._24_8_;
        local_1760 = 0xc2b0c0a5c2b0c0a5;
        uStack_1758 = 0xc2b0c0a5c2b0c0a5;
        uStack_1750 = 0xc2b0c0a5c2b0c0a5;
        uStack_1748 = 0xc2b0c0a5c2b0c0a5;
        auVar103._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar103._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar103._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar103._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar8 = vmaxps_avx(auVar13,auVar103);
        local_3dc0._0_8_ = auVar8._0_8_;
        local_3b00 = local_3dc0._0_8_;
        local_3dc0._8_8_ = auVar8._8_8_;
        uStack_3af8 = local_3dc0._8_8_;
        local_3dc0._16_8_ = auVar8._16_8_;
        uStack_3af0 = local_3dc0._16_8_;
        local_3dc0._24_8_ = auVar8._24_8_;
        uStack_3ae8 = local_3dc0._24_8_;
        local_3b20 = 0x3fb8aa3b3fb8aa3b;
        uStack_3b18 = 0x3fb8aa3b3fb8aa3b;
        uStack_3b10 = 0x3fb8aa3b3fb8aa3b;
        uStack_3b08 = 0x3fb8aa3b3fb8aa3b;
        local_3b40 = 0x3f0000003f000000;
        uStack_3b38 = 0x3f0000003f000000;
        uStack_3b30 = 0x3f0000003f000000;
        uStack_3b28 = 0x3f0000003f000000;
        uVar33 = local_3dc0._0_8_;
        uVar34 = local_3dc0._8_8_;
        uVar35 = local_3dc0._16_8_;
        uVar36 = local_3dc0._24_8_;
        local_38e0 = 0x3fb8aa3b3fb8aa3b;
        uStack_38d8 = 0x3fb8aa3b3fb8aa3b;
        uStack_38d0 = 0x3fb8aa3b3fb8aa3b;
        uStack_38c8 = 0x3fb8aa3b3fb8aa3b;
        local_38c0._0_4_ = auVar8._0_4_;
        local_38c0._4_4_ = auVar8._4_4_;
        uStack_38b8._0_4_ = auVar8._8_4_;
        uStack_38b8._4_4_ = auVar8._12_4_;
        uStack_38b0._0_4_ = auVar8._16_4_;
        uStack_38b0._4_4_ = auVar8._20_4_;
        uStack_38a8._0_4_ = auVar8._24_4_;
        uStack_3aa4 = 0x3fb8aa3b;
        local_3ac0 = (float)local_38c0 * 1.442695;
        fStack_3abc = local_38c0._4_4_ * 1.442695;
        fStack_3ab8 = (float)uStack_38b8 * 1.442695;
        fStack_3ab4 = uStack_38b8._4_4_ * 1.442695;
        fStack_3ab0 = (float)uStack_38b0 * 1.442695;
        fStack_3aac = uStack_38b0._4_4_ * 1.442695;
        fStack_3aa8 = (float)uStack_38a8 * 1.442695;
        local_3ae0 = 0x3f0000003f000000;
        uStack_3ad8 = 0x3f0000003f000000;
        uStack_3ad0 = 0x3f0000003f000000;
        uStack_3ac8 = 0x3f0000003f000000;
        local_3e00._4_4_ = fStack_3abc + 0.5;
        local_3e00._0_4_ = local_3ac0 + 0.5;
        uStack_3df8._0_4_ = fStack_3ab8 + 0.5;
        uStack_3df8._4_4_ = fStack_3ab4 + 0.5;
        uStack_3df0._0_4_ = fStack_3ab0 + 0.5;
        uStack_3df0._4_4_ = fStack_3aac + 0.5;
        uStack_3de8._0_4_ = fStack_3aa8 + 0.5;
        uStack_3de8._4_4_ = 0x3ff8aa3b;
        auVar10 = vroundps_avx(_local_3e00,1);
        auVar13 = vcmpps_avx(_local_3e00,auVar10,1);
        local_3e60._0_8_ = auVar13._0_8_;
        local_1600 = local_3e60._0_8_;
        local_3e60._8_8_ = auVar13._8_8_;
        uStack_15f8 = local_3e60._8_8_;
        local_3e60._16_8_ = auVar13._16_8_;
        uStack_15f0 = local_3e60._16_8_;
        local_3e60._24_8_ = auVar13._24_8_;
        uStack_15e8 = local_3e60._24_8_;
        local_1620 = 0x3f8000003f800000;
        uStack_1618 = 0x3f8000003f800000;
        uStack_1610 = 0x3f8000003f800000;
        uStack_1608 = 0x3f8000003f800000;
        auVar108._8_8_ = 0x3f8000003f800000;
        auVar108._0_8_ = 0x3f8000003f800000;
        auVar108._16_8_ = 0x3f8000003f800000;
        auVar108._24_8_ = 0x3f8000003f800000;
        local_3e60 = vandps_avx(auVar13,auVar108);
        local_3de0 = auVar10._0_8_;
        local_1dc0 = local_3de0;
        uStack_3dd8 = auVar10._8_8_;
        uStack_1db8 = uStack_3dd8;
        uStack_3dd0 = auVar10._16_8_;
        uStack_1db0 = uStack_3dd0;
        uStack_3dc8 = auVar10._24_8_;
        uStack_1da8 = uStack_3dc8;
        local_1de0 = local_3e60._0_8_;
        uStack_1dd8 = local_3e60._8_8_;
        uStack_1dd0 = local_3e60._16_8_;
        uStack_1dc8 = local_3e60._24_8_;
        _local_3e00 = vsubps_avx(auVar10,local_3e60);
        local_f40 = local_3e00;
        uStack_f38 = uStack_3df8;
        uStack_f30 = uStack_3df0;
        uStack_f28 = uStack_3de8;
        local_f80 = local_3dc0._0_8_;
        uStack_f78 = local_3dc0._8_8_;
        uStack_f70 = local_3dc0._16_8_;
        uStack_f68 = local_3dc0._24_8_;
        local_f60 = 0x3f3180003f318000;
        uStack_f58 = 0x3f3180003f318000;
        uStack_f50 = 0x3f3180003f318000;
        uStack_f48 = 0x3f3180003f318000;
        local_ec0 = local_3dc0._0_8_;
        uStack_eb8 = local_3dc0._8_8_;
        uStack_eb0 = local_3dc0._16_8_;
        uStack_ea8 = local_3dc0._24_8_;
        local_f20 = 0x3f3180003f318000;
        uStack_f18 = 0x3f3180003f318000;
        uStack_f10 = 0x3f3180003f318000;
        uStack_f08 = 0x3f3180003f318000;
        local_f00._0_4_ = local_3e00._0_4_;
        local_f00._4_4_ = local_3e00._4_4_;
        uStack_ef8._0_4_ = local_3e00._8_4_;
        uStack_ef8._4_4_ = local_3e00._12_4_;
        uStack_ef0._0_4_ = local_3e00._16_4_;
        uStack_ef0._4_4_ = local_3e00._20_4_;
        uStack_ee8._0_4_ = local_3e00._24_4_;
        uStack_ee8._4_4_ = local_3e00._28_4_;
        fStack_ec4 = uStack_ee8._4_4_;
        local_ee0 = (float)local_f00 * 0.6933594;
        fStack_edc = local_f00._4_4_ * 0.6933594;
        fStack_ed8 = (float)uStack_ef8 * 0.6933594;
        fStack_ed4 = uStack_ef8._4_4_ * 0.6933594;
        fStack_ed0 = (float)uStack_ef0 * 0.6933594;
        fStack_ecc = uStack_ef0._4_4_ * 0.6933594;
        fStack_ec8 = (float)uStack_ee8 * 0.6933594;
        auVar117._4_4_ = fStack_edc;
        auVar117._0_4_ = local_ee0;
        auVar117._8_4_ = fStack_ed8;
        auVar117._12_4_ = fStack_ed4;
        auVar117._16_4_ = fStack_ed0;
        auVar117._20_4_ = fStack_ecc;
        auVar117._24_4_ = fStack_ec8;
        auVar117._28_4_ = uStack_ee8._4_4_;
        auVar13 = vsubps_avx(auVar8,auVar117);
        local_8680 = auVar13._0_8_;
        uStack_8678 = auVar13._8_8_;
        uStack_8670 = auVar13._16_8_;
        uStack_8668 = auVar13._24_8_;
        local_1020 = local_3e00;
        uStack_1018 = uStack_3df8;
        uStack_1010 = uStack_3df0;
        uStack_1008 = uStack_3de8;
        local_1060 = local_8680;
        uStack_1058 = uStack_8678;
        uStack_1050 = uStack_8670;
        uStack_1048 = uStack_8668;
        local_1040 = 0xb95e8083b95e8083;
        uStack_1038 = 0xb95e8083b95e8083;
        uStack_1030 = 0xb95e8083b95e8083;
        uStack_1028 = 0xb95e8083b95e8083;
        local_fa0 = local_8680;
        uStack_f98 = uStack_8678;
        uStack_f90 = uStack_8670;
        uStack_f88 = uStack_8668;
        local_fe0 = local_3e00;
        uStack_fd8 = uStack_3df8;
        uStack_fd0 = uStack_3df0;
        uStack_fc8 = uStack_3de8;
        local_1000 = 0xb95e8083b95e8083;
        uStack_ff8 = 0xb95e8083b95e8083;
        uStack_ff0 = 0xb95e8083b95e8083;
        uStack_fe8 = 0xb95e8083b95e8083;
        fStack_fa4 = uStack_ee8._4_4_;
        local_fc0 = (float)local_f00 * -0.00021219444;
        fStack_fbc = local_f00._4_4_ * -0.00021219444;
        fStack_fb8 = (float)uStack_ef8 * -0.00021219444;
        fStack_fb4 = uStack_ef8._4_4_ * -0.00021219444;
        fStack_fb0 = (float)uStack_ef0 * -0.00021219444;
        fStack_fac = uStack_ef0._4_4_ * -0.00021219444;
        fStack_fa8 = (float)uStack_ee8 * -0.00021219444;
        auVar116._4_4_ = fStack_fbc;
        auVar116._0_4_ = local_fc0;
        auVar116._8_4_ = fStack_fb8;
        auVar116._12_4_ = fStack_fb4;
        auVar116._16_4_ = fStack_fb0;
        auVar116._20_4_ = fStack_fac;
        auVar116._24_4_ = fStack_fa8;
        auVar116._28_4_ = uStack_ee8._4_4_;
        local_3dc0 = vsubps_avx(auVar13,auVar116);
        local_86e0 = local_3dc0._0_8_;
        uStack_86d8 = local_3dc0._8_8_;
        uStack_86d0 = local_3dc0._16_8_;
        uStack_86c8 = local_3dc0._24_8_;
        local_36e0 = local_86e0;
        uStack_36d8 = uStack_86d8;
        uStack_36d0 = uStack_86d0;
        uStack_36c8 = uStack_86c8;
        local_36c0._0_4_ = local_3dc0._0_4_;
        local_36c0._4_4_ = local_3dc0._4_4_;
        uStack_36b8._0_4_ = local_3dc0._8_4_;
        uStack_36b8._4_4_ = local_3dc0._12_4_;
        uStack_36b0._0_4_ = local_3dc0._16_4_;
        uStack_36b0._4_4_ = local_3dc0._20_4_;
        uStack_36a8._0_4_ = local_3dc0._24_4_;
        uStack_36a8._4_4_ = local_3dc0._28_4_;
        local_3de0 = CONCAT44(local_36c0._4_4_ * local_36c0._4_4_,
                              (float)local_36c0 * (float)local_36c0);
        uStack_3dd8._0_4_ = (float)uStack_36b8 * (float)uStack_36b8;
        uStack_3dd8._4_4_ = uStack_36b8._4_4_ * uStack_36b8._4_4_;
        uStack_3dd0._0_4_ = (float)uStack_36b0 * (float)uStack_36b0;
        uStack_3dd0._4_4_ = uStack_36b0._4_4_ * uStack_36b0._4_4_;
        auVar146 = _local_3de0;
        uStack_3dc8._0_4_ = (float)uStack_36a8 * (float)uStack_36a8;
        uStack_3dc8._4_4_ = uStack_36a8._4_4_;
        auVar8 = _local_3de0;
        local_3b60 = 0x3950696739506967;
        uStack_3b58 = 0x3950696739506967;
        uStack_3b50 = 0x3950696739506967;
        uStack_3b48 = 0x3950696739506967;
        local_3b80 = local_86e0;
        uStack_3b78 = uStack_86d8;
        uStack_3b70 = uStack_86d0;
        uStack_3b68 = uStack_86c8;
        local_3ba0 = 0x3ab743ce3ab743ce;
        uStack_3b98 = 0x3ab743ce3ab743ce;
        uStack_3b90 = 0x3ab743ce3ab743ce;
        uStack_3b88 = 0x3ab743ce3ab743ce;
        local_3880 = 0x3950696739506967;
        uStack_3878 = 0x3950696739506967;
        uStack_3870 = 0x3950696739506967;
        uStack_3868 = 0x3950696739506967;
        local_38a0 = local_86e0;
        uStack_3898 = uStack_86d8;
        uStack_3890 = uStack_86d0;
        uStack_3888 = uStack_86c8;
        fStack_3a64 = uStack_36a8._4_4_;
        local_3a80 = (float)local_36c0 * 0.00019875691;
        fStack_3a7c = local_36c0._4_4_ * 0.00019875691;
        fStack_3a78 = (float)uStack_36b8 * 0.00019875691;
        fStack_3a74 = uStack_36b8._4_4_ * 0.00019875691;
        fStack_3a70 = (float)uStack_36b0 * 0.00019875691;
        fStack_3a6c = uStack_36b0._4_4_ * 0.00019875691;
        fStack_3a68 = (float)uStack_36a8 * 0.00019875691;
        local_3aa0 = 0x3ab743ce3ab743ce;
        uStack_3a98 = 0x3ab743ce3ab743ce;
        uStack_3a90 = 0x3ab743ce3ab743ce;
        uStack_3a88 = 0x3ab743ce3ab743ce;
        local_3e80 = CONCAT44(fStack_3a7c + 0.0013981999,local_3a80 + 0.0013981999);
        uStack_3e78 = CONCAT44(fStack_3a74 + 0.0013981999,fStack_3a78 + 0.0013981999);
        uStack_3e70 = CONCAT44(fStack_3a6c + 0.0013981999,fStack_3a70 + 0.0013981999);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + 0.0013981999,fStack_3a68 + 0.0013981999);
        local_3bc0 = local_3e80;
        uStack_3bb8 = uStack_3e78;
        uStack_3bb0 = uStack_3e70;
        uStack_3ba8 = uStack_3e68;
        local_3be0 = local_86e0;
        uStack_3bd8 = uStack_86d8;
        uStack_3bd0 = uStack_86d0;
        uStack_3bc8 = uStack_86c8;
        local_3c00 = 0x3c0889083c088908;
        uStack_3bf8 = 0x3c0889083c088908;
        uStack_3bf0 = 0x3c0889083c088908;
        uStack_3be8 = 0x3c0889083c088908;
        local_3840 = local_3e80;
        uStack_3838 = uStack_3e78;
        uStack_3830 = uStack_3e70;
        uStack_3828 = uStack_3e68;
        local_3860 = local_86e0;
        uStack_3858 = uStack_86d8;
        uStack_3850 = uStack_86d0;
        uStack_3848 = uStack_86c8;
        fStack_3a24 = uStack_36a8._4_4_;
        local_3a40 = (local_3a80 + 0.0013981999) * (float)local_36c0;
        fStack_3a3c = (fStack_3a7c + 0.0013981999) * local_36c0._4_4_;
        fStack_3a38 = (fStack_3a78 + 0.0013981999) * (float)uStack_36b8;
        fStack_3a34 = (fStack_3a74 + 0.0013981999) * uStack_36b8._4_4_;
        fStack_3a30 = (fStack_3a70 + 0.0013981999) * (float)uStack_36b0;
        fStack_3a2c = (fStack_3a6c + 0.0013981999) * uStack_36b0._4_4_;
        fStack_3a28 = (fStack_3a68 + 0.0013981999) * (float)uStack_36a8;
        local_3a60 = 0x3c0889083c088908;
        uStack_3a58 = 0x3c0889083c088908;
        uStack_3a50 = 0x3c0889083c088908;
        uStack_3a48 = 0x3c0889083c088908;
        local_3e80 = CONCAT44(fStack_3a3c + 0.008333452,local_3a40 + 0.008333452);
        uStack_3e78 = CONCAT44(fStack_3a34 + 0.008333452,fStack_3a38 + 0.008333452);
        uStack_3e70 = CONCAT44(fStack_3a2c + 0.008333452,fStack_3a30 + 0.008333452);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + 0.008333452,fStack_3a28 + 0.008333452);
        local_3c20 = local_3e80;
        uStack_3c18 = uStack_3e78;
        uStack_3c10 = uStack_3e70;
        uStack_3c08 = uStack_3e68;
        local_3c40 = local_86e0;
        uStack_3c38 = uStack_86d8;
        uStack_3c30 = uStack_86d0;
        uStack_3c28 = uStack_86c8;
        local_3c60 = 0x3d2aa9c13d2aa9c1;
        uStack_3c58 = 0x3d2aa9c13d2aa9c1;
        uStack_3c50 = 0x3d2aa9c13d2aa9c1;
        uStack_3c48 = 0x3d2aa9c13d2aa9c1;
        local_3800 = local_3e80;
        uStack_37f8 = uStack_3e78;
        uStack_37f0 = uStack_3e70;
        uStack_37e8 = uStack_3e68;
        local_3820 = local_86e0;
        uStack_3818 = uStack_86d8;
        uStack_3810 = uStack_86d0;
        uStack_3808 = uStack_86c8;
        fStack_39e4 = uStack_36a8._4_4_;
        local_3a00 = (local_3a40 + 0.008333452) * (float)local_36c0;
        fStack_39fc = (fStack_3a3c + 0.008333452) * local_36c0._4_4_;
        fStack_39f8 = (fStack_3a38 + 0.008333452) * (float)uStack_36b8;
        fStack_39f4 = (fStack_3a34 + 0.008333452) * uStack_36b8._4_4_;
        fStack_39f0 = (fStack_3a30 + 0.008333452) * (float)uStack_36b0;
        fStack_39ec = (fStack_3a2c + 0.008333452) * uStack_36b0._4_4_;
        fStack_39e8 = (fStack_3a28 + 0.008333452) * (float)uStack_36a8;
        local_3a20 = 0x3d2aa9c13d2aa9c1;
        uStack_3a18 = 0x3d2aa9c13d2aa9c1;
        uStack_3a10 = 0x3d2aa9c13d2aa9c1;
        uStack_3a08 = 0x3d2aa9c13d2aa9c1;
        local_3e80 = CONCAT44(fStack_39fc + 0.041665796,local_3a00 + 0.041665796);
        uStack_3e78 = CONCAT44(fStack_39f4 + 0.041665796,fStack_39f8 + 0.041665796);
        uStack_3e70 = CONCAT44(fStack_39ec + 0.041665796,fStack_39f0 + 0.041665796);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + 0.041665796,fStack_39e8 + 0.041665796);
        local_3c80 = local_3e80;
        uStack_3c78 = uStack_3e78;
        uStack_3c70 = uStack_3e70;
        uStack_3c68 = uStack_3e68;
        local_3ca0 = local_86e0;
        uStack_3c98 = uStack_86d8;
        uStack_3c90 = uStack_86d0;
        uStack_3c88 = uStack_86c8;
        local_3cc0 = 0x3e2aaaaa3e2aaaaa;
        uStack_3cb8 = 0x3e2aaaaa3e2aaaaa;
        uStack_3cb0 = 0x3e2aaaaa3e2aaaaa;
        uStack_3ca8 = 0x3e2aaaaa3e2aaaaa;
        local_37c0 = local_3e80;
        uStack_37b8 = uStack_3e78;
        uStack_37b0 = uStack_3e70;
        uStack_37a8 = uStack_3e68;
        local_37e0 = local_86e0;
        uStack_37d8 = uStack_86d8;
        uStack_37d0 = uStack_86d0;
        uStack_37c8 = uStack_86c8;
        fStack_39a4 = uStack_36a8._4_4_;
        local_39c0 = (local_3a00 + 0.041665796) * (float)local_36c0;
        fStack_39bc = (fStack_39fc + 0.041665796) * local_36c0._4_4_;
        fStack_39b8 = (fStack_39f8 + 0.041665796) * (float)uStack_36b8;
        fStack_39b4 = (fStack_39f4 + 0.041665796) * uStack_36b8._4_4_;
        fStack_39b0 = (fStack_39f0 + 0.041665796) * (float)uStack_36b0;
        fStack_39ac = (fStack_39ec + 0.041665796) * uStack_36b0._4_4_;
        fStack_39a8 = (fStack_39e8 + 0.041665796) * (float)uStack_36a8;
        local_39e0 = 0x3e2aaaaa3e2aaaaa;
        uStack_39d8 = 0x3e2aaaaa3e2aaaaa;
        uStack_39d0 = 0x3e2aaaaa3e2aaaaa;
        uStack_39c8 = 0x3e2aaaaa3e2aaaaa;
        local_3e80 = CONCAT44(fStack_39bc + 0.16666666,local_39c0 + 0.16666666);
        uStack_3e78 = CONCAT44(fStack_39b4 + 0.16666666,fStack_39b8 + 0.16666666);
        uStack_3e70 = CONCAT44(fStack_39ac + 0.16666666,fStack_39b0 + 0.16666666);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + 0.16666666,fStack_39a8 + 0.16666666);
        local_3ce0 = local_3e80;
        uStack_3cd8 = uStack_3e78;
        uStack_3cd0 = uStack_3e70;
        uStack_3cc8 = uStack_3e68;
        local_3d00 = local_86e0;
        uStack_3cf8 = uStack_86d8;
        uStack_3cf0 = uStack_86d0;
        uStack_3ce8 = uStack_86c8;
        local_3d20 = 0x3f0000003f000000;
        uStack_3d18 = 0x3f0000003f000000;
        uStack_3d10 = 0x3f0000003f000000;
        uStack_3d08 = 0x3f0000003f000000;
        local_3780 = local_3e80;
        uStack_3778 = uStack_3e78;
        uStack_3770 = uStack_3e70;
        uStack_3768 = uStack_3e68;
        local_37a0 = local_86e0;
        uStack_3798 = uStack_86d8;
        uStack_3790 = uStack_86d0;
        uStack_3788 = uStack_86c8;
        fStack_3964 = uStack_36a8._4_4_;
        local_3980 = (local_39c0 + 0.16666666) * (float)local_36c0;
        fStack_397c = (fStack_39bc + 0.16666666) * local_36c0._4_4_;
        fStack_3978 = (fStack_39b8 + 0.16666666) * (float)uStack_36b8;
        fStack_3974 = (fStack_39b4 + 0.16666666) * uStack_36b8._4_4_;
        fStack_3970 = (fStack_39b0 + 0.16666666) * (float)uStack_36b0;
        fStack_396c = (fStack_39ac + 0.16666666) * uStack_36b0._4_4_;
        fStack_3968 = (fStack_39a8 + 0.16666666) * (float)uStack_36a8;
        local_39a0 = 0x3f0000003f000000;
        uStack_3998 = 0x3f0000003f000000;
        uStack_3990 = 0x3f0000003f000000;
        uStack_3988 = 0x3f0000003f000000;
        local_3e80 = CONCAT44(fStack_397c + 0.5,local_3980 + 0.5);
        uStack_3e78 = CONCAT44(fStack_3974 + 0.5,fStack_3978 + 0.5);
        uStack_3e70 = CONCAT44(fStack_396c + 0.5,fStack_3970 + 0.5);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + 0.5,fStack_3968 + 0.5);
        local_3d40 = local_3e80;
        uStack_3d38 = uStack_3e78;
        uStack_3d30 = uStack_3e70;
        uStack_3d28 = uStack_3e68;
        local_3d60 = local_3de0;
        uStack_3d58 = uStack_3dd8;
        uStack_3dd0 = auVar146._16_8_;
        uStack_3d50 = uStack_3dd0;
        uStack_3dc8 = auVar8._24_8_;
        uStack_3d48 = uStack_3dc8;
        local_3d80 = local_86e0;
        uStack_3d78 = uStack_86d8;
        uStack_3d70 = uStack_86d0;
        uStack_3d68 = uStack_86c8;
        local_3740 = local_3e80;
        uStack_3738 = uStack_3e78;
        uStack_3730 = uStack_3e70;
        uStack_3728 = uStack_3e68;
        local_3760 = local_3de0;
        uStack_3758 = uStack_3dd8;
        uStack_3750 = uStack_3dd0;
        uStack_3748 = uStack_3dc8;
        fStack_3924 = uStack_36a8._4_4_;
        local_3940 = (local_3980 + 0.5) * (float)local_36c0 * (float)local_36c0;
        fStack_393c = (fStack_397c + 0.5) * local_36c0._4_4_ * local_36c0._4_4_;
        fStack_3938 = (fStack_3978 + 0.5) * (float)uStack_36b8 * (float)uStack_36b8;
        fStack_3934 = (fStack_3974 + 0.5) * uStack_36b8._4_4_ * uStack_36b8._4_4_;
        fStack_3930 = (fStack_3970 + 0.5) * (float)uStack_36b0 * (float)uStack_36b0;
        fStack_392c = (fStack_396c + 0.5) * uStack_36b0._4_4_ * uStack_36b0._4_4_;
        fStack_3928 = (fStack_3968 + 0.5) * (float)uStack_36a8 * (float)uStack_36a8;
        local_3960 = local_86e0;
        uStack_3958 = uStack_86d8;
        uStack_3950 = uStack_86d0;
        uStack_3948 = uStack_86c8;
        local_3e80 = CONCAT44(fStack_393c + local_36c0._4_4_,local_3940 + (float)local_36c0);
        uStack_3e78 = CONCAT44(fStack_3934 + uStack_36b8._4_4_,fStack_3938 + (float)uStack_36b8);
        uStack_3e70 = CONCAT44(fStack_392c + uStack_36b0._4_4_,fStack_3930 + (float)uStack_36b0);
        uStack_3e68 = CONCAT44(uStack_36a8._4_4_ + uStack_36a8._4_4_,
                               fStack_3928 + (float)uStack_36a8);
        local_3900 = local_3e80;
        uStack_38f8 = uStack_3e78;
        uStack_38f0 = uStack_3e70;
        uStack_38e8 = uStack_3e68;
        local_3920 = 0x3f8000003f800000;
        uStack_3918 = 0x3f8000003f800000;
        uStack_3910 = 0x3f8000003f800000;
        uStack_3908 = 0x3f8000003f800000;
        local_47a0 = local_3940 + (float)local_36c0 + 1.0;
        fStack_479c = fStack_393c + local_36c0._4_4_ + 1.0;
        fStack_4798 = fStack_3938 + (float)uStack_36b8 + 1.0;
        fStack_4794 = fStack_3934 + uStack_36b8._4_4_ + 1.0;
        fStack_4790 = fStack_3930 + (float)uStack_36b0 + 1.0;
        fStack_478c = fStack_392c + uStack_36b0._4_4_ + 1.0;
        fStack_4788 = fStack_3928 + (float)uStack_36a8 + 1.0;
        fStack_4784 = uStack_36a8._4_4_ + uStack_36a8._4_4_ + 1.0;
        local_3e80 = CONCAT44(fStack_479c,local_47a0);
        uStack_3e78 = CONCAT44(fStack_4794,fStack_4798);
        uStack_3e70 = CONCAT44(fStack_478c,fStack_4790);
        uStack_3e68 = CONCAT44(fStack_4784,fStack_4788);
        local_c80 = local_3e00;
        uStack_c78 = uStack_3df8;
        uStack_c70 = uStack_3df0;
        uStack_c68 = uStack_3de8;
        local_3e20 = CONCAT44((int)local_f00._4_4_,(int)(float)local_f00);
        uStack_3e18 = CONCAT44((int)uStack_ef8._4_4_,(int)(float)uStack_ef8);
        uStack_3e10 = CONCAT44((int)uStack_ef0._4_4_,(int)(float)uStack_ef0);
        uStack_3e08 = CONCAT44((int)uStack_ee8._4_4_,(int)(float)uStack_ee8);
        local_860 = local_3e20;
        uStack_858 = uStack_3e18;
        uStack_850 = uStack_3e10;
        uStack_848 = uStack_3e08;
        local_880 = 0x7f0000007f;
        uStack_878 = 0x7f0000007f;
        uStack_870 = 0x7f0000007f;
        uStack_868 = 0x7f0000007f;
        local_900 = local_3e20;
        uStack_8f8 = uStack_3e18;
        uStack_8f0 = uStack_3e10;
        uStack_8e8 = uStack_3e08;
        local_920 = 0x7f0000007f;
        uStack_918 = 0x7f0000007f;
        uStack_910 = 0x7f0000007f;
        uStack_908 = 0x7f0000007f;
        local_8b0 = 0x7f0000007f;
        uStack_8a8 = 0x7f0000007f;
        local_8c0 = 0x7f0000007f;
        uStack_8b8 = 0x7f0000007f;
        local_270 = local_3e20;
        uStack_268 = uStack_3e18;
        local_280 = 0x7f0000007f;
        uStack_278 = 0x7f0000007f;
        auVar127._8_8_ = uStack_3e18;
        auVar127._0_8_ = local_3e20;
        auVar126._8_8_ = 0x7f0000007f;
        auVar126._0_8_ = 0x7f0000007f;
        local_890 = vpaddd_avx(auVar127,auVar126);
        local_290 = uStack_3e10;
        uStack_288 = uStack_3e08;
        local_2a0 = 0x7f0000007f;
        uStack_298 = 0x7f0000007f;
        auVar125._8_8_ = uStack_3e08;
        auVar125._0_8_ = uStack_3e10;
        auVar124._8_8_ = 0x7f0000007f;
        auVar124._0_8_ = 0x7f0000007f;
        local_8a0 = vpaddd_avx(auVar125,auVar124);
        local_940 = local_890._0_8_;
        uStack_938 = local_890._8_8_;
        uStack_930 = local_8a0._0_8_;
        uStack_928 = local_8a0._8_8_;
        local_8e0 = local_890._0_8_;
        uStack_8d8 = local_890._8_8_;
        uStack_8d0 = local_8a0._0_8_;
        uStack_8c8 = local_8a0._8_8_;
        local_460 = local_890._0_8_;
        uStack_458 = local_890._8_8_;
        uStack_450 = local_8a0._0_8_;
        uStack_448 = local_8a0._8_8_;
        local_464 = 0x17;
        local_4e0 = local_890._0_8_;
        uStack_4d8 = local_890._8_8_;
        uStack_4d0 = local_8a0._0_8_;
        uStack_4c8 = local_8a0._8_8_;
        local_130 = local_890._0_8_;
        uStack_128 = local_890._8_8_;
        local_134 = 0x17;
        local_480 = vpslld_avx(local_890,ZEXT416(0x17));
        local_150 = local_8a0._0_8_;
        uStack_148 = local_8a0._8_8_;
        local_154 = 0x17;
        local_490 = vpslld_avx(local_8a0,ZEXT416(0x17));
        local_500 = local_480._0_8_;
        uStack_4f8 = local_480._8_8_;
        uStack_4f0 = local_490._0_8_;
        uStack_4e8 = local_490._8_8_;
        local_4c0 = local_480._0_8_;
        uStack_4b8 = local_480._8_8_;
        uStack_4b0 = local_490._0_8_;
        uStack_4a8 = local_490._8_8_;
        local_3e20 = local_480._0_8_;
        uStack_3e18 = local_480._8_8_;
        uStack_3e10 = local_490._0_8_;
        uStack_3e08 = local_490._8_8_;
        local_320 = local_480._0_8_;
        uStack_318 = local_480._8_8_;
        uStack_310 = local_490._0_8_;
        uStack_308 = local_490._8_8_;
        local_3ea0 = local_480._0_8_;
        uStack_3e98 = local_480._8_8_;
        uStack_3e90 = local_490._0_8_;
        uStack_3e88 = local_490._8_8_;
        local_3700 = local_3e80;
        uStack_36f8 = uStack_3e78;
        uStack_36f0 = uStack_3e70;
        uStack_36e8 = uStack_3e68;
        local_3720._0_4_ = local_480._0_4_;
        local_3720._4_4_ = local_480._4_4_;
        uStack_3718._0_4_ = local_480._8_4_;
        uStack_3718._4_4_ = local_480._12_4_;
        uStack_3710._0_4_ = local_490._0_4_;
        uStack_3710._4_4_ = local_490._4_4_;
        uStack_3708._0_4_ = local_490._8_4_;
        local_47a0 = local_47a0 * (float)local_3720;
        fStack_479c = fStack_479c * local_3720._4_4_;
        fStack_4798 = fStack_4798 * (float)uStack_3718;
        fStack_4794 = fStack_4794 * uStack_3718._4_4_;
        fStack_4790 = fStack_4790 * (float)uStack_3710;
        fStack_478c = fStack_478c * uStack_3710._4_4_;
        fStack_4788 = fStack_4788 * (float)uStack_3708;
        local_3e80 = CONCAT44(fStack_479c,local_47a0);
        uStack_3e78 = CONCAT44(fStack_4794,fStack_4798);
        uStack_3e70 = CONCAT44(fStack_478c,fStack_4790);
        uStack_3e68 = CONCAT44(fStack_4784,fStack_4788);
        local_4780 = local_1a60._0_8_;
        uStack_4778 = local_1a60._8_8_;
        uStack_4770 = local_1a60._16_8_;
        uStack_4768 = local_1a60._24_8_;
        local_59e0 = local_3e80;
        uStack_59d8 = uStack_3e78;
        uStack_59d0 = uStack_3e70;
        uStack_59c8 = uStack_3e68;
        local_59c0._0_4_ = auVar7._0_4_;
        local_59c0._4_4_ = auVar7._4_4_;
        uStack_59b8._0_4_ = auVar7._8_4_;
        uStack_59b8._4_4_ = auVar7._12_4_;
        uStack_59b0._0_4_ = auVar5._0_4_;
        uStack_59b0._4_4_ = auVar5._4_4_;
        uStack_59a8._0_4_ = auVar5._8_4_;
        uStack_59a8._4_4_ = auVar5._12_4_;
        local_47a0 = (float)local_59c0 + local_47a0;
        fStack_479c = local_59c0._4_4_ + fStack_479c;
        fStack_4798 = (float)uStack_59b8 + fStack_4798;
        fStack_4794 = uStack_59b8._4_4_ + fStack_4794;
        fStack_4790 = (float)uStack_59b0 + fStack_4790;
        fStack_478c = uStack_59b0._4_4_ + fStack_478c;
        fStack_4788 = (float)uStack_59a8 + fStack_4788;
        fStack_4784 = uStack_59a8._4_4_ + fStack_4784;
        auVar82._16_8_ = local_1a60._16_8_;
        auVar82._0_16_ = auVar7;
        auVar82._24_8_ = local_1a60._24_8_;
        auVar81._4_4_ = fStack_479c;
        auVar81._0_4_ = local_47a0;
        auVar81._8_4_ = fStack_4798;
        auVar81._12_4_ = fStack_4794;
        auVar81._16_4_ = fStack_4790;
        auVar81._20_4_ = fStack_478c;
        auVar81._24_4_ = fStack_4788;
        auVar81._28_4_ = fStack_4784;
        _local_51c0 = vdivps_avx(auVar82,auVar81);
        local_51e0 = local_1aa0._0_8_;
        uStack_51d8 = local_1aa0._8_8_;
        uStack_51d0 = local_1aa0._16_8_;
        uStack_51c8 = local_1aa0._24_8_;
        local_1cc0 = (float)local_51c0._0_4_ * (float)local_51a0;
        fStack_1cbc = (float)local_51c0._4_4_ * local_51a0._4_4_;
        fStack_1cb8 = fStack_51b8 * (float)uStack_5198;
        fStack_1cb4 = fStack_51b4 * uStack_5198._4_4_;
        fStack_1cb0 = fStack_51b0 * (float)uStack_5190;
        fStack_1cac = fStack_51ac * uStack_5190._4_4_;
        uStack_1ca4 = local_51c0._28_4_;
        fStack_1ca8 = fStack_51a8 * (float)uStack_5188;
        local_1ce0 = local_1ae0._0_8_;
        uStack_1cd8 = local_1ae0._8_8_;
        uStack_1cd0 = local_1ae0._16_8_;
        uStack_1cc8 = local_1ae0._24_8_;
        auVar93._4_4_ = fStack_1cbc;
        auVar93._0_4_ = local_1cc0;
        auVar93._8_4_ = fStack_1cb8;
        auVar93._12_4_ = fStack_1cb4;
        auVar93._16_4_ = fStack_1cb0;
        auVar93._20_4_ = fStack_1cac;
        auVar93._24_4_ = fStack_1ca8;
        auVar93._28_4_ = uStack_1ca4;
        auVar92._16_8_ = local_1ae0._16_8_;
        auVar92._0_16_ = auVar6;
        auVar92._24_8_ = local_1ae0._24_8_;
        auVar13 = vsubps_avx(auVar93,auVar92);
        local_8760 = auVar13._0_8_;
        uStack_8758 = auVar13._8_8_;
        uStack_8750 = auVar13._16_8_;
        uStack_8748 = auVar13._24_8_;
        local_4b60._0_4_ = auVar13._0_4_;
        local_4b60._4_4_ = auVar13._4_4_;
        uStack_4b58._0_4_ = auVar13._8_4_;
        uStack_4b58._4_4_ = auVar13._12_4_;
        uStack_4b50._0_4_ = auVar13._16_4_;
        uStack_4b50._4_4_ = auVar13._20_4_;
        uStack_4b48._0_4_ = auVar13._24_4_;
        local_5fc0 = CONCAT44((float)local_4b40._4_4_ * local_4b60._4_4_,
                              (float)local_4b40._0_4_ * (float)local_4b60);
        uStack_5fb8 = CONCAT44(fStack_4b34 * uStack_4b58._4_4_,fStack_4b38 * (float)uStack_4b58);
        uStack_5fb0 = CONCAT44(fStack_4b2c * uStack_4b50._4_4_,fStack_4b30 * (float)uStack_4b50);
        uStack_5fa8 = CONCAT44(uStack_4b24,fStack_4b28 * (float)uStack_4b48);
        local_5f08 = local_73a8;
        *(undefined8 *)local_73a8 = local_5f40;
        *(undefined8 *)(local_73a8 + 2) = uStack_5f38;
        *(undefined8 *)(local_73a8 + 4) = uStack_5f30;
        *(undefined8 *)(local_73a8 + 6) = uStack_5f28;
        local_5f48 = local_73b0;
        *(undefined8 *)local_73b0 = local_5fc0;
        *(undefined8 *)(local_73b0 + 2) = uStack_5fb8;
        *(undefined8 *)(local_73b0 + 4) = uStack_5fb0;
        *(undefined8 *)(local_73b0 + 6) = uStack_5fa8;
        local_5f88 = local_73a0;
        auVar78._8_8_ = uStack_5fb8;
        auVar78._0_8_ = local_5fc0;
        auVar78._16_8_ = uStack_5fb0;
        auVar78._24_8_ = uStack_5fa8;
        *local_73a0 = auVar78;
        local_73a8 = local_73a8 + 8;
        local_73a0 = local_73a0 + 1;
        local_73b0 = local_73b0 + 8;
        local_73b8 = local_73b8 + 1;
        local_73c0 = local_73c0 + 1;
        local_73c8 = local_73c8 + 1;
        local_73d0 = local_73d0 + 8;
        local_5f80 = local_5fc0;
        uStack_5f78 = uStack_5fb8;
        uStack_5f70 = uStack_5fb0;
        uStack_5f68 = uStack_5fa8;
        local_5c80 = local_25a0;
        local_5c20 = local_2da0;
        local_5bc0 = local_35a0;
        local_5b60 = local_5f40;
        uStack_5b58 = uStack_5f38;
        uStack_5b50 = uStack_5f30;
        uStack_5b48 = uStack_5f28;
        local_5b00 = local_3da0;
        local_5a40 = local_45a0;
        local_5a00 = local_19a0._0_8_;
        uStack_59f8 = local_19a0._8_8_;
        uStack_59f0 = local_19a0._16_8_;
        uStack_59e8 = local_19a0._24_8_;
        local_59c0 = local_1a60._0_8_;
        uStack_59b8 = local_1a60._8_8_;
        uStack_59b0 = local_1a60._16_8_;
        uStack_59a8 = local_1a60._24_8_;
        local_5980 = local_1b20._0_8_;
        uStack_5978 = local_1b20._8_8_;
        uStack_5970 = local_1b20._16_8_;
        uStack_5968 = local_1b20._24_8_;
        local_5940 = local_1b60._0_8_;
        uStack_5938 = local_1b60._8_8_;
        uStack_5930 = local_1b60._16_8_;
        uStack_5928 = local_1b60._24_8_;
        local_5900 = local_1ba0._0_8_;
        uStack_58f8 = local_1ba0._8_8_;
        uStack_58f0 = local_1ba0._16_8_;
        uStack_58e8 = local_1ba0._24_8_;
        local_5220 = local_19e0._0_8_;
        uStack_5218 = local_19e0._8_8_;
        uStack_5210 = local_19e0._16_8_;
        uStack_5208 = local_19e0._24_8_;
        local_5200 = local_5aa0;
        uStack_51f8 = uStack_5a98;
        uStack_51f0 = uStack_5a90;
        uStack_51e8 = uStack_5a88;
        local_51a0 = local_1aa0._0_8_;
        uStack_5198 = local_1aa0._8_8_;
        uStack_5190 = local_1aa0._16_8_;
        uStack_5188 = local_1aa0._24_8_;
        local_5180 = local_5f40;
        uStack_5178 = uStack_5f38;
        uStack_5170 = uStack_5f30;
        uStack_5168 = uStack_5f28;
        local_4b60 = local_8760;
        uStack_4b58 = uStack_8758;
        uStack_4b50 = uStack_8750;
        uStack_4b48 = uStack_8748;
        local_4b20 = local_84e0;
        uStack_4b18 = uStack_84d8;
        uStack_4b10 = uStack_84d0;
        uStack_4b08 = uStack_84c8;
        local_4b00 = local_8040;
        uStack_4af8 = uStack_8038;
        uStack_4af0 = uStack_8030;
        uStack_4ae8 = uStack_8028;
        local_4ae0 = uVar30;
        uStack_4ad8 = uVar31;
        uStack_4ad0 = uVar32;
        local_4ac0 = local_81a0;
        uStack_4ab8 = uStack_8198;
        uStack_4ab0 = uStack_8190;
        uStack_4aa8 = uStack_8188;
        _local_45e0 = auVar11;
        local_40c0 = uVar26;
        uStack_40b8 = uVar27;
        uStack_40b0 = uVar28;
        uStack_40a8 = uVar29;
        local_3f20 = local_3c0._0_8_;
        uStack_3f18 = local_3c0._8_8_;
        uStack_3f10 = local_3d0._0_8_;
        uStack_3f08 = local_3d0._8_8_;
        local_3ec0 = local_3ee0;
        uStack_3eb8 = uStack_3ed8;
        uStack_3eb0 = uStack_3ed0;
        uStack_3ea8 = uStack_3ec8;
        _local_3de0 = auVar8;
        local_38c0 = uVar33;
        uStack_38b8 = uVar34;
        uStack_38b0 = uVar35;
        uStack_38a8 = uVar36;
        local_3720 = local_480._0_8_;
        uStack_3718 = local_480._8_8_;
        uStack_3710 = local_490._0_8_;
        uStack_3708 = local_490._8_8_;
        local_36c0 = local_36e0;
        uStack_36b8 = uStack_36d8;
        uStack_36b0 = uStack_36d0;
        uStack_36a8 = uStack_36c8;
        _local_35e0 = auVar143;
        local_30c0 = uVar14;
        uStack_30b8 = uVar15;
        uStack_30b0 = uVar16;
        uStack_30a8 = uVar17;
        local_2f20 = local_540._0_8_;
        uStack_2f18 = local_540._8_8_;
        uStack_2f10 = local_550._0_8_;
        uStack_2f08 = local_550._8_8_;
        local_2ec0 = local_2ee0;
        uStack_2eb8 = uStack_2ed8;
        uStack_2eb0 = uStack_2ed0;
        uStack_2ea8 = uStack_2ec8;
        _local_2de0 = auVar144;
        local_28c0 = uVar18;
        uStack_28b8 = uVar19;
        uStack_28b0 = uVar20;
        uStack_28a8 = uVar21;
        local_2720 = local_600._0_8_;
        uStack_2718 = local_600._8_8_;
        uStack_2710 = local_610._0_8_;
        uStack_2708 = local_610._8_8_;
        local_26c0 = local_26e0;
        uStack_26b8 = uStack_26d8;
        uStack_26b0 = uStack_26d0;
        uStack_26a8 = uStack_26c8;
        _local_25e0 = auVar145;
        local_20c0 = uVar22;
        uStack_20b8 = uVar23;
        uStack_20b0 = uVar24;
        uStack_20a8 = uVar25;
        local_1f20 = local_6c0._0_8_;
        uStack_1f18 = local_6c0._8_8_;
        uStack_1f10 = local_6d0._0_8_;
        uStack_1f08 = local_6d0._8_8_;
        local_1ec0 = local_1ee0;
        uStack_1eb8 = uStack_1ed8;
        uStack_1eb0 = uStack_1ed0;
        uStack_1ea8 = uStack_1ec8;
        local_1c60 = local_5be0;
        uStack_1c58 = uStack_5bd8;
        uStack_1c50 = uStack_5bd0;
        uStack_1c48 = uStack_5bc8;
        local_1c20 = local_5c40;
        uStack_1c18 = uStack_5c38;
        uStack_1c10 = uStack_5c30;
        uStack_1c08 = uStack_5c28;
        local_1be0 = local_5ca0;
        uStack_1bd8 = uStack_5c98;
        uStack_1bd0 = uStack_5c90;
        uStack_1bc8 = uStack_5c88;
        local_1ba0 = auVar153;
        local_1b7c = local_1b80;
        local_1b78 = local_1b80;
        local_1b74 = local_1b80;
        local_1b70 = local_1b80;
        local_1b6c = local_1b80;
        local_1b68 = local_1b80;
        local_1b64 = local_1b80;
        local_1b60 = auVar152;
        local_1b3c = local_1b40;
        local_1b38 = local_1b40;
        local_1b34 = local_1b40;
        local_1b30 = local_1b40;
        local_1b2c = local_1b40;
        local_1b28 = local_1b40;
        local_1b24 = local_1b40;
        local_1b20 = auVar151;
        local_1afc = local_1b00;
        local_1af8 = local_1b00;
        local_1af4 = local_1b00;
        local_1af0 = local_1b00;
        local_1aec = local_1b00;
        local_1ae8 = local_1b00;
        local_1ae4 = local_1b00;
        local_1ae0 = auVar157;
        local_1abc = local_1ac0;
        local_1ab8 = local_1ac0;
        local_1ab4 = local_1ac0;
        local_1ab0 = local_1ac0;
        local_1aac = local_1ac0;
        local_1aa8 = local_1ac0;
        local_1aa4 = local_1ac0;
        local_1aa0 = auVar158;
        local_1a7c = local_1a80;
        local_1a78 = local_1a80;
        local_1a74 = local_1a80;
        local_1a70 = local_1a80;
        local_1a6c = local_1a80;
        local_1a68 = local_1a80;
        local_1a64 = local_1a80;
        local_1a60 = auVar159;
        local_1a3c = local_1a40;
        local_1a38 = local_1a40;
        local_1a34 = local_1a40;
        local_1a30 = local_1a40;
        local_1a2c = local_1a40;
        local_1a28 = local_1a40;
        local_1a24 = local_1a40;
        local_1a20 = auVar154;
        local_19fc = local_1a00;
        local_19f8 = local_1a00;
        local_19f4 = local_1a00;
        local_19f0 = local_1a00;
        local_19ec = local_1a00;
        local_19e8 = local_1a00;
        local_19e4 = local_1a00;
        local_19e0 = auVar155;
        local_19bc = local_19c0;
        local_19b8 = local_19c0;
        local_19b4 = local_19c0;
        local_19b0 = local_19c0;
        local_19ac = local_19c0;
        local_19a8 = local_19c0;
        local_19a4 = local_19c0;
        local_19a0 = auVar156;
        local_197c = local_1980;
        local_1978 = local_1980;
        local_1974 = local_1980;
        local_1970 = local_1980;
        local_196c = local_1980;
        local_1968 = local_1980;
        local_1964 = local_1980;
        local_1440 = local_2600;
        uStack_1438 = uStack_25f8;
        uStack_1430 = uStack_25f0;
        uStack_1428 = uStack_25e8;
        local_1280 = local_2e00;
        uStack_1278 = uStack_2df8;
        uStack_1270 = uStack_2df0;
        uStack_1268 = uStack_2de8;
        local_10c0 = local_3600;
        uStack_10b8 = uStack_35f8;
        uStack_10b0 = uStack_35f0;
        uStack_10a8 = uStack_35e8;
        local_f00 = local_3e00;
        uStack_ef8 = uStack_3df8;
        uStack_ef0 = uStack_3df0;
        uStack_ee8 = uStack_3de8;
        local_d40 = local_4600;
        uStack_d38 = uStack_45f8;
        uStack_d30 = uStack_45f0;
        uStack_d28 = uStack_45e8;
      }
      for (; 0 < (int)local_73d8; local_73d8 = local_73d8 - 1) {
        uVar2 = *(uint *)*local_73c0;
        uVar3 = *(uint *)*local_73c8;
        uVar4 = *local_73d0;
        dVar147 = std::exp((double)((ulong)*(uint *)*local_73b8 ^ 0x8000000080000000));
        dVar148 = std::exp((double)((ulong)uVar2 ^ 0x8000000080000000));
        dVar149 = std::exp((double)((ulong)uVar3 ^ 0x8000000080000000));
        dVar150 = std::tanh((double)(ulong)uVar4);
        fVar1 = (1.0 / (SUB84(dVar148,0) + 1.0)) * *local_73a8 +
                (1.0 / (SUB84(dVar147,0) + 1.0)) * SUB84(dVar150,0);
        dVar147 = std::tanh((double)(ulong)(uint)fVar1);
        fVar9 = (1.0 / (SUB84(dVar149,0) + 1.0)) * SUB84(dVar147,0);
        *local_73a8 = fVar1;
        *local_73b0 = fVar9;
        *(float *)*local_73a0 = fVar9;
        local_73a8 = local_73a8 + 1;
        local_73a0 = (undefined1 (*) [32])(*local_73a0 + 4);
        local_73b0 = local_73b0 + 1;
        local_73b8 = (undefined1 (*) [32])(*local_73b8 + 4);
        local_73c0 = (undefined1 (*) [32])(*local_73c0 + 4);
        local_73c8 = (undefined1 (*) [32])(*local_73c8 + 4);
        local_73d0 = local_73d0 + 1;
      }
    }
    local_6ea4 = 0;
  }
  else {
    local_6ea4 = -100;
  }
  local_6f40 = 1;
  local_6e98 = &local_6f30;
  if (local_6f28 != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_6f28;
    *local_6f28 = *local_6f28 + -1;
    UNLOCK();
    if (local_50 == 1) {
      local_48 = local_6e98;
      if (local_6f10 == (long *)0x0) {
        local_40 = local_6f30;
        if (local_6f30 != (undefined1 (*) [32])0x0) {
          free(local_6f30);
        }
      }
      else {
        (**(code **)(*local_6f10 + 0x18))(local_6f10,local_6f30);
      }
    }
  }
  return local_6ea4;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(num_output, 4, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        int nn_num_output = num_output >> 1;
        int remain_num_output_start = nn_num_output << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_num_output; qq++)
        {
            int q = qq * 2;

            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I_0 = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F_0 = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O_0 = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G_0 = weight_xc.row(num_output * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(num_output * 0 + (q + 1));
            const float* weight_xc_F_1 = weight_xc.row(num_output * 1 + (q + 1));
            const float* weight_xc_O_1 = weight_xc.row(num_output * 2 + (q + 1));
            const float* weight_xc_G_1 = weight_xc.row(num_output * 3 + (q + 1));

            const float* weight_hc_I_0 = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F_0 = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O_0 = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G_0 = weight_hc.row(num_output * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(num_output * 0 + (q + 1));
            const float* weight_hc_F_1 = weight_hc.row(num_output * 1 + (q + 1));
            const float* weight_hc_O_1 = weight_hc.row(num_output * 2 + (q + 1));
            const float* weight_hc_G_1 = weight_hc.row(num_output * 3 + (q + 1));

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI_0 = _mm256_setzero_ps();
            __m256 _sumF_0 = _mm256_setzero_ps();
            __m256 _sumO_0 = _mm256_setzero_ps();
            __m256 _sumG_0 = _mm256_setzero_ps();
            __m256 _sumI_1 = _mm256_setzero_ps();
            __m256 _sumF_1 = _mm256_setzero_ps();
            __m256 _sumO_1 = _mm256_setzero_ps();
            __m256 _sumG_1 = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_0), xi, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_0), xi, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_0), xi, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_0), xi, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_1), xi, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_1), xi, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_1), xi, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_1), xi, _sumG_1);
                x += 8;
                weight_xc_I_0 += 8;
                weight_xc_F_0 += 8;
                weight_xc_O_0 += 8;
                weight_xc_G_0 += 8;
                weight_xc_I_1 += 8;
                weight_xc_F_1 += 8;
                weight_xc_O_1 += 8;
                weight_xc_G_1 += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_0), h_cont, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_0), h_cont, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_0), h_cont, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_0), h_cont, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_1), h_cont, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_1), h_cont, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_1), h_cont, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_1), h_cont, _sumG_1);
                hidden_ptr_r += 8;
                weight_hc_I_0 += 8;
                weight_hc_F_0 += 8;
                weight_hc_O_0 += 8;
                weight_hc_G_0 += 8;
                weight_hc_I_1 += 8;
                weight_hc_F_1 += 8;
                weight_hc_O_1 += 8;
                weight_hc_G_1 += 8;
            }
            float sums[8];
            _mm256_storeu_ps(sums, HorizontalSums(_sumI_0, _sumF_0, _sumO_0, _sumG_0, _sumI_1, _sumF_1, _sumO_1, _sumG_1));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];
            sums[4] += bias_c_I[q + 1];
            sums[5] += bias_c_F[q + 1];
            sums[6] += bias_c_O[q + 1];
            sums[7] += bias_c_G[q + 1];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I_0 * xi;
                sums[1] += *weight_xc_F_0 * xi;
                sums[2] += *weight_xc_O_0 * xi;
                sums[3] += *weight_xc_G_0 * xi;
                sums[4] += *weight_xc_I_1 * xi;
                sums[5] += *weight_xc_F_1 * xi;
                sums[6] += *weight_xc_O_1 * xi;
                sums[7] += *weight_xc_G_1 * xi;
                x++;
                weight_xc_I_0++;
                weight_xc_F_0++;
                weight_xc_O_0++;
                weight_xc_G_0++;
                weight_xc_I_1++;
                weight_xc_F_1++;
                weight_xc_O_1++;
                weight_xc_G_1++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I_0 * h_cont;
                sums[1] += *weight_hc_F_0 * h_cont;
                sums[2] += *weight_hc_O_0 * h_cont;
                sums[3] += *weight_hc_G_0 * h_cont;
                sums[4] += *weight_hc_I_1 * h_cont;
                sums[5] += *weight_hc_F_1 * h_cont;
                sums[6] += *weight_hc_O_1 * h_cont;
                sums[7] += *weight_hc_G_1 * h_cont;
                hidden_ptr_r++;
                weight_hc_I_0++;
                weight_hc_F_0++;
                weight_hc_O_0++;
                weight_hc_G_0++;
                weight_hc_I_1++;
                weight_hc_F_1++;
                weight_hc_O_1++;
                weight_hc_G_1++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
            gates_data_I[q + 1] = sums[4];
            gates_data_F[q + 1] = sums[5];
            gates_data_O[q + 1] = sums[6];
            gates_data_G[q + 1] = sums[7];
        }
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_num_output_start; q < num_output; q++)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI = _mm256_setzero_ps();
            __m256 _sumF = _mm256_setzero_ps();
            __m256 _sumO = _mm256_setzero_ps();
            __m256 _sumG = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I), xi, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F), xi, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O), xi, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G), xi, _sumG);
                x += 8;
                weight_xc_I += 8;
                weight_xc_F += 8;
                weight_xc_O += 8;
                weight_xc_G += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I), h_cont, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F), h_cont, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O), h_cont, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G), h_cont, _sumG);
                hidden_ptr_r += 8;
                weight_hc_I += 8;
                weight_hc_F += 8;
                weight_hc_O += 8;
                weight_hc_G += 8;
            }
            float sums[4];
            _mm_storeu_ps(sums, HorizontalSums(_sumI, _sumF, _sumO, _sumG));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I * xi;
                sums[1] += *weight_xc_F * xi;
                sums[2] += *weight_xc_O * xi;
                sums[3] += *weight_xc_G * xi;
                x++;
                weight_xc_I++;
                weight_xc_F++;
                weight_xc_O++;
                weight_xc_G++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I * h_cont;
                sums[1] += *weight_hc_F * h_cont;
                sums[2] += *weight_hc_O * h_cont;
                sums[3] += *weight_hc_G * h_cont;
                hidden_ptr_r++;
                weight_hc_I++;
                weight_hc_F++;
                weight_hc_O++;
                weight_hc_G++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        const float* gates_data_I = gates.row(0);
        const float* gates_data_F = gates.row(1);
        const float* gates_data_O = gates.row(2);
        const float* gates_data_G = gates.row(3);
        int nn_activation = num_output >> 3;
        int remain_activations = num_output & 7;
        for (; nn_activation > 0; nn_activation--)
        {
            __m256 I = sigmoid_avx(_mm256_loadu_ps(gates_data_I));
            __m256 F = sigmoid_avx(_mm256_loadu_ps(gates_data_F));
            __m256 O = sigmoid_avx(_mm256_loadu_ps(gates_data_O));
            __m256 G = tanh_avx(_mm256_loadu_ps(gates_data_G));
            __m256 cell2 = _mm256_add_ps(_mm256_mul_ps(F, _mm256_loadu_ps(cell_ptr)), _mm256_mul_ps(I, G));
            __m256 H = _mm256_mul_ps(O, tanh_avx(cell2));
            _mm256_storeu_ps(cell_ptr, cell2);
            _mm256_storeu_ps(hidden_ptr, H);
            _mm256_storeu_ps(output_data, H);
            cell_ptr += 8;
            output_data += 8;
            hidden_ptr += 8;
            gates_data_I += 8;
            gates_data_F += 8;
            gates_data_O += 8;
            gates_data_G += 8;
        }
        for (; remain_activations > 0; remain_activations--)
        {
            float I = *gates_data_I;
            float F = *gates_data_F;
            float O = *gates_data_O;
            float G = *gates_data_G;

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);
            float cell2 = F * *cell_ptr + I * G;
            float H = O * tanh(cell2);
            *cell_ptr = cell2;
            *hidden_ptr = H;
            *output_data = H;
            cell_ptr++;
            output_data++;
            hidden_ptr++;
            gates_data_I++;
            gates_data_F++;
            gates_data_O++;
            gates_data_G++;
        }

        // no cell output here
    }

    return 0;
}